

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O1

void compaction_callback_test(bool multi_kv)

{
  undefined1 *puVar1;
  fdb_encryption_key *pfVar2;
  uint64_t *puVar3;
  short *psVar4;
  fdb_status fVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  fdb_kvs_handle *pfVar9;
  btree *pbVar10;
  fdb_kvs_handle *pfVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  uint64_t extraout_RAX;
  uint64_t uVar15;
  fdb_kvs_handle *pfVar16;
  fdb_kvs_handle *pfVar17;
  fdb_kvs_config *config;
  fdb_kvs_info *info;
  btree *pbVar18;
  fdb_file_info *kvs_config_00;
  fdb_doc **extraout_RDX;
  void *__s2;
  ulong uVar19;
  size_t sVar20;
  code *__s;
  void *pvVar21;
  fdb_kvs_handle **ppfVar22;
  char cVar23;
  uint uVar24;
  fdb_kvs_handle *pfVar25;
  char *pcVar26;
  char *pcVar27;
  fdb_file_info *info_00;
  undefined7 in_register_00000039;
  fdb_file_handle *pfVar28;
  fdb_iterator *pfVar29;
  btree *pbVar30;
  fdb_kvs_handle *ptr_fhandle;
  undefined1 handle [8];
  btree_kv_ops *pbVar31;
  long lVar32;
  bool *pbVar33;
  fdb_config *pfVar34;
  ulong uVar35;
  size_t sVar36;
  fdb_doc **ppfVar37;
  __atomic_base<unsigned_long> _Var38;
  timeval tVar39;
  timeval tVar40;
  fdb_kvs_handle *db;
  cb_args cb_args;
  fdb_file_handle *dbfile;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_config fconfig;
  char bodybuf [256];
  char keybuf [256];
  fdb_kvs_handle *pfStack_18f38;
  undefined1 auStack_18f30 [16];
  undefined1 auStack_18f20 [8];
  undefined1 auStack_18f18 [80];
  ulong uStack_18ec8;
  timeval tStack_18ea8;
  fdb_file_info afStack_18e98 [3];
  fdb_file_info afStack_18d98 [3];
  fdb_config fStack_18c98;
  fdb_kvs_handle *pfStack_18ba0;
  fdb_kvs_handle *pfStack_18b98;
  fdb_kvs_handle *pfStack_18b90;
  fdb_config *pfStack_18b88;
  fdb_doc **ppfStack_18b80;
  fdb_kvs_handle *pfStack_18b78;
  fdb_file_handle *pfStack_18b68;
  fdb_kvs_handle *pfStack_18b60;
  timeval atStack_18b58 [2];
  timeval tStack_18b38;
  timeval tStack_18b28;
  undefined1 auStack_18b18 [70];
  undefined1 uStack_18ad2;
  undefined8 uStack_18ac8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_18a08;
  fdb_kvs_handle *pfStack_18a00;
  fdb_kvs_handle *pfStack_189f8;
  fdb_kvs_handle *pfStack_189f0;
  fdb_doc **ppfStack_189e8;
  fdb_kvs_handle *pfStack_189e0;
  undefined1 auStack_189c8 [16];
  fdb_kvs_handle *pfStack_189b8;
  fdb_kvs_handle *pfStack_189b0;
  fdb_kvs_handle *pfStack_189a8;
  fdb_kvs_handle *pfStack_189a0;
  fdb_kvs_handle *pfStack_18998;
  fdb_kvs_config fStack_18990;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_18978;
  filemgr *pfStack_18970;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_18968;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_18960;
  filemgr *pfStack_18958;
  fdb_kvs_handle *pfStack_18950;
  timeval tStack_18948;
  undefined1 auStack_18938 [256];
  __atomic_base<unsigned_long> _Stack_18838;
  timeval tStack_18830;
  __atomic_base<unsigned_long> _Stack_18820;
  fdb_doc *apfStack_187d8 [32];
  char acStack_186d8 [256];
  char acStack_185d8 [256];
  fdb_kvs_handle afStack_184d8 [153];
  char acStack_4c58 [8];
  fdb_kvs_handle *pfStack_4c50;
  fdb_kvs_handle *pfStack_4c48;
  fdb_kvs_handle *pfStack_4c40;
  fdb_kvs_handle *pfStack_4c38;
  fdb_doc **ppfStack_4c30;
  fdb_kvs_handle *pfStack_4c28;
  fdb_kvs_handle *pfStack_4c10;
  fdb_kvs_handle *pfStack_4c08;
  fdb_doc *pfStack_4c00;
  void *pvStack_4bf8;
  fdb_kvs_config fStack_4bf0;
  undefined1 auStack_4bd8 [48];
  timeval tStack_4ba8;
  undefined1 auStack_4b98 [760];
  char acStack_48a0 [256];
  fdb_doc *apfStack_47a0 [101];
  fdb_kvs_handle **ppfStack_4478;
  fdb_kvs_handle *pfStack_4470;
  fdb_kvs_handle *pfStack_4468;
  fdb_kvs_info *pfStack_4460;
  fdb_doc **ppfStack_4458;
  fdb_kvs_handle *pfStack_4450;
  undefined1 auStack_4438 [16];
  undefined1 auStack_4428 [24];
  undefined1 auStack_4410 [32];
  fdb_kvs_handle *apfStack_43f0 [5];
  timeval tStack_43c8;
  char acStack_43b8 [256];
  fdb_doc *apfStack_42b8 [31];
  fdb_config fStack_41c0;
  undefined1 auStack_40c8 [752];
  undefined8 auStack_3dd8 [31];
  fdb_kvs_handle **ppfStack_3ce0;
  fdb_kvs_handle *pfStack_3cd8;
  fdb_kvs_handle *pfStack_3cd0;
  fdb_kvs_config *pfStack_3cc8;
  fdb_doc **ppfStack_3cc0;
  fdb_kvs_handle *pfStack_3cb8;
  fdb_kvs_handle *pfStack_3ca0;
  fdb_kvs_handle *pfStack_3c98;
  fdb_doc *pfStack_3c90;
  fdb_kvs_handle *pfStack_3c88;
  fdb_doc *apfStack_3c80 [11];
  timeval tStack_3c28;
  fdb_kvs_config fStack_3c18;
  char acStack_3c00 [256];
  undefined1 auStack_3b00 [656];
  fdb_config fStack_3870;
  fdb_kvs_handle **ppfStack_3778;
  fdb_kvs_handle *pfStack_3770;
  fdb_kvs_handle *pfStack_3768;
  btree *pbStack_3760;
  btree *pbStack_3758;
  fdb_kvs_handle *pfStack_3750;
  fdb_kvs_handle *pfStack_3740;
  fdb_kvs_handle *pfStack_3738;
  fdb_file_handle *pfStack_3730;
  fdb_kvs_handle *pfStack_3728;
  undefined1 auStack_3720 [40];
  undefined1 auStack_36f8 [40];
  fdb_file_info fStack_36d0;
  undefined1 auStack_3688 [768];
  char acStack_3388 [264];
  code *pcStack_3280;
  fdb_kvs_handle *pfStack_3278;
  fdb_kvs_handle *pfStack_3270;
  char *pcStack_3268;
  long lStack_3260;
  fdb_kvs_handle *pfStack_3258;
  fdb_snapshot_info_t *pfStack_3240;
  fdb_file_handle *pfStack_3238;
  char *pcStack_3230;
  int iStack_3224;
  undefined1 auStack_3220 [96];
  undefined1 auStack_31c0 [32];
  timeval tStack_31a0;
  fdb_kvs_handle fStack_3190;
  char acStack_2ef0 [256];
  fdb_config fStack_2df0;
  size_t sStack_2cf8;
  size_t sStack_2cf0;
  fdb_doc **ppfStack_2ce8;
  char *pcStack_2ce0;
  code *pcStack_2cd8;
  code *pcStack_2cd0;
  fdb_file_handle *pfStack_2cb8;
  fdb_snapshot_info_t *pfStack_2cb0;
  uint64_t uStack_2ca8;
  uint uStack_2c9c;
  fdb_kvs_handle *apfStack_2c98 [4];
  fdb_kvs_config fStack_2c78;
  char acStack_2c60 [8];
  timeval tStack_2c58;
  char acStack_2c48 [256];
  char acStack_2b48 [256];
  char acStack_2a48 [264];
  fdb_config fStack_2940;
  fdb_doc *apfStack_2848 [301];
  fdb_kvs_handle **ppfStack_1ee0;
  btree *pbStack_1ed8;
  fdb_kvs_handle *pfStack_1ed0;
  fdb_kvs_handle *pfStack_1ec8;
  btree *pbStack_1ec0;
  fdb_kvs_handle *pfStack_1eb8;
  fdb_kvs_handle *pfStack_1ea0;
  fdb_iterator *pfStack_1e98;
  fdb_kvs_handle *pfStack_1e90;
  undefined1 auStack_1e88 [16];
  undefined1 auStack_1e78 [40];
  btree bStack_1e50;
  fdb_kvs_info fStack_1e08;
  fdb_config fStack_1dd8;
  char acStack_1ce0 [256];
  fdb_kvs_handle fStack_1be0;
  fdb_kvs_handle **ppfStack_19d8;
  btree *pbStack_19d0;
  fdb_kvs_handle *pfStack_19c8;
  fdb_kvs_config *pfStack_19c0;
  fdb_file_handle **ppfStack_19b8;
  fdb_kvs_handle *pfStack_19b0;
  fdb_kvs_handle *pfStack_19a0;
  fdb_file_handle *pfStack_1998;
  fdb_kvs_config fStack_1990;
  timeval tStack_1978;
  fdb_kvs_info fStack_1968;
  char acStack_1938 [264];
  fdb_config fStack_1830;
  char acStack_1738 [256];
  char acStack_1638 [256];
  fdb_doc *apfStack_1538 [101];
  fdb_kvs_handle **ppfStack_1210;
  btree *pbStack_1208;
  fdb_kvs_handle *pfStack_1200;
  fdb_kvs_handle *pfStack_11f8;
  btree *pbStack_11f0;
  fdb_kvs_handle *pfStack_11e8;
  undefined1 auStack_11d0 [16];
  fdb_kvs_handle *pfStack_11c0;
  fdb_kvs_handle *pfStack_11b8;
  btree_kv_ops *pbStack_11b0;
  undefined1 auStack_11a8 [40];
  docio_handle *pdStack_1180;
  timeval tStack_1148;
  fdb_config fStack_1138;
  btree abStack_1040 [4];
  btree abStack_f40 [14];
  fdb_kvs_handle fStack_c20;
  fdb_kvs_handle **ppfStack_918;
  btree *pbStack_910;
  fdb_kvs_handle *pfStack_908;
  btree *pbStack_900;
  btree *pbStack_8f8;
  fdb_kvs_handle *pfStack_8f0;
  fdb_kvs_handle *pfStack_8e0;
  fdb_kvs_handle *pfStack_8d8;
  fdb_file_handle *pfStack_8d0;
  fdb_kvs_handle *pfStack_8c8;
  fdb_file_handle *pfStack_8c0;
  undefined1 auStack_8b8 [32];
  undefined1 auStack_898 [40];
  fdb_file_info fStack_870;
  char acStack_828 [264];
  fdb_config fStack_720;
  fdb_kvs_handle fStack_628;
  fdb_doc **ppfStack_420;
  btree *pbStack_418;
  fdb_kvs_handle *pfStack_410;
  size_t sStack_408;
  fdb_kvs_handle *pfStack_3f8;
  undefined1 auStack_3e0 [24];
  fdb_kvs_handle *pfStack_3c8;
  btree_kv_ops *pbStack_3c0;
  btree *pbStack_3b8;
  char *pcStack_3b0;
  char *pcStack_3a8;
  code *pcStack_3a0;
  fdb_kvs_handle *local_390;
  undefined8 local_388;
  char acStack_380 [2];
  undefined1 auStack_37e [34];
  uint local_35c;
  undefined1 local_358 [40];
  fdb_config local_330;
  btree local_238 [4];
  char local_138 [264];
  
  pcStack_3a0 = (code *)0x10c2eb;
  gettimeofday((timeval *)(local_358 + 0x18),(__timezone_ptr_t)0x0);
  pcStack_3a0 = (code *)0x10c2f0;
  memleak_start();
  pcStack_3a0 = (code *)0x10c2fd;
  fdb_get_default_config();
  pcStack_3a0 = (code *)0x10c307;
  fdb_get_default_kvs_config();
  local_330.compaction_cb_ctx = &local_388;
  local_388 = 0;
  _acStack_380 = 0;
  auStack_37e._6_8_ = 0;
  local_330.wal_threshold = 0x400;
  local_330.flags = 1;
  local_330.compaction_cb = compaction_cb;
  local_330.compaction_cb_mask = 0x1b;
  pcStack_3a0 = (code *)0x10c351;
  local_330.multi_kv_instances = multi_kv;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_3a0 = (code *)0x10c368;
  fdb_open((fdb_file_handle **)(auStack_37e + 0x16),"./compact_test1",&local_330);
  local_35c = (uint)CONCAT71(in_register_00000039,multi_kv);
  if (local_35c == 0) {
    pcStack_3a0 = (code *)0x10c39a;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_37e._22_8_,&local_390,(fdb_kvs_config *)local_358);
  }
  else {
    pcStack_3a0 = (code *)0x10c389;
    fdb_kvs_open((fdb_file_handle *)auStack_37e._22_8_,&local_390,"db",(fdb_kvs_config *)local_358);
  }
  auStack_37e._6_8_ = local_390;
  pcVar27 = local_138;
  pbVar31 = (btree_kv_ops *)0x14de76;
  uVar19 = 0;
  do {
    pcStack_3a0 = (code *)0x10c3d0;
    sprintf(pcVar27,"key%04d",uVar19);
    pcStack_3a0 = (code *)0x10c3df;
    sprintf((char *)local_238,"body%04d",uVar19);
    pfVar9 = local_390;
    pcStack_3a0 = (code *)0x10c3ec;
    pcVar7 = (char *)strlen(pcVar27);
    pcStack_3a0 = (code *)0x10c3f7;
    sVar8 = strlen((char *)local_238);
    pcStack_3a0 = (code *)0x10c40b;
    pbVar18 = local_238;
    pcVar26 = pcVar27;
    pfVar17 = pfVar9;
    fVar5 = fdb_set_kv(pfVar9,pcVar27,(size_t)pcVar7,local_238,sVar8);
    if (fVar5 != FDB_RESULT_SUCCESS) {
      pcStack_3a0 = (code *)0x10c864;
      compaction_callback_test();
      goto LAB_0010c864;
    }
    uVar24 = (int)uVar19 + 1;
    uVar19 = (ulong)uVar24;
  } while (uVar24 != 1000);
  pcVar26 = (char *)0x0;
  pcStack_3a0 = (code *)0x10c429;
  pfVar17 = (fdb_kvs_handle *)auStack_37e._22_8_;
  fVar5 = fdb_commit((fdb_file_handle *)auStack_37e._22_8_,'\0');
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pcVar26 = "./compact_test2";
    pcStack_3a0 = (code *)0x10c442;
    pfVar17 = (fdb_kvs_handle *)auStack_37e._22_8_;
    fVar5 = fdb_compact((fdb_file_handle *)auStack_37e._22_8_,"./compact_test2");
    uVar24 = local_35c;
    uVar19 = (ulong)local_35c;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010c869;
    if ((int)local_388 != 1000) {
      pcStack_3a0 = (code *)0x10c462;
      compaction_callback_test();
    }
    pcVar7 = acStack_380;
    if (acStack_380[0] == '\0') {
      pcStack_3a0 = (code *)0x10c475;
      compaction_callback_test();
    }
    pcVar27 = acStack_380 + 1;
    if (acStack_380[1] == '\0') {
      pcStack_3a0 = (code *)0x10c488;
      compaction_callback_test();
    }
    pbVar31 = (btree_kv_ops *)(acStack_380 + 2);
    if (auStack_37e[0] == '\0') {
      pcStack_3a0 = (code *)0x10c49c;
      compaction_callback_test();
    }
    pfVar9 = (fdb_kvs_handle *)(auStack_37e + 0x16);
    pcStack_3a0 = (code *)0x10c4a9;
    fdb_close((fdb_file_handle *)auStack_37e._22_8_);
    local_388 = 0;
    _acStack_380 = 0;
    auStack_37e._6_8_ = 0;
    local_330.compaction_cb_mask = 0x19;
    pcStack_3a0 = (code *)0x10c4d5;
    fdb_open((fdb_file_handle **)pfVar9,"./compact_test2",&local_330);
    cVar23 = (char)uVar24;
    if (cVar23 == '\0') {
      pcStack_3a0 = (code *)0x10c504;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_37e._22_8_,&local_390,(fdb_kvs_config *)local_358);
    }
    else {
      pbVar18 = (btree *)local_358;
      pcStack_3a0 = (code *)0x10c4f3;
      fdb_kvs_open((fdb_file_handle *)auStack_37e._22_8_,&local_390,"db",(fdb_kvs_config *)pbVar18);
    }
    auStack_37e._6_8_ = local_390;
    pcVar26 = "./compact_test3";
    pcStack_3a0 = (code *)0x10c51f;
    pfVar17 = (fdb_kvs_handle *)auStack_37e._22_8_;
    fVar5 = fdb_compact((fdb_file_handle *)auStack_37e._22_8_,"./compact_test3");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010c86e;
    if ((int)local_388 != 0) {
      pcStack_3a0 = (code *)0x10c538;
      compaction_callback_test();
    }
    if (acStack_380[0] == '\0') {
      pcStack_3a0 = (code *)0x10c547;
      compaction_callback_test();
    }
    if (acStack_380[1] == '\0') {
      pcStack_3a0 = (code *)0x10c556;
      compaction_callback_test();
    }
    if (auStack_37e[0] == '\0') {
      pcStack_3a0 = (code *)0x10c565;
      compaction_callback_test();
    }
    pfVar9 = (fdb_kvs_handle *)(auStack_37e + 0x16);
    pcStack_3a0 = (code *)0x10c572;
    fdb_close((fdb_file_handle *)auStack_37e._22_8_);
    local_388 = 0;
    _acStack_380 = 0;
    auStack_37e._6_8_ = 0;
    local_330.compaction_cb_mask = 0x13;
    pcStack_3a0 = (code *)0x10c59e;
    fdb_open((fdb_file_handle **)pfVar9,"./compact_test3",&local_330);
    if (cVar23 == '\0') {
      pcStack_3a0 = (code *)0x10c5cd;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_37e._22_8_,&local_390,(fdb_kvs_config *)local_358);
    }
    else {
      pbVar18 = (btree *)local_358;
      pcStack_3a0 = (code *)0x10c5bc;
      fdb_kvs_open((fdb_file_handle *)auStack_37e._22_8_,&local_390,"db",(fdb_kvs_config *)pbVar18);
    }
    auStack_37e._6_8_ = local_390;
    pcVar26 = "./compact_test4";
    pcStack_3a0 = (code *)0x10c5e8;
    pfVar17 = (fdb_kvs_handle *)auStack_37e._22_8_;
    fVar5 = fdb_compact((fdb_file_handle *)auStack_37e._22_8_,"./compact_test4");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010c873;
    if ((int)local_388 != 1000) {
      pcStack_3a0 = (code *)0x10c604;
      compaction_callback_test();
    }
    if (acStack_380[0] == '\0') {
      pcStack_3a0 = (code *)0x10c613;
      compaction_callback_test();
    }
    if (acStack_380[1] == '\0') {
      pcStack_3a0 = (code *)0x10c622;
      compaction_callback_test();
    }
    if (auStack_37e[0] == '\x01') {
      pcStack_3a0 = (code *)0x10c631;
      compaction_callback_test();
    }
    pfVar9 = (fdb_kvs_handle *)(auStack_37e + 0x16);
    pcStack_3a0 = (code *)0x10c63e;
    fdb_close((fdb_file_handle *)auStack_37e._22_8_);
    local_388 = 0;
    _acStack_380 = 0;
    auStack_37e._6_8_ = 0;
    local_330.compaction_cb_mask = 10;
    pcStack_3a0 = (code *)0x10c66a;
    fdb_open((fdb_file_handle **)pfVar9,"./compact_test4",&local_330);
    if (cVar23 == '\0') {
      pcStack_3a0 = (code *)0x10c699;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_37e._22_8_,&local_390,(fdb_kvs_config *)local_358);
    }
    else {
      pbVar18 = (btree *)local_358;
      pcStack_3a0 = (code *)0x10c688;
      fdb_kvs_open((fdb_file_handle *)auStack_37e._22_8_,&local_390,"db",(fdb_kvs_config *)pbVar18);
    }
    auStack_37e._6_8_ = local_390;
    pcVar26 = "./compact_test5";
    pcStack_3a0 = (code *)0x10c6b4;
    pfVar17 = (fdb_kvs_handle *)auStack_37e._22_8_;
    fVar5 = fdb_compact((fdb_file_handle *)auStack_37e._22_8_,"./compact_test5");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010c878;
    if ((int)local_388 != 1000) {
      pcStack_3a0 = (code *)0x10c6d0;
      compaction_callback_test();
    }
    if (acStack_380[0] == '\x01') {
      pcStack_3a0 = (code *)0x10c6df;
      compaction_callback_test();
    }
    if (acStack_380[1] == '\x01') {
      pcStack_3a0 = (code *)0x10c6ee;
      compaction_callback_test();
    }
    if (auStack_37e[0] == '\0') {
      pcStack_3a0 = (code *)0x10c6fd;
      compaction_callback_test();
    }
    pfVar9 = (fdb_kvs_handle *)(auStack_37e + 0x16);
    pcStack_3a0 = (code *)0x10c70a;
    fdb_close((fdb_file_handle *)auStack_37e._22_8_);
    local_388 = 0;
    _acStack_380 = 0;
    auStack_37e._6_8_ = 0;
    local_330.compaction_cb_mask = 4;
    pcStack_3a0 = (code *)0x10c736;
    fdb_open((fdb_file_handle **)pfVar9,"./compact_test5",&local_330);
    if (cVar23 == '\0') {
      pcStack_3a0 = (code *)0x10c765;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_37e._22_8_,&local_390,(fdb_kvs_config *)local_358);
    }
    else {
      pbVar18 = (btree *)local_358;
      pcStack_3a0 = (code *)0x10c754;
      fdb_kvs_open((fdb_file_handle *)auStack_37e._22_8_,&local_390,"db",(fdb_kvs_config *)pbVar18);
    }
    auStack_37e._6_8_ = local_390;
    pcVar26 = "./compact_test6";
    pcStack_3a0 = (code *)0x10c780;
    pfVar17 = (fdb_kvs_handle *)auStack_37e._22_8_;
    fVar5 = fdb_compact((fdb_file_handle *)auStack_37e._22_8_,"./compact_test6");
    if (fVar5 == FDB_RESULT_SUCCESS) {
      if ((int)local_388 != 0) {
        pcStack_3a0 = (code *)0x10c799;
        compaction_callback_test();
      }
      if (local_388._4_4_ == 0 || 1000 < local_388._4_4_) {
        pcStack_3a0 = (code *)0x10c7b8;
        compaction_callback_test();
      }
      if (acStack_380[0] == '\x01') {
        pcStack_3a0 = (code *)0x10c7c7;
        compaction_callback_test();
      }
      if (acStack_380[1] == '\x01') {
        pcStack_3a0 = (code *)0x10c7d6;
        compaction_callback_test();
      }
      if (auStack_37e[0] == '\x01') {
        pcStack_3a0 = (code *)0x10c7e5;
        compaction_callback_test();
      }
      pcStack_3a0 = (code *)0x10c7ef;
      fdb_close((fdb_file_handle *)auStack_37e._22_8_);
      pcStack_3a0 = (code *)0x10c7f4;
      fdb_shutdown();
      pcStack_3a0 = (code *)0x10c7f9;
      memleak_end();
      if (cVar23 == '\0') {
        if ((compaction_callback_test(bool)::__test_pass & 1) == 0) {
          pcVar27 = "%s PASSED\n";
        }
        else {
          pcVar27 = "%s FAILED\n";
        }
        pcVar7 = "compaction callback function single kv mode test";
      }
      else {
        if ((compaction_callback_test(bool)::__test_pass & 1) == 0) {
          pcVar27 = "%s PASSED\n";
        }
        else {
          pcVar27 = "%s FAILED\n";
        }
        pcVar7 = "compaction callback function multi kv mode test";
      }
      pcStack_3a0 = (code *)0x10c84d;
      fprintf(_stderr,pcVar27,pcVar7);
      return;
    }
  }
  else {
LAB_0010c864:
    pcStack_3a0 = (code *)0x10c869;
    compaction_callback_test();
LAB_0010c869:
    pcStack_3a0 = (code *)0x10c86e;
    compaction_callback_test();
LAB_0010c86e:
    pcStack_3a0 = (code *)0x10c873;
    compaction_callback_test();
LAB_0010c873:
    pcStack_3a0 = (code *)0x10c878;
    compaction_callback_test();
LAB_0010c878:
    pcStack_3a0 = (code *)0x10c87d;
    compaction_callback_test();
  }
  pcStack_3a0 = compaction_cb;
  compaction_callback_test();
  pfVar16 = (fdb_kvs_handle *)((ulong)pcVar26 & 0xffffffff);
  pfStack_3f8 = (fdb_kvs_handle *)0x10c8af;
  pfStack_3c8 = pfVar9;
  pbStack_3c0 = pbVar31;
  pbStack_3b8 = local_238;
  pcStack_3b0 = pcVar7;
  pcStack_3a8 = pcVar27;
  pcStack_3a0 = (code *)uVar19;
  gettimeofday((timeval *)(auStack_3e0 + 8),(__timezone_ptr_t)0x0);
  iVar6 = (int)pcVar26;
  if (iVar6 < 8) {
    if (iVar6 == 1) {
      *(undefined1 *)&(local_390->kvs_config).custom_cmp = 1;
      return;
    }
    if (iVar6 != 2) goto LAB_0010c93f;
    pfVar16 = (fdb_kvs_handle *)
              CONCAT71((int7)((ulong)pfVar16 >> 8),*(undefined1 *)&pbVar18[1].blk_handle);
    *(int *)&local_390->kvs_config = *(int *)&local_390->kvs_config + 1;
    pbVar18 = (btree *)auStack_3e0;
    pfStack_3f8 = (fdb_kvs_handle *)0x10c8ec;
    fdb_doc_create((fdb_doc **)pbVar18,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    *(size_t *)(auStack_3e0._0_8_ + 0x30) = sVar8;
    pfStack_3f8 = (fdb_kvs_handle *)0x10c8fd;
    fVar5 = fdb_get_byoffset((fdb_kvs_handle *)(local_390->kvs_config).custom_cmp_param,
                             (fdb_doc *)auStack_3e0._0_8_);
    ppfVar37 = extraout_RDX;
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_3f8 = (fdb_kvs_handle *)0x10c90f;
      fdb_doc_free((fdb_doc *)auStack_3e0._0_8_);
      if (*(char *)(*(long *)&pfVar17->kvs_config + 0xb0) == '\x01') {
        if (*(short *)extraout_RDX == 0x6264) {
          return;
        }
        pfStack_3f8 = (fdb_kvs_handle *)0x10c92e;
        compaction_cb();
        goto LAB_0010c92e;
      }
      if (*(int *)((long)extraout_RDX + 3) == 0x746c7561 && *(int *)extraout_RDX == 0x61666564) {
        return;
      }
      pfStack_3f8 = (fdb_kvs_handle *)0x10c9c0;
      compaction_cb();
      goto LAB_0010c9c0;
    }
  }
  else {
LAB_0010c92e:
    if ((int)pfVar16 == 8) {
      *(undefined1 *)((long)&(local_390->kvs_config).custom_cmp + 2) = 1;
      return;
    }
    if ((int)pfVar16 == 0x10) {
      *(undefined1 *)((long)&(local_390->kvs_config).custom_cmp + 1) = 1;
      return;
    }
LAB_0010c93f:
    puVar1 = &(local_390->kvs_config).field_0x4;
    *(int *)puVar1 = *(int *)puVar1 + 1;
    ppfVar37 = (fdb_doc **)auStack_3e0;
    pfStack_3f8 = (fdb_kvs_handle *)0x10c964;
    fdb_doc_create(ppfVar37,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    *(size_t *)(auStack_3e0._0_8_ + 0x30) = sVar8;
    pfStack_3f8 = (fdb_kvs_handle *)0x10c974;
    fVar5 = fdb_get_byoffset((fdb_kvs_handle *)(local_390->kvs_config).custom_cmp_param,
                             (fdb_doc *)auStack_3e0._0_8_);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_3f8 = (fdb_kvs_handle *)0x10c982;
      fdb_doc_free((fdb_doc *)auStack_3e0._0_8_);
      return;
    }
LAB_0010c9c0:
    pfStack_3f8 = (fdb_kvs_handle *)0x10c9c5;
    compaction_cb();
  }
  pfStack_3f8 = (fdb_kvs_handle *)compact_wo_reopen_test;
  compaction_cb();
  pfStack_410 = local_390;
  pfStack_8f0 = (fdb_kvs_handle *)0x10c9e7;
  ppfStack_420 = ppfVar37;
  pbStack_418 = pbVar18;
  sStack_408 = sVar8;
  pfStack_3f8 = pfVar16;
  gettimeofday((timeval *)(auStack_898 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_8f0 = (fdb_kvs_handle *)0x10c9ec;
  memleak_start();
  pfStack_8f0 = (fdb_kvs_handle *)0x10c9f8;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_8f0 = (fdb_kvs_handle *)0x10ca08;
  fdb_get_default_config();
  pbVar10 = (btree *)auStack_898;
  pfStack_8f0 = (fdb_kvs_handle *)0x10ca15;
  fdb_get_default_kvs_config();
  fStack_720.buffercache_size = 0x1000000;
  fStack_720.wal_threshold = 0x400;
  fStack_720.flags = 1;
  fStack_720.compaction_threshold = '\0';
  pbVar30 = (btree *)&pfStack_8d0;
  pfStack_8f0 = (fdb_kvs_handle *)0x10ca47;
  fdb_open((fdb_file_handle **)pbVar30,"./compact_test1",&fStack_720);
  ppfVar22 = &pfStack_8d8;
  pfStack_8f0 = (fdb_kvs_handle *)0x10ca5a;
  fdb_kvs_open_default(pfStack_8d0,ppfVar22,(fdb_kvs_config *)pbVar10);
  pfStack_8f0 = (fdb_kvs_handle *)0x10ca70;
  fVar5 = fdb_set_log_callback(pfStack_8d8,logCallbackFunc,"compact_wo_reopen_test");
  pfVar9 = local_390;
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_8f0 = (fdb_kvs_handle *)0x10ca94;
    fdb_open(&pfStack_8c0,"./compact_test1",&fStack_720);
    ppfVar22 = &pfStack_8c8;
    pfStack_8f0 = (fdb_kvs_handle *)0x10caa9;
    fdb_kvs_open_default(pfStack_8c0,ppfVar22,(fdb_kvs_config *)auStack_898);
    pfStack_8f0 = (fdb_kvs_handle *)0x10cabf;
    fVar5 = fdb_set_log_callback(pfStack_8c8,logCallbackFunc,"compact_wo_reopen_test");
    if (fVar5 == FDB_RESULT_SUCCESS) {
      lVar32 = 0;
      uVar19 = 0;
      do {
        pfVar2 = &fStack_628.config.encryption_key;
        pfStack_8f0 = (fdb_kvs_handle *)0x10cae7;
        sprintf((char *)pfVar2,"key%d",uVar19 & 0xffffffff);
        pfStack_8f0 = (fdb_kvs_handle *)0x10caff;
        sprintf((char *)&fStack_628,"meta%d",uVar19 & 0xffffffff);
        pfStack_8f0 = (fdb_kvs_handle *)0x10cb17;
        sprintf(acStack_828,"body%d",uVar19 & 0xffffffff);
        pbVar30 = (btree *)(auStack_8b8 + lVar32);
        pfStack_8f0 = (fdb_kvs_handle *)0x10cb27;
        pfVar9 = (fdb_kvs_handle *)strlen((char *)pfVar2);
        pfVar16 = &fStack_628;
        pfStack_8f0 = (fdb_kvs_handle *)0x10cb3a;
        pbVar10 = (btree *)strlen((char *)pfVar16);
        pfStack_8f0 = (fdb_kvs_handle *)0x10cb4a;
        sVar8 = strlen(acStack_828);
        pfStack_8f0 = (fdb_kvs_handle *)0x10cb6f;
        fdb_doc_create((fdb_doc **)pbVar30,&fStack_628.config.encryption_key,(size_t)pfVar9,pfVar16,
                       (size_t)pbVar10,acStack_828,sVar8);
        pfStack_8f0 = (fdb_kvs_handle *)0x10cb7e;
        fdb_set(pfStack_8d8,*(fdb_doc **)(auStack_8b8 + uVar19 * 8));
        uVar19 = uVar19 + 1;
        lVar32 = lVar32 + 8;
      } while (uVar19 != 3);
      pbVar18 = (btree *)0x0;
      ppfVar22 = &pfStack_8e0;
      pfStack_8f0 = (fdb_kvs_handle *)0x10cbbe;
      fdb_doc_create((fdb_doc **)ppfVar22,
                     *(_func_size_t_bnode_ptr_void_ptr_void_ptr_void_ptr_size_t **)
                      (auStack_8b8._8_8_ + 0x20),
                     (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)auStack_8b8._8_8_,
                     *(btree_print_func **)(auStack_8b8._8_8_ + 0x38),
                     (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)
                              (auStack_8b8._8_8_ + 8),(void *)0x0,0);
      *(undefined1 *)&pfStack_8e0->file = 1;
      pfStack_8f0 = (fdb_kvs_handle *)0x10cbcf;
      fdb_set(pfStack_8d8,(fdb_doc *)pfStack_8e0);
      pfStack_8f0 = (fdb_kvs_handle *)0x10cbd7;
      fdb_doc_free((fdb_doc *)pfStack_8e0);
      pfStack_8f0 = (fdb_kvs_handle *)0x10cbe6;
      fdb_commit(pfStack_8d0,'\x01');
      pfStack_8f0 = (fdb_kvs_handle *)0x10cbf7;
      fdb_compact(pfStack_8d0,"./compact_test2");
      while( true ) {
        pfStack_8f0 = (fdb_kvs_handle *)0x10cc1b;
        fdb_doc_create((fdb_doc **)ppfVar22,
                       (void *)(*(size_t **)(auStack_8b8 + (long)pbVar18 * 8))[4],
                       **(size_t **)(auStack_8b8 + (long)pbVar18 * 8),(void *)0x0,0,(void *)0x0,0);
        pfStack_8f0 = (fdb_kvs_handle *)0x10cc2a;
        fVar5 = fdb_get(pfStack_8c8,(fdb_doc *)pfStack_8e0);
        pfVar17 = pfStack_8e0;
        if (pbVar18 != (btree *)0x1) break;
        pfVar17 = pfVar9;
        if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010cd75;
LAB_0010cc8a:
        pfStack_8f0 = (fdb_kvs_handle *)0x10cc94;
        fdb_doc_free((fdb_doc *)pfStack_8e0);
        pbVar18 = (btree *)&pbVar18->vsize;
        pfVar9 = pfVar17;
        if (pbVar18 == (btree *)0x3) {
          pfStack_8f0 = (fdb_kvs_handle *)0x10ccb3;
          fdb_get_file_info(pfStack_8c0,&fStack_870);
          pfStack_8f0 = (fdb_kvs_handle *)0x10ccc2;
          iVar6 = strcmp("./compact_test2",fStack_870.filename);
          if (iVar6 != 0) {
            pfStack_8f0 = (fdb_kvs_handle *)0x10ccd0;
            compact_wo_reopen_test();
          }
          lVar32 = 0;
          do {
            pfStack_8f0 = (fdb_kvs_handle *)0x10ccdc;
            fdb_doc_free(*(fdb_doc **)(auStack_8b8 + lVar32 * 8));
            lVar32 = lVar32 + 1;
          } while (lVar32 != 3);
          pfStack_8f0 = (fdb_kvs_handle *)0x10ccef;
          fdb_kvs_close(pfStack_8d8);
          pfStack_8f0 = (fdb_kvs_handle *)0x10ccf9;
          fdb_kvs_close(pfStack_8c8);
          pfStack_8f0 = (fdb_kvs_handle *)0x10cd03;
          fdb_close(pfStack_8d0);
          pfStack_8f0 = (fdb_kvs_handle *)0x10cd0d;
          fdb_close(pfStack_8c0);
          pfStack_8f0 = (fdb_kvs_handle *)0x10cd12;
          fdb_shutdown();
          pfStack_8f0 = (fdb_kvs_handle *)0x10cd17;
          memleak_end();
          pcVar27 = "%s PASSED\n";
          if (compact_wo_reopen_test()::__test_pass != '\0') {
            pcVar27 = "%s FAILED\n";
          }
          pfStack_8f0 = (fdb_kvs_handle *)0x10cd48;
          fprintf(_stderr,pcVar27,"compaction without reopen test");
          return;
        }
      }
      if (fVar5 == FDB_RESULT_SUCCESS) {
        pbVar10 = pfStack_8e0->staletree;
        pfVar16 = *(fdb_kvs_handle **)(auStack_8b8 + (long)pbVar18 * 8);
        pbVar30 = pfVar16->staletree;
        pfStack_8f0 = (fdb_kvs_handle *)0x10cc63;
        iVar6 = bcmp(pbVar10,pbVar30,(size_t)(pfStack_8e0->kvs_config).custom_cmp);
        if (iVar6 == 0) {
          pbVar10 = (pfVar17->field_6).seqtree;
          pbVar30 = (pfVar16->field_6).seqtree;
          pfStack_8f0 = (fdb_kvs_handle *)0x10cc82;
          iVar6 = bcmp(pbVar10,pbVar30,(size_t)(pfVar17->kvs_config).custom_cmp_param);
          if (iVar6 == 0) goto LAB_0010cc8a;
          pfStack_8f0 = (fdb_kvs_handle *)0x10cd65;
          compact_wo_reopen_test();
          pfVar9 = pfVar17;
          goto LAB_0010cd65;
        }
      }
      else {
LAB_0010cd65:
        pfVar17 = pfVar9;
        pfStack_8f0 = (fdb_kvs_handle *)0x10cd6a;
        compact_wo_reopen_test();
      }
      pfStack_8f0 = (fdb_kvs_handle *)0x10cd75;
      compact_wo_reopen_test();
      pfVar9 = pfVar17;
LAB_0010cd75:
      pfStack_8f0 = (fdb_kvs_handle *)0x10cd7a;
      compact_wo_reopen_test();
      goto LAB_0010cd7a;
    }
  }
  else {
LAB_0010cd7a:
    pfStack_8f0 = (fdb_kvs_handle *)0x10cd7f;
    compact_wo_reopen_test();
  }
  pfStack_8f0 = (fdb_kvs_handle *)compact_with_reopen_test;
  compact_wo_reopen_test();
  pfStack_11e8 = (fdb_kvs_handle *)0x10cda4;
  ppfStack_918 = ppfVar22;
  pbStack_910 = pbVar18;
  pfStack_908 = pfVar9;
  pbStack_900 = pbVar10;
  pbStack_8f8 = pbVar30;
  pfStack_8f0 = pfVar16;
  gettimeofday(&tStack_1148,(__timezone_ptr_t)0x0);
  pfStack_11e8 = (fdb_kvs_handle *)0x10cda9;
  memleak_start();
  pfStack_11e8 = (fdb_kvs_handle *)0x10cdb5;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_11e8 = (fdb_kvs_handle *)0x10cdc5;
  fdb_get_default_config();
  pfVar17 = (fdb_kvs_handle *)auStack_11a8;
  pfStack_11e8 = (fdb_kvs_handle *)0x10cdd2;
  fdb_get_default_kvs_config();
  fStack_1138.buffercache_size = 0x1000000;
  fStack_1138.wal_threshold = 0x400;
  fStack_1138.flags = 1;
  fStack_1138.compaction_threshold = '\0';
  pbVar10 = (btree *)auStack_11d0;
  pfStack_11e8 = (fdb_kvs_handle *)0x10ce04;
  fdb_open((fdb_file_handle **)pbVar10,"./compact_test1",&fStack_1138);
  ppfVar22 = (fdb_kvs_handle **)(auStack_11d0 + 8);
  pfStack_11e8 = (fdb_kvs_handle *)0x10ce17;
  fdb_kvs_open_default((fdb_file_handle *)auStack_11d0._0_8_,ppfVar22,(fdb_kvs_config *)pfVar17);
  pfStack_11e8 = (fdb_kvs_handle *)0x10ce2d;
  fVar5 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_11d0._8_8_,logCallbackFunc,"compact_with_reopen_test"
                    );
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d5d7;
  pbVar18 = (btree *)0x0;
  uVar19 = 0;
  do {
    pfVar2 = &fStack_c20.config.encryption_key;
    pfStack_11e8 = (fdb_kvs_handle *)0x10ce55;
    sprintf((char *)pfVar2,"key%d",uVar19 & 0xffffffff);
    pfStack_11e8 = (fdb_kvs_handle *)0x10ce6d;
    sprintf((char *)&fStack_c20,"meta%d",uVar19 & 0xffffffff);
    pfStack_11e8 = (fdb_kvs_handle *)0x10ce85;
    sprintf((char *)abStack_1040,"body%d",uVar19 & 0xffffffff);
    pbVar10 = (btree *)(&abStack_f40[0].ksize + (long)pbVar18);
    pfStack_11e8 = (fdb_kvs_handle *)0x10ce98;
    pfVar11 = (fdb_kvs_handle *)strlen((char *)pfVar2);
    pfVar16 = &fStack_c20;
    pfStack_11e8 = (fdb_kvs_handle *)0x10ceab;
    sVar8 = strlen((char *)pfVar16);
    pfStack_11e8 = (fdb_kvs_handle *)0x10cebb;
    sVar12 = strlen((char *)abStack_1040);
    pfStack_11e8 = (fdb_kvs_handle *)0x10cee0;
    fdb_doc_create((fdb_doc **)pbVar10,&fStack_c20.config.encryption_key,(size_t)pfVar11,pfVar16,
                   sVar8,abStack_1040,sVar12);
    pfStack_11e8 = (fdb_kvs_handle *)0x10cef2;
    fdb_set((fdb_kvs_handle *)auStack_11d0._8_8_,*(fdb_doc **)(&abStack_f40[0].ksize + uVar19 * 8));
    uVar19 = uVar19 + 1;
    pbVar18 = (btree *)((long)pbVar18 + 8);
  } while (uVar19 != 100);
  pfStack_11e8 = (fdb_kvs_handle *)0x10cf32;
  fdb_doc_create((fdb_doc **)&pfStack_11c0,*(void **)(abStack_f40[0].root_bid + 0x20),
                 *(size_t *)abStack_f40[0].root_bid,*(void **)(abStack_f40[0].root_bid + 0x38),
                 *(size_t *)(abStack_f40[0].root_bid + 8),(void *)0x0,0);
  *(undefined1 *)&pfStack_11c0->file = 1;
  ppfVar22 = (fdb_kvs_handle **)(auStack_11d0 + 8);
  pfStack_11e8 = (fdb_kvs_handle *)0x10cf46;
  fdb_set((fdb_kvs_handle *)auStack_11d0._8_8_,(fdb_doc *)pfStack_11c0);
  pfStack_11e8 = (fdb_kvs_handle *)0x10cf4e;
  fdb_doc_free((fdb_doc *)pfStack_11c0);
  pfVar17 = (fdb_kvs_handle *)auStack_11d0;
  pfStack_11e8 = (fdb_kvs_handle *)0x10cf60;
  fdb_commit((fdb_file_handle *)auStack_11d0._0_8_,'\x01');
  pfStack_11e8 = (fdb_kvs_handle *)0x10cf6f;
  fdb_compact((fdb_file_handle *)auStack_11d0._0_8_,"./compact_test2");
  pfStack_11e8 = (fdb_kvs_handle *)0x10cf77;
  fdb_kvs_close((fdb_kvs_handle *)auStack_11d0._8_8_);
  pfStack_11e8 = (fdb_kvs_handle *)0x10cf7f;
  fdb_close((fdb_file_handle *)auStack_11d0._0_8_);
  pfStack_11e8 = (fdb_kvs_handle *)0x10cf8b;
  system("mv  compact_test2 compact_test1 > errorlog.txt");
  pfStack_11e8 = (fdb_kvs_handle *)0x10cfa2;
  fdb_open((fdb_file_handle **)pfVar17,"./compact_test1",&fStack_1138);
  pfStack_11e8 = (fdb_kvs_handle *)0x10cfb2;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_11d0._0_8_,ppfVar22,(fdb_kvs_config *)auStack_11a8);
  pfStack_11e8 = (fdb_kvs_handle *)0x10cfc8;
  fVar5 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_11d0._8_8_,logCallbackFunc,"compact_with_reopen_test"
                    );
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d5dc;
  pbVar18 = (btree *)0x0;
  pfVar9 = pfVar11;
  do {
    pfStack_11e8 = (fdb_kvs_handle *)0x10cfff;
    fdb_doc_create((fdb_doc **)&pfStack_11c0,
                   (void *)(*(size_t **)(&abStack_f40[0].ksize + (long)pbVar18 * 8))[4],
                   **(size_t **)(&abStack_f40[0].ksize + (long)pbVar18 * 8),(void *)0x0,0,
                   (void *)0x0,0);
    pfStack_11e8 = (fdb_kvs_handle *)0x10d00e;
    fVar5 = fdb_get((fdb_kvs_handle *)auStack_11d0._8_8_,(fdb_doc *)pfStack_11c0);
    pfVar11 = pfStack_11c0;
    if (pbVar18 == (btree *)0x1) {
      pfVar11 = pfVar9;
      if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010d5d2;
    }
    else {
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d5c2;
      pfVar17 = (fdb_kvs_handle *)pfStack_11c0->staletree;
      pfVar16 = *(fdb_kvs_handle **)(&abStack_f40[0].ksize + (long)pbVar18 * 8);
      pbVar10 = pfVar16->staletree;
      pfStack_11e8 = (fdb_kvs_handle *)0x10d04a;
      iVar6 = bcmp(pfVar17,pbVar10,(size_t)(pfStack_11c0->kvs_config).custom_cmp);
      if (iVar6 != 0) goto LAB_0010d5c7;
      pfVar17 = (fdb_kvs_handle *)(pfVar11->field_6).seqtree;
      pbVar10 = (pfVar16->field_6).seqtree;
      pfStack_11e8 = (fdb_kvs_handle *)0x10d069;
      iVar6 = bcmp(pfVar17,pbVar10,(size_t)(pfVar11->kvs_config).custom_cmp_param);
      if (iVar6 != 0) goto LAB_0010d5b7;
    }
    pfStack_11e8 = (fdb_kvs_handle *)0x10d07b;
    fdb_doc_free((fdb_doc *)pfStack_11c0);
    pbVar18 = (btree *)&pbVar18->vsize;
    pfVar9 = pfVar11;
  } while (pbVar18 != (btree *)0x64);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d09a;
  fdb_get_file_info((fdb_file_handle *)auStack_11d0._0_8_,(fdb_file_info *)(auStack_11a8 + 0x18));
  pfStack_11e8 = (fdb_kvs_handle *)0x10d0a9;
  iVar6 = strcmp("./compact_test1",(char *)auStack_11a8._24_8_);
  if (iVar6 != 0) {
    pfStack_11e8 = (fdb_kvs_handle *)0x10d0b7;
    compact_with_reopen_test();
  }
  pfVar17 = &fStack_c20;
  pbVar18 = abStack_1040;
  pfVar11 = (fdb_kvs_handle *)0x0;
  uVar19 = 0;
  do {
    pfStack_11e8 = (fdb_kvs_handle *)0x10d0df;
    sprintf((char *)pfVar17,"newmeta%d",uVar19 & 0xffffffff);
    pfStack_11e8 = (fdb_kvs_handle *)0x10d0fa;
    sprintf((char *)pbVar18,"newbody%d_%s",uVar19 & 0xffffffff,&fStack_c20.bub_ctx.handle);
    pfStack_11e8 = (fdb_kvs_handle *)0x10d10d;
    pbVar10 = (btree *)strlen((char *)pfVar17);
    pfStack_11e8 = (fdb_kvs_handle *)0x10d118;
    sVar8 = strlen((char *)pbVar18);
    pfStack_11e8 = (fdb_kvs_handle *)0x10d12c;
    fdb_doc_update((fdb_doc **)(&abStack_f40[0].ksize + (long)pfVar11),pfVar17,(size_t)pbVar10,
                   pbVar18,sVar8);
    pfStack_11e8 = (fdb_kvs_handle *)0x10d13e;
    fdb_set((fdb_kvs_handle *)auStack_11d0._8_8_,*(fdb_doc **)(&abStack_f40[0].ksize + uVar19 * 8));
    uVar19 = uVar19 + 1;
    pfVar11 = (fdb_kvs_handle *)((long)pfVar11 + 8);
  } while (uVar19 != 100);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d167;
  fdb_open((fdb_file_handle **)&pbStack_11b0,"./compact_test1",&fStack_1138);
  ppfVar22 = &pfStack_11b8;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d17c;
  fdb_kvs_open_default((fdb_file_handle *)pbStack_11b0,ppfVar22,(fdb_kvs_config *)auStack_11a8);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d192;
  fVar5 = fdb_set_log_callback(pfStack_11b8,logCallbackFunc,"compact_with_reopen_test");
  pfVar16 = (fdb_kvs_handle *)0x64;
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d5e1;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d1a6;
  fVar5 = fdb_compact((fdb_file_handle *)auStack_11d0._0_8_,(char *)0x0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d5e6;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d1ba;
  fVar5 = fdb_compact((fdb_file_handle *)auStack_11d0._0_8_,(char *)0x0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d5eb;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d1ce;
  fVar5 = fdb_compact((fdb_file_handle *)auStack_11d0._0_8_,(char *)0x0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d5f0;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d1e0;
  fdb_kvs_close((fdb_kvs_handle *)auStack_11d0._8_8_);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d1ea;
  fdb_close((fdb_file_handle *)auStack_11d0._0_8_);
  pfVar11 = (fdb_kvs_handle *)0x0;
  ppfVar22 = &pfStack_11c0;
  pfVar9 = pfVar17;
  do {
    pfStack_11e8 = (fdb_kvs_handle *)0x10d219;
    fdb_doc_create((fdb_doc **)ppfVar22,
                   (void *)(*(size_t **)(&abStack_f40[0].ksize + (long)pfVar11 * 8))[4],
                   **(size_t **)(&abStack_f40[0].ksize + (long)pfVar11 * 8),(void *)0x0,0,
                   (void *)0x0,0);
    pfStack_11e8 = (fdb_kvs_handle *)0x10d228;
    fVar5 = fdb_get(pfStack_11b8,(fdb_doc *)pfStack_11c0);
    pfVar17 = pfStack_11c0;
    if (fVar5 != FDB_RESULT_SUCCESS) {
      pfStack_11e8 = (fdb_kvs_handle *)0x10d586;
      compact_with_reopen_test();
LAB_0010d586:
      pfStack_11e8 = (fdb_kvs_handle *)0x10d591;
      compact_with_reopen_test();
LAB_0010d591:
      pfStack_11e8 = (fdb_kvs_handle *)0x10d59c;
      compact_with_reopen_test();
      goto LAB_0010d59c;
    }
    pbVar10 = pfStack_11c0->staletree;
    pfVar16 = *(fdb_kvs_handle **)(&abStack_f40[0].ksize + (long)pfVar11 * 8);
    pbVar18 = pfVar16->staletree;
    pfStack_11e8 = (fdb_kvs_handle *)0x10d254;
    iVar6 = bcmp(pbVar10,pbVar18,(size_t)(pfStack_11c0->kvs_config).custom_cmp);
    pfVar9 = pfVar17;
    if (iVar6 != 0) goto LAB_0010d586;
    pbVar10 = (pfVar17->field_6).seqtree;
    pbVar18 = (pfVar16->field_6).seqtree;
    pfStack_11e8 = (fdb_kvs_handle *)0x10d273;
    iVar6 = bcmp(pbVar10,pbVar18,(size_t)(pfVar17->kvs_config).custom_cmp_param);
    if (iVar6 != 0) goto LAB_0010d591;
    pfStack_11e8 = (fdb_kvs_handle *)0x10d283;
    fdb_doc_free((fdb_doc *)pfVar17);
    pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
  } while (pfVar11 != (fdb_kvs_handle *)0x64);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d2a9;
  fVar5 = fdb_open((fdb_file_handle **)auStack_11d0,"./compact_test1",&fStack_1138);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d5f5;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d2c5;
  fVar5 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_11d0._0_8_,(fdb_kvs_handle **)(auStack_11d0 + 8),
                     (fdb_kvs_config *)auStack_11a8);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d5fa;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d2e5;
  fVar5 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_11d0._8_8_,logCallbackFunc,"compact_with_reopen_test"
                    );
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d5ff;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d2ff;
  fdb_get_file_info((fdb_file_handle *)auStack_11d0._0_8_,(fdb_file_info *)(auStack_11a8 + 0x18));
  pfStack_11e8 = (fdb_kvs_handle *)0x10d30e;
  iVar6 = strcmp("./compact_test1.3",(char *)auStack_11a8._24_8_);
  if (iVar6 != 0) {
    pfStack_11e8 = (fdb_kvs_handle *)0x10d31c;
    compact_with_reopen_test();
  }
  pfStack_11e8 = (fdb_kvs_handle *)0x10d326;
  fdb_kvs_close(pfStack_11b8);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d330;
  fdb_close((fdb_file_handle *)pbStack_11b0);
  pfVar11 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_11e8 = (fdb_kvs_handle *)0x10d35f;
    fdb_doc_create((fdb_doc **)&pfStack_11c0,
                   (void *)(*(size_t **)(&abStack_f40[0].ksize + (long)pfVar11 * 8))[4],
                   **(size_t **)(&abStack_f40[0].ksize + (long)pfVar11 * 8),(void *)0x0,0,
                   (void *)0x0,0);
    pfStack_11e8 = (fdb_kvs_handle *)0x10d36e;
    fVar5 = fdb_get((fdb_kvs_handle *)auStack_11d0._8_8_,(fdb_doc *)pfStack_11c0);
    pfVar17 = pfStack_11c0;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d59c;
    pbVar10 = pfStack_11c0->staletree;
    pfVar16 = *(fdb_kvs_handle **)(&abStack_f40[0].ksize + (long)pfVar11 * 8);
    pbVar18 = pfVar16->staletree;
    pfStack_11e8 = (fdb_kvs_handle *)0x10d39a;
    iVar6 = bcmp(pbVar10,pbVar18,(size_t)(pfStack_11c0->kvs_config).custom_cmp);
    if (iVar6 != 0) goto LAB_0010d5a1;
    pbVar10 = (pfVar17->field_6).seqtree;
    pbVar18 = (pfVar16->field_6).seqtree;
    pfStack_11e8 = (fdb_kvs_handle *)0x10d3b9;
    iVar6 = bcmp(pbVar10,pbVar18,(size_t)(pfVar17->kvs_config).custom_cmp_param);
    if (iVar6 != 0) goto LAB_0010d5ac;
    pfStack_11e8 = (fdb_kvs_handle *)0x10d3c9;
    fdb_doc_free((fdb_doc *)pfVar17);
    pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
    pfVar9 = pfVar17;
  } while (pfVar11 != (fdb_kvs_handle *)0x64);
  ppfVar22 = (fdb_kvs_handle **)auStack_11d0;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d3e5;
  fdb_compact((fdb_file_handle *)auStack_11d0._0_8_,(char *)0x0);
  pfVar17 = (fdb_kvs_handle *)(auStack_11d0 + 8);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d3f2;
  fdb_kvs_close((fdb_kvs_handle *)auStack_11d0._8_8_);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d3fa;
  fdb_close((fdb_file_handle *)auStack_11d0._0_8_);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d406;
  system("mv  compact_test1 compact_test.fdb > errorlog.txt");
  pfStack_11e8 = (fdb_kvs_handle *)0x10d41d;
  fdb_open((fdb_file_handle **)ppfVar22,"./compact_test.fdb",&fStack_1138);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d42d;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_11d0._0_8_,(fdb_kvs_handle **)pfVar17,
             (fdb_kvs_config *)auStack_11a8);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d443;
  fVar5 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_11d0._8_8_,logCallbackFunc,"compact_with_reopen_test"
                    );
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d604;
  ppfVar22 = (fdb_kvs_handle **)auStack_11d0;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d45a;
  fdb_compact((fdb_file_handle *)auStack_11d0._0_8_,(char *)0x0);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d464;
  fdb_kvs_close((fdb_kvs_handle *)auStack_11d0._8_8_);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d46c;
  fdb_close((fdb_file_handle *)auStack_11d0._0_8_);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d483;
  fVar5 = fdb_open((fdb_file_handle **)ppfVar22,"./compact_test.fdb",&fStack_1138);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d609;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d49f;
  fVar5 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_11d0._0_8_,(fdb_kvs_handle **)(auStack_11d0 + 8),
                     (fdb_kvs_config *)auStack_11a8);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d60e;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d4bf;
  fVar5 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_11d0._8_8_,logCallbackFunc,"compact_with_reopen_test"
                    );
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_11e8 = (fdb_kvs_handle *)0x10d4d9;
    fdb_get_file_info((fdb_file_handle *)auStack_11d0._0_8_,(fdb_file_info *)(auStack_11a8 + 0x18));
    pfStack_11e8 = (fdb_kvs_handle *)0x10d4e8;
    iVar6 = strcmp("./compact_test.fdb",(char *)auStack_11a8._24_8_);
    if (iVar6 != 0) {
      pfStack_11e8 = (fdb_kvs_handle *)0x10d4f6;
      compact_with_reopen_test();
    }
    if (pdStack_1180 != (docio_handle *)0x64) {
      pfStack_11e8 = (fdb_kvs_handle *)0x10d508;
      compact_with_reopen_test();
    }
    lVar32 = 0;
    do {
      pfStack_11e8 = (fdb_kvs_handle *)0x10d517;
      fdb_doc_free(*(fdb_doc **)(&abStack_f40[0].ksize + lVar32 * 8));
      lVar32 = lVar32 + 1;
    } while (lVar32 != 100);
    pfStack_11e8 = (fdb_kvs_handle *)0x10d52a;
    fdb_kvs_close((fdb_kvs_handle *)auStack_11d0._8_8_);
    pfStack_11e8 = (fdb_kvs_handle *)0x10d534;
    fdb_close((fdb_file_handle *)auStack_11d0._0_8_);
    pfStack_11e8 = (fdb_kvs_handle *)0x10d539;
    fdb_shutdown();
    pfStack_11e8 = (fdb_kvs_handle *)0x10d53e;
    memleak_end();
    pcVar27 = "%s PASSED\n";
    if (compact_with_reopen_test()::__test_pass != '\0') {
      pcVar27 = "%s FAILED\n";
    }
    pfStack_11e8 = (fdb_kvs_handle *)0x10d56f;
    fprintf(_stderr,pcVar27,"compaction with reopen test");
    return;
  }
  goto LAB_0010d613;
LAB_0010eacf:
  pfStack_3258 = (fdb_kvs_handle *)0x10ead4;
  compact_upto_test();
  goto LAB_0010ead4;
LAB_001107eb:
  pfStack_189e0 = (fdb_kvs_handle *)0x1107f6;
  compaction_daemon_test();
  pfVar9 = pfVar25;
LAB_001107f6:
  pfVar25 = pfVar9;
  pfStack_189e0 = (fdb_kvs_handle *)0x1107fb;
  compaction_daemon_test();
LAB_001107fb:
  pfStack_189e0 = (fdb_kvs_handle *)0x110806;
  pcVar27 = (char *)pfVar16;
  compaction_daemon_test();
  pfVar9 = pfVar25;
LAB_00110806:
  _Var38._M_i = (__int_type_conflict)apfStack_187d8;
  pcVar7 = "key%04d";
  pfStack_189e0 = (fdb_kvs_handle *)0x11080b;
  compaction_daemon_test();
  goto LAB_0011080b;
LAB_00110ea0:
  auto_compaction_with_custom_cmp_function();
LAB_00110ea5:
  auto_compaction_with_custom_cmp_function();
LAB_00110eaa:
  auto_compaction_with_custom_cmp_function();
  goto LAB_00110eaf;
LAB_0010d59c:
  pfVar17 = pfVar9;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d5a1;
  compact_with_reopen_test();
LAB_0010d5a1:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d5ac;
  compact_with_reopen_test();
LAB_0010d5ac:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d5b7;
  compact_with_reopen_test();
LAB_0010d5b7:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d5c2;
  compact_with_reopen_test();
  pfVar9 = pfVar11;
LAB_0010d5c2:
  pfVar11 = pfVar9;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d5c7;
  compact_with_reopen_test();
LAB_0010d5c7:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d5d2;
  compact_with_reopen_test();
  pfVar9 = pfVar11;
LAB_0010d5d2:
  ppfVar22 = &pfStack_11c0;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d5d7;
  compact_with_reopen_test();
LAB_0010d5d7:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d5dc;
  compact_with_reopen_test();
  pfVar11 = pfVar9;
LAB_0010d5dc:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d5e1;
  compact_with_reopen_test();
LAB_0010d5e1:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d5e6;
  compact_with_reopen_test();
LAB_0010d5e6:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d5eb;
  compact_with_reopen_test();
LAB_0010d5eb:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d5f0;
  compact_with_reopen_test();
LAB_0010d5f0:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d5f5;
  compact_with_reopen_test();
LAB_0010d5f5:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d5fa;
  compact_with_reopen_test();
LAB_0010d5fa:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d5ff;
  compact_with_reopen_test();
LAB_0010d5ff:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d604;
  compact_with_reopen_test();
LAB_0010d604:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d609;
  compact_with_reopen_test();
LAB_0010d609:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d60e;
  compact_with_reopen_test();
LAB_0010d60e:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d613;
  compact_with_reopen_test();
LAB_0010d613:
  pfStack_11e8 = (fdb_kvs_handle *)compact_reopen_named_kvs;
  compact_with_reopen_test();
  pfStack_19b0 = (fdb_kvs_handle *)0x10d635;
  ppfStack_1210 = ppfVar22;
  pbStack_1208 = pbVar18;
  pfStack_1200 = pfVar11;
  pfStack_11f8 = pfVar17;
  pbStack_11f0 = pbVar10;
  pfStack_11e8 = pfVar16;
  gettimeofday(&tStack_1978,(__timezone_ptr_t)0x0);
  pfStack_19b0 = (fdb_kvs_handle *)0x10d63a;
  memleak_start();
  pfStack_19b0 = (fdb_kvs_handle *)0x10d646;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_19b0 = (fdb_kvs_handle *)0x10d656;
  fdb_get_default_config();
  pfStack_19b0 = (fdb_kvs_handle *)0x10d663;
  fdb_get_default_kvs_config();
  fStack_1830.wal_threshold = 0x400;
  fStack_1830.flags = 1;
  fStack_1830.compaction_threshold = '\0';
  pfStack_19b0 = (fdb_kvs_handle *)0x10d68d;
  fdb_open(&pfStack_1998,"./compact_test1",&fStack_1830);
  pfStack_19b0 = (fdb_kvs_handle *)0x10d6a7;
  fdb_kvs_open(pfStack_1998,&pfStack_19a0,"db",&fStack_1990);
  pfStack_19b0 = (fdb_kvs_handle *)0x10d6bd;
  fVar5 = fdb_set_log_callback(pfStack_19a0,logCallbackFunc,"compact_reopen_named_kvs");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    lVar32 = 0;
    uVar19 = 0;
    do {
      pfStack_19b0 = (fdb_kvs_handle *)0x10d6e5;
      sprintf(acStack_1638,"key%d",uVar19 & 0xffffffff);
      pfStack_19b0 = (fdb_kvs_handle *)0x10d6fd;
      sprintf(acStack_1738,"meta%d",uVar19 & 0xffffffff);
      pfStack_19b0 = (fdb_kvs_handle *)0x10d712;
      sprintf(acStack_1938,"body%d",uVar19 & 0xffffffff);
      pfStack_19b0 = (fdb_kvs_handle *)0x10d725;
      sVar8 = strlen(acStack_1638);
      pfStack_19b0 = (fdb_kvs_handle *)0x10d738;
      sVar12 = strlen(acStack_1738);
      pfStack_19b0 = (fdb_kvs_handle *)0x10d745;
      sVar13 = strlen(acStack_1938);
      pfStack_19b0 = (fdb_kvs_handle *)0x10d767;
      fdb_doc_create((fdb_doc **)((long)apfStack_1538 + lVar32),acStack_1638,sVar8,acStack_1738,
                     sVar12,acStack_1938,sVar13);
      pfStack_19b0 = (fdb_kvs_handle *)0x10d779;
      fdb_set(pfStack_19a0,apfStack_1538[uVar19]);
      uVar19 = uVar19 + 1;
      lVar32 = lVar32 + 8;
    } while (uVar19 != 100);
    pfStack_19b0 = (fdb_kvs_handle *)0x10d799;
    fdb_commit(pfStack_1998,'\0');
    pfStack_19b0 = (fdb_kvs_handle *)0x10d7a3;
    fdb_compact(pfStack_1998,(char *)0x0);
    pfStack_19b0 = (fdb_kvs_handle *)0x10d7b9;
    fdb_get_kvs_info(pfStack_19a0,&fStack_1968);
    lVar32 = (long)(int)fStack_1968.doc_count;
    pfStack_19b0 = (fdb_kvs_handle *)0x10d7c6;
    fdb_kvs_close(pfStack_19a0);
    pfStack_19b0 = (fdb_kvs_handle *)0x10d7ce;
    fdb_close(pfStack_1998);
    pfStack_19b0 = (fdb_kvs_handle *)0x10d7e5;
    fdb_open(&pfStack_1998,"./compact_test1",&fStack_1830);
    pfStack_19b0 = (fdb_kvs_handle *)0x10d7fc;
    fdb_kvs_open(pfStack_1998,&pfStack_19a0,"db",&fStack_1990);
    pfStack_19b0 = (fdb_kvs_handle *)0x10d808;
    fdb_get_kvs_info(pfStack_19a0,&fStack_1968);
    if (lVar32 != CONCAT44(fStack_1968.doc_count._4_4_,(int)fStack_1968.doc_count)) {
      pfStack_19b0 = (fdb_kvs_handle *)0x10d81b;
      compact_reopen_named_kvs();
    }
    pfStack_19b0 = (fdb_kvs_handle *)0x10d825;
    fdb_kvs_close(pfStack_19a0);
    pfStack_19b0 = (fdb_kvs_handle *)0x10d82f;
    fdb_close(pfStack_1998);
    lVar32 = 0;
    do {
      pfStack_19b0 = (fdb_kvs_handle *)0x10d83e;
      fdb_doc_free(apfStack_1538[lVar32]);
      lVar32 = lVar32 + 1;
    } while (lVar32 != 100);
    pfStack_19b0 = (fdb_kvs_handle *)0x10d84c;
    fdb_shutdown();
    pfStack_19b0 = (fdb_kvs_handle *)0x10d851;
    memleak_end();
    pcVar27 = "%s PASSED\n";
    if (compact_reopen_named_kvs()::__test_pass != '\0') {
      pcVar27 = "%s FAILED\n";
    }
    pfStack_19b0 = (fdb_kvs_handle *)0x10d882;
    fprintf(_stderr,pcVar27,"compact reopen named kvs");
    return;
  }
  pfStack_19b0 = (fdb_kvs_handle *)compact_reopen_with_iterator;
  compact_reopen_named_kvs();
  pfStack_1eb8 = (fdb_kvs_handle *)0x10d8b6;
  ppfStack_19d8 = &pfStack_19a0;
  pbStack_19d0 = pbVar18;
  pfStack_19c8 = pfVar11;
  pfStack_19c0 = &fStack_1990;
  ppfStack_19b8 = &pfStack_1998;
  pfStack_19b0 = pfVar16;
  gettimeofday((timeval *)(auStack_1e78 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_1eb8 = (fdb_kvs_handle *)0x10d8bb;
  memleak_start();
  pfStack_1e90 = (fdb_kvs_handle *)0x0;
  pfStack_1eb8 = (fdb_kvs_handle *)0x10d8d0;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_1eb8 = (fdb_kvs_handle *)0x10d8e0;
  fdb_get_default_config();
  pfVar9 = (fdb_kvs_handle *)auStack_1e78;
  pfStack_1eb8 = (fdb_kvs_handle *)0x10d8ed;
  fdb_get_default_kvs_config();
  fStack_1dd8.wal_threshold = 0x400;
  fStack_1dd8.flags = 1;
  fStack_1dd8.compaction_threshold = '\0';
  pbVar10 = (btree *)auStack_1e88;
  pfStack_1eb8 = (fdb_kvs_handle *)0x10d917;
  fdb_open((fdb_file_handle **)pbVar10,"./compact_test1",&fStack_1dd8);
  ppfVar22 = &pfStack_1ea0;
  pfStack_1eb8 = (fdb_kvs_handle *)0x10d931;
  fdb_kvs_open((fdb_file_handle *)auStack_1e88._0_8_,ppfVar22,"db",(fdb_kvs_config *)pfVar9);
  pfStack_1eb8 = (fdb_kvs_handle *)0x10d947;
  pfVar17 = pfStack_1ea0;
  fVar5 = fdb_set_log_callback(pfStack_1ea0,logCallbackFunc,"compact_reopen_with_iterator");
  uVar24 = (uint)pfVar17;
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pbVar18 = (btree *)0x0;
    uVar19 = 0;
    do {
      pfVar2 = &fStack_1be0.config.encryption_key;
      pfStack_1eb8 = (fdb_kvs_handle *)0x10d96f;
      sprintf((char *)pfVar2,"key%d",uVar19 & 0xffffffff);
      pfStack_1eb8 = (fdb_kvs_handle *)0x10d987;
      sprintf((char *)&fStack_1be0,"meta%d",uVar19 & 0xffffffff);
      pfStack_1eb8 = (fdb_kvs_handle *)0x10d99f;
      sprintf(acStack_1ce0,"body%d",uVar19 & 0xffffffff);
      pbVar10 = (btree *)(&bStack_1e50.ksize + (long)pbVar18);
      pfStack_1eb8 = (fdb_kvs_handle *)0x10d9af;
      pfVar11 = (fdb_kvs_handle *)strlen((char *)pfVar2);
      pfVar16 = &fStack_1be0;
      pfStack_1eb8 = (fdb_kvs_handle *)0x10d9c2;
      pfVar9 = (fdb_kvs_handle *)strlen((char *)pfVar16);
      pfStack_1eb8 = (fdb_kvs_handle *)0x10d9d2;
      sVar8 = strlen(acStack_1ce0);
      pfStack_1eb8 = (fdb_kvs_handle *)0x10d9f7;
      fdb_doc_create((fdb_doc **)pbVar10,&fStack_1be0.config.encryption_key,(size_t)pfVar11,pfVar16,
                     (size_t)pfVar9,acStack_1ce0,sVar8);
      pfStack_1eb8 = (fdb_kvs_handle *)0x10da06;
      fdb_set(pfStack_1ea0,*(fdb_doc **)(&bStack_1e50.ksize + uVar19 * 8));
      uVar19 = uVar19 + 1;
      pbVar18 = (btree *)((long)pbVar18 + 8);
    } while (uVar19 != 9);
    pfStack_1eb8 = (fdb_kvs_handle *)0x10da23;
    fdb_commit((fdb_file_handle *)auStack_1e88._0_8_,'\0');
    ppfVar22 = (fdb_kvs_handle **)(auStack_1e88 + 8);
    pfStack_1eb8 = (fdb_kvs_handle *)0x10da3f;
    fdb_open((fdb_file_handle **)ppfVar22,"./compact_test1",&fStack_1dd8);
    pfStack_1eb8 = (fdb_kvs_handle *)0x10da4e;
    pfVar28 = (fdb_file_handle *)auStack_1e88._8_8_;
    fVar5 = fdb_compact((fdb_file_handle *)auStack_1e88._8_8_,"./compact_test2");
    uVar24 = (uint)pfVar28;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010dc71;
    pfStack_1eb8 = (fdb_kvs_handle *)0x10da60;
    fdb_close((fdb_file_handle *)auStack_1e88._8_8_);
    pfStack_1eb8 = (fdb_kvs_handle *)0x10da80;
    pfVar17 = pfStack_1ea0;
    fVar5 = fdb_iterator_init(pfStack_1ea0,&pfStack_1e98,(void *)0x0,0,(void *)0x0,0,0);
    uVar24 = (uint)pfVar17;
    pfVar17 = pfVar9;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010dc76;
    pfVar11 = (fdb_kvs_handle *)0x0;
    ppfVar22 = &pfStack_1e90;
    do {
      pfStack_1eb8 = (fdb_kvs_handle *)0x10da9d;
      fVar5 = fdb_iterator_get(pfStack_1e98,(fdb_doc **)ppfVar22);
      pfVar17 = pfStack_1e90;
      if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_0010dc51:
        pfStack_1eb8 = (fdb_kvs_handle *)0x10dc56;
        compact_reopen_with_iterator();
LAB_0010dc56:
        pfStack_1eb8 = (fdb_kvs_handle *)0x10dc61;
        compact_reopen_with_iterator();
LAB_0010dc61:
        pfStack_1eb8 = (fdb_kvs_handle *)0x10dc6c;
        pbVar30 = pbVar18;
        compact_reopen_with_iterator();
        uVar24 = (uint)pbVar30;
        goto LAB_0010dc6c;
      }
      pbVar10 = (btree *)pfStack_1e90->op_stats;
      pfVar16 = *(fdb_kvs_handle **)(&bStack_1e50.ksize + (long)pfVar11 * 8);
      pbVar18 = (btree *)pfVar16->op_stats;
      pfStack_1eb8 = (fdb_kvs_handle *)0x10dac5;
      iVar6 = bcmp(pbVar10,pbVar18,*(size_t *)&pfStack_1e90->kvs_config);
      pfVar9 = pfVar17;
      if (iVar6 != 0) {
        pfStack_1eb8 = (fdb_kvs_handle *)0x10dc51;
        compact_reopen_with_iterator();
        goto LAB_0010dc51;
      }
      pbVar10 = pfVar17->staletree;
      pbVar18 = pfVar16->staletree;
      pfStack_1eb8 = (fdb_kvs_handle *)0x10dae4;
      iVar6 = bcmp(pbVar10,pbVar18,(size_t)(pfVar17->kvs_config).custom_cmp);
      if (iVar6 != 0) goto LAB_0010dc61;
      pbVar10 = (pfVar17->field_6).seqtree;
      pbVar18 = (pfVar16->field_6).seqtree;
      pfStack_1eb8 = (fdb_kvs_handle *)0x10db03;
      iVar6 = bcmp(pbVar10,pbVar18,(size_t)(pfVar17->kvs_config).custom_cmp_param);
      if (iVar6 != 0) goto LAB_0010dc56;
      pfStack_1eb8 = (fdb_kvs_handle *)0x10db13;
      fdb_doc_free((fdb_doc *)pfVar17);
      pfStack_1e90 = (fdb_kvs_handle *)0x0;
      pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
      pfStack_1eb8 = (fdb_kvs_handle *)0x10db29;
      pfVar29 = pfStack_1e98;
      fVar5 = fdb_iterator_next(pfStack_1e98);
      uVar24 = (uint)pfVar29;
    } while (fVar5 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)pfVar11 != 9) goto LAB_0010dc7b;
    pfStack_1eb8 = (fdb_kvs_handle *)0x10db46;
    fVar5 = fdb_iterator_close(pfStack_1e98);
    uVar24 = (uint)pfStack_1e98;
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_1eb8 = (fdb_kvs_handle *)0x10db66;
      fdb_get_kvs_info(pfStack_1ea0,&fStack_1e08);
      lVar32 = (long)(int)fStack_1e08.doc_count;
      pfStack_1eb8 = (fdb_kvs_handle *)0x10db72;
      fdb_kvs_close(pfStack_1ea0);
      pfStack_1eb8 = (fdb_kvs_handle *)0x10db80;
      fdb_close((fdb_file_handle *)auStack_1e88._0_8_);
      pfStack_1eb8 = (fdb_kvs_handle *)0x10db97;
      fdb_open((fdb_file_handle **)auStack_1e88,"./compact_test2",&fStack_1dd8);
      pfStack_1eb8 = (fdb_kvs_handle *)0x10dbaf;
      fdb_kvs_open((fdb_file_handle *)auStack_1e88._0_8_,&pfStack_1ea0,"db",
                   (fdb_kvs_config *)auStack_1e78);
      pfStack_1eb8 = (fdb_kvs_handle *)0x10dbba;
      fdb_get_kvs_info(pfStack_1ea0,&fStack_1e08);
      if (lVar32 != CONCAT44(fStack_1e08.doc_count._4_4_,(int)fStack_1e08.doc_count)) {
        pfStack_1eb8 = (fdb_kvs_handle *)0x10dbd0;
        compact_reopen_with_iterator();
      }
      pfStack_1eb8 = (fdb_kvs_handle *)0x10dbda;
      fdb_kvs_close(pfStack_1ea0);
      pfStack_1eb8 = (fdb_kvs_handle *)0x10dbe4;
      fdb_close((fdb_file_handle *)auStack_1e88._0_8_);
      lVar32 = 0;
      do {
        pfStack_1eb8 = (fdb_kvs_handle *)0x10dbf0;
        fdb_doc_free(*(fdb_doc **)(&bStack_1e50.ksize + lVar32 * 8));
        lVar32 = lVar32 + 1;
      } while (lVar32 != 9);
      pfStack_1eb8 = (fdb_kvs_handle *)0x10dbfe;
      fdb_shutdown();
      pfStack_1eb8 = (fdb_kvs_handle *)0x10dc03;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (compact_reopen_with_iterator()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      pfStack_1eb8 = (fdb_kvs_handle *)0x10dc34;
      fprintf(_stderr,pcVar27,"compact reopen with iterator");
      return;
    }
  }
  else {
LAB_0010dc6c:
    pfStack_1eb8 = (fdb_kvs_handle *)0x10dc71;
    compact_reopen_with_iterator();
LAB_0010dc71:
    pfStack_1eb8 = (fdb_kvs_handle *)0x10dc76;
    compact_reopen_with_iterator();
    pfVar17 = pfVar9;
LAB_0010dc76:
    pfStack_1eb8 = (fdb_kvs_handle *)0x10dc7b;
    compact_reopen_with_iterator();
LAB_0010dc7b:
    pfStack_1eb8 = (fdb_kvs_handle *)0x10dc80;
    compact_reopen_with_iterator();
  }
  pfStack_1eb8 = (fdb_kvs_handle *)estimate_space_upto_test;
  compact_reopen_with_iterator();
  pcStack_2cd0 = (code *)0x10dca7;
  ppfStack_1ee0 = ppfVar22;
  pbStack_1ed8 = pbVar18;
  pfStack_1ed0 = pfVar11;
  pfStack_1ec8 = pfVar17;
  pbStack_1ec0 = pbVar10;
  pfStack_1eb8 = pfVar16;
  gettimeofday(&tStack_2c58,(__timezone_ptr_t)0x0);
  pcStack_2cd0 = (code *)0x10dcac;
  memleak_start();
  pcStack_2cd0 = (code *)0x10dcbc;
  fdb_get_default_config();
  pcStack_2cd0 = (code *)0x10dcc6;
  fdb_get_default_kvs_config();
  fStack_2940.buffercache_size = 0;
  fStack_2940.wal_threshold = 0x32;
  fStack_2940.flags = 1;
  fStack_2940.compaction_threshold = '\0';
  fStack_2940.block_reusing_threshold = 0;
  pcStack_2cd0 = (code *)0x10dcf4;
  fStack_2940.multi_kv_instances = (bool)(char)uVar24;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_2cd0 = (code *)0x10dd08;
  fdb_open(&pfStack_2cb8,"./compact_test1",&fStack_2940);
  uStack_2c9c = uVar24;
  if (uVar24 == 0) {
    pcStack_2cd0 = (code *)0x10dd74;
    fdb_kvs_open_default(pfStack_2cb8,apfStack_2c98,&fStack_2c78);
    sVar20 = 1;
  }
  else {
    ppfVar22 = apfStack_2c98;
    uVar19 = 0;
    do {
      pcStack_2cd0 = (code *)0x10dd39;
      sprintf(acStack_2c60,"kv%d",uVar19 & 0xffffffff);
      pcStack_2cd0 = (code *)0x10dd4c;
      fdb_kvs_open(pfStack_2cb8,ppfVar22,acStack_2c60,&fStack_2c78);
      uVar19 = uVar19 + 1;
      ppfVar22 = ppfVar22 + 1;
    } while (uVar19 != 4);
    sVar20 = 4;
  }
  uVar19 = 0;
  do {
    pcStack_2cd0 = (code *)0x10dd98;
    sprintf(acStack_2a48,"key%d",uVar19 & 0xffffffff);
    pcStack_2cd0 = (code *)0x10ddb1;
    sprintf(acStack_2b48,"meta%d",uVar19 & 0xffffffff);
    pcStack_2cd0 = (code *)0x10ddca;
    sprintf(acStack_2c48,"body%d",uVar19 & 0xffffffff);
    pcStack_2cd0 = (code *)0x10dddd;
    sVar8 = strlen(acStack_2a48);
    pcStack_2cd0 = (code *)0x10ddf0;
    sVar12 = strlen(acStack_2b48);
    pcStack_2cd0 = (code *)0x10de00;
    sVar13 = strlen(acStack_2c48);
    pcStack_2cd0 = (code *)0x10de25;
    fdb_doc_create(apfStack_2848 + uVar19,acStack_2a48,sVar8,acStack_2b48,sVar12,acStack_2c48,sVar13
                  );
    sVar36 = 0;
    do {
      pcStack_2cd0 = (code *)0x10de36;
      fdb_set(apfStack_2c98[sVar36],apfStack_2848[uVar19]);
      sVar36 = sVar36 + 1;
    } while (sVar20 != sVar36);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 0x4b);
  pcStack_2cd0 = (code *)0x10de5a;
  fdb_commit(pfStack_2cb8,'\x01');
  uVar19 = 0x4b;
  do {
    pcStack_2cd0 = (code *)0x10de7c;
    sprintf(acStack_2a48,"key%d",uVar19 & 0xffffffff);
    pcStack_2cd0 = (code *)0x10de95;
    sprintf(acStack_2b48,"meta%d",uVar19 & 0xffffffff);
    pcStack_2cd0 = (code *)0x10deae;
    sprintf(acStack_2c48,"body%d",uVar19 & 0xffffffff);
    pcStack_2cd0 = (code *)0x10dec1;
    sVar8 = strlen(acStack_2a48);
    pcStack_2cd0 = (code *)0x10ded4;
    sVar12 = strlen(acStack_2b48);
    pcStack_2cd0 = (code *)0x10dee4;
    sVar13 = strlen(acStack_2c48);
    pcStack_2cd0 = (code *)0x10df09;
    fdb_doc_create(apfStack_2848 + uVar19,acStack_2a48,sVar8,acStack_2b48,sVar12,acStack_2c48,sVar13
                  );
    sVar36 = 0;
    do {
      pcStack_2cd0 = (code *)0x10df1a;
      fdb_set(apfStack_2c98[sVar36],apfStack_2848[uVar19]);
      sVar36 = sVar36 + 1;
    } while (sVar20 != sVar36);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 0x96);
  lVar32 = 0;
  do {
    sVar36 = 0;
    do {
      pcStack_2cd0 = (code *)0x10df4a;
      fdb_set(apfStack_2c98[sVar36],apfStack_2848[lVar32]);
      sVar36 = sVar36 + 1;
    } while (sVar20 != sVar36);
    lVar32 = lVar32 + 1;
  } while (lVar32 != 0x4b);
  lVar32 = 0;
  do {
    sVar36 = 0;
    do {
      pcStack_2cd0 = (code *)0x10df73;
      fdb_set(apfStack_2c98[sVar36],apfStack_2848[lVar32]);
      sVar36 = sVar36 + 1;
    } while (sVar20 != sVar36);
    lVar32 = lVar32 + 1;
  } while (lVar32 != 0x4b);
  pcStack_2cd0 = (code *)0x10df90;
  fdb_commit(pfStack_2cb8,'\0');
  uVar19 = 0x96;
  do {
    pcStack_2cd0 = (code *)0x10dfb2;
    sprintf(acStack_2a48,"key%d",uVar19 & 0xffffffff);
    pcStack_2cd0 = (code *)0x10dfcb;
    sprintf(acStack_2b48,"meta%d",uVar19 & 0xffffffff);
    pcStack_2cd0 = (code *)0x10dfe4;
    sprintf(acStack_2c48,"body%d",uVar19 & 0xffffffff);
    pcStack_2cd0 = (code *)0x10dff7;
    sVar8 = strlen(acStack_2a48);
    pcStack_2cd0 = (code *)0x10e00a;
    sVar12 = strlen(acStack_2b48);
    pcStack_2cd0 = (code *)0x10e01a;
    sVar13 = strlen(acStack_2c48);
    pcStack_2cd0 = (code *)0x10e03f;
    fdb_doc_create(apfStack_2848 + uVar19,acStack_2a48,sVar8,acStack_2b48,sVar12,acStack_2c48,sVar13
                  );
    sVar36 = 0;
    do {
      pcStack_2cd0 = (code *)0x10e050;
      fdb_set(apfStack_2c98[sVar36],apfStack_2848[uVar19]);
      sVar36 = sVar36 + 1;
    } while (sVar20 != sVar36);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 0xe1);
  pcStack_2cd0 = (code *)0x10e077;
  fdb_commit(pfStack_2cb8,'\x01');
  uVar19 = 0xe1;
  do {
    pcStack_2cd0 = (code *)0x10e099;
    sprintf(acStack_2a48,"key%d",uVar19 & 0xffffffff);
    pcStack_2cd0 = (code *)0x10e0b2;
    sprintf(acStack_2b48,"meta%d",uVar19 & 0xffffffff);
    pcStack_2cd0 = (code *)0x10e0cb;
    sprintf(acStack_2c48,"body%d",uVar19 & 0xffffffff);
    ppfVar37 = apfStack_2848 + uVar19;
    pcStack_2cd0 = (code *)0x10e0de;
    sVar8 = strlen(acStack_2a48);
    pcStack_2cd0 = (code *)0x10e0f1;
    sVar12 = strlen(acStack_2b48);
    pcStack_2cd0 = (code *)0x10e101;
    sVar13 = strlen(acStack_2c48);
    pcStack_2cd0 = (code *)0x10e126;
    fdb_doc_create(ppfVar37,acStack_2a48,sVar8,acStack_2b48,sVar12,acStack_2c48,sVar13);
    sVar36 = 0;
    do {
      pcStack_2cd0 = (code *)0x10e137;
      fdb_set(apfStack_2c98[sVar36],*ppfVar37);
      sVar36 = sVar36 + 1;
    } while (sVar20 != sVar36);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 300);
  sVar36 = 0;
  pcStack_2cd0 = (code *)0x10e15e;
  fdb_commit(pfStack_2cb8,'\0');
  do {
    pfVar9 = apfStack_2c98[sVar36];
    pcStack_2cd0 = (code *)0x10e17c;
    fVar5 = fdb_set_log_callback(pfVar9,logCallbackFunc,"estimate_space_upto_test");
    iVar6 = (int)pfVar9;
    if (fVar5 != FDB_RESULT_SUCCESS) {
      pcStack_2cd0 = (code *)0x10e2f3;
      estimate_space_upto_test();
      goto LAB_0010e2f3;
    }
    sVar36 = sVar36 + 1;
  } while (sVar20 != sVar36);
  pcStack_2cd0 = (code *)0x10e1a0;
  pfVar28 = pfStack_2cb8;
  fVar5 = fdb_get_all_snap_markers(pfStack_2cb8,&pfStack_2cb0,&uStack_2ca8);
  iVar6 = (int)pfVar28;
  if (fVar5 == FDB_RESULT_SUCCESS) {
    sVar8 = (size_t)uStack_2c9c;
    cVar23 = (char)uStack_2c9c;
    uVar15 = uStack_2ca8;
    if (cVar23 != '\0') {
      if (uStack_2ca8 != 8) {
        pcStack_2cd0 = (code *)0x10e1c6;
        estimate_space_upto_test();
      }
      pcStack_2cd0 = (code *)0x10e1d9;
      sVar20 = fdb_estimate_space_used_from(pfStack_2cb8,pfStack_2cb0[1].marker);
      pcStack_2cd0 = (code *)0x10e1ef;
      sVar14 = fdb_estimate_space_used_from(pfStack_2cb8,pfStack_2cb0[2].marker);
      if (sVar14 <= sVar20) {
        pcStack_2cd0 = (code *)0x10e1f9;
        estimate_space_upto_test();
        uVar15 = extraout_RAX;
        goto LAB_0010e1f9;
      }
LAB_0010e23b:
      pcStack_2cd0 = (code *)0x10e24a;
      fVar5 = fdb_free_snap_markers(pfStack_2cb0,uStack_2ca8);
      iVar6 = (int)pfStack_2cb0;
      if (fVar5 == FDB_RESULT_SUCCESS) {
        pcStack_2cd0 = (code *)0x10e25c;
        fdb_close(pfStack_2cb8);
        lVar32 = 0;
        do {
          pcStack_2cd0 = (code *)0x10e26b;
          fdb_doc_free(apfStack_2848[lVar32]);
          lVar32 = lVar32 + 1;
        } while (lVar32 != 300);
        pcStack_2cd0 = (code *)0x10e27c;
        fdb_shutdown();
        pcStack_2cd0 = (code *)0x10e281;
        memleak_end();
        pcVar27 = "single kv mode:";
        if (cVar23 != '\0') {
          pcVar27 = "multiple kv mode:";
        }
        pcStack_2cd0 = (code *)0x10e2af;
        sprintf(acStack_2c48,"estimate space upto marker in file test %s",pcVar27);
        pcVar27 = "%s PASSED\n";
        if (estimate_space_upto_test(bool)::__test_pass != '\0') {
          pcVar27 = "%s FAILED\n";
        }
        pcStack_2cd0 = (code *)0x10e2dc;
        fprintf(_stderr,pcVar27,acStack_2c48);
        return;
      }
      goto LAB_0010e2f8;
    }
LAB_0010e1f9:
    if (uVar15 != 4) {
      pcStack_2cd0 = (code *)0x10e209;
      estimate_space_upto_test();
    }
    pcStack_2cd0 = (code *)0x10e21c;
    sVar20 = fdb_estimate_space_used_from(pfStack_2cb8,pfStack_2cb0[1].marker);
    pcStack_2cd0 = (code *)0x10e232;
    pfVar28 = pfStack_2cb8;
    sVar14 = fdb_estimate_space_used_from(pfStack_2cb8,pfStack_2cb0[2].marker);
    iVar6 = (int)pfVar28;
    if (sVar20 < sVar14) goto LAB_0010e23b;
  }
  else {
LAB_0010e2f3:
    pcStack_2cd0 = (code *)0x10e2f8;
    estimate_space_upto_test();
LAB_0010e2f8:
    pcStack_2cd0 = (code *)0x10e2fd;
    estimate_space_upto_test();
  }
  pcStack_2cd0 = compact_upto_test;
  estimate_space_upto_test();
  pcStack_2cd8 = logCallbackFunc;
  pcStack_2ce0 = "estimate_space_upto_test";
  pfStack_3258 = (fdb_kvs_handle *)0x10e327;
  sStack_2cf8 = sVar20;
  sStack_2cf0 = sVar36;
  ppfStack_2ce8 = ppfVar37;
  pcStack_2cd0 = (code *)sVar8;
  gettimeofday(&tStack_31a0,(__timezone_ptr_t)0x0);
  pfStack_3258 = (fdb_kvs_handle *)0x10e32c;
  memleak_start();
  pfStack_3258 = (fdb_kvs_handle *)0x10e33c;
  fdb_get_default_config();
  pfStack_3258 = (fdb_kvs_handle *)0x10e346;
  fdb_get_default_kvs_config();
  fStack_2df0.buffercache_size = 0;
  fStack_2df0.wal_threshold = 0x400;
  fStack_2df0.flags = 1;
  fStack_2df0.compaction_threshold = '\0';
  fStack_2df0.block_reusing_threshold = 0;
  pfStack_3258 = (fdb_kvs_handle *)0x10e374;
  fStack_2df0.multi_kv_instances = (bool)(char)iVar6;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_3258 = (fdb_kvs_handle *)0x10e388;
  fdb_open(&pfStack_3238,"./compact_test1",&fStack_2df0);
  iStack_3224 = iVar6;
  if (iVar6 == 0) {
    pfStack_3258 = (fdb_kvs_handle *)0x10e3f4;
    fdb_kvs_open_default
              (pfStack_3238,(fdb_kvs_handle **)(auStack_3220 + 0x20),
               (fdb_kvs_config *)(auStack_3220 + 0x48));
    uVar24 = 1;
  }
  else {
    ppfVar22 = (fdb_kvs_handle **)(auStack_3220 + 0x20);
    uVar19 = 0;
    do {
      pfStack_3258 = (fdb_kvs_handle *)0x10e3b9;
      sprintf(auStack_3220,"kv%d",uVar19 & 0xffffffff);
      pfStack_3258 = (fdb_kvs_handle *)0x10e3cc;
      fdb_kvs_open(pfStack_3238,ppfVar22,auStack_3220,(fdb_kvs_config *)(auStack_3220 + 0x48));
      uVar19 = uVar19 + 1;
      ppfVar22 = ppfVar22 + 1;
    } while (uVar19 != 4);
    uVar24 = 4;
  }
  pfVar9 = (fdb_kvs_handle *)(ulong)uVar24;
  uVar19 = 0;
  do {
    pfStack_3258 = (fdb_kvs_handle *)0x10e41a;
    sprintf((char *)&fStack_3190.kv_info_offset,"key%d",uVar19 & 0xffffffff);
    pfStack_3258 = (fdb_kvs_handle *)0x10e433;
    sprintf((char *)&fStack_3190.config.compaction_minimum_filesize,"meta%d",uVar19 & 0xffffffff);
    pfStack_3258 = (fdb_kvs_handle *)0x10e44c;
    sprintf(acStack_2ef0,"body%d",uVar19 & 0xffffffff);
    pbVar33 = &fStack_3190.kvs_config.create_if_missing + uVar19 * 8;
    pfStack_3258 = (fdb_kvs_handle *)0x10e45f;
    sVar8 = strlen((char *)&fStack_3190.kv_info_offset);
    puVar3 = &fStack_3190.config.compaction_minimum_filesize;
    pfStack_3258 = (fdb_kvs_handle *)0x10e472;
    sVar12 = strlen((char *)puVar3);
    pfStack_3258 = (fdb_kvs_handle *)0x10e482;
    sVar13 = strlen(acStack_2ef0);
    pfStack_3258 = (fdb_kvs_handle *)0x10e4a7;
    fdb_doc_create((fdb_doc **)pbVar33,&fStack_3190.kv_info_offset,sVar8,puVar3,sVar12,acStack_2ef0,
                   sVar13);
    lVar32 = 0;
    do {
      pfStack_3258 = (fdb_kvs_handle *)0x10e4b8;
      fdb_set(*(fdb_kvs_handle **)(auStack_3220 + lVar32 * 8 + 0x20),*(fdb_doc **)pbVar33);
      lVar32 = lVar32 + 1;
    } while (pfVar9 != (fdb_kvs_handle *)lVar32);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 5);
  pfStack_3258 = (fdb_kvs_handle *)0x10e4dc;
  fdb_commit(pfStack_3238,'\x01');
  uVar19 = 5;
  do {
    pfStack_3258 = (fdb_kvs_handle *)0x10e4fe;
    sprintf((char *)&fStack_3190.kv_info_offset,"key%d",uVar19 & 0xffffffff);
    puVar3 = &fStack_3190.config.compaction_minimum_filesize;
    pfStack_3258 = (fdb_kvs_handle *)0x10e51a;
    sprintf((char *)puVar3,"meta%d",uVar19 & 0xffffffff);
    pfStack_3258 = (fdb_kvs_handle *)0x10e536;
    sprintf(acStack_2ef0,"body%d",uVar19 & 0xffffffff);
    pbVar33 = &fStack_3190.kvs_config.create_if_missing + uVar19 * 8;
    pfStack_3258 = (fdb_kvs_handle *)0x10e549;
    sVar8 = strlen((char *)&fStack_3190.kv_info_offset);
    pfStack_3258 = (fdb_kvs_handle *)0x10e554;
    sVar12 = strlen((char *)puVar3);
    pfStack_3258 = (fdb_kvs_handle *)0x10e55f;
    sVar13 = strlen(acStack_2ef0);
    pfStack_3258 = (fdb_kvs_handle *)0x10e584;
    fdb_doc_create((fdb_doc **)pbVar33,&fStack_3190.kv_info_offset,sVar8,
                   &fStack_3190.config.compaction_minimum_filesize,sVar12,acStack_2ef0,sVar13);
    lVar32 = 0;
    do {
      pfStack_3258 = (fdb_kvs_handle *)0x10e594;
      fdb_set(*(fdb_kvs_handle **)(auStack_3220 + lVar32 * 8 + 0x20),*(fdb_doc **)pbVar33);
      lVar32 = lVar32 + 1;
    } while (pfVar9 != (fdb_kvs_handle *)lVar32);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 10);
  pfStack_3258 = (fdb_kvs_handle *)0x10e5b5;
  fdb_commit(pfStack_3238,'\0');
  uVar19 = 10;
  do {
    pfStack_3258 = (fdb_kvs_handle *)0x10e5d7;
    sprintf((char *)&fStack_3190.kv_info_offset,"key%d",uVar19 & 0xffffffff);
    puVar3 = &fStack_3190.config.compaction_minimum_filesize;
    pfStack_3258 = (fdb_kvs_handle *)0x10e5f3;
    sprintf((char *)puVar3,"meta%d",uVar19 & 0xffffffff);
    pfStack_3258 = (fdb_kvs_handle *)0x10e60f;
    sprintf(acStack_2ef0,"body%d",uVar19 & 0xffffffff);
    pbVar33 = &fStack_3190.kvs_config.create_if_missing + uVar19 * 8;
    pfStack_3258 = (fdb_kvs_handle *)0x10e622;
    sVar8 = strlen((char *)&fStack_3190.kv_info_offset);
    pfStack_3258 = (fdb_kvs_handle *)0x10e62d;
    sVar12 = strlen((char *)puVar3);
    pfStack_3258 = (fdb_kvs_handle *)0x10e638;
    sVar13 = strlen(acStack_2ef0);
    pfStack_3258 = (fdb_kvs_handle *)0x10e65d;
    fdb_doc_create((fdb_doc **)pbVar33,&fStack_3190.kv_info_offset,sVar8,
                   &fStack_3190.config.compaction_minimum_filesize,sVar12,acStack_2ef0,sVar13);
    lVar32 = 0;
    do {
      pfStack_3258 = (fdb_kvs_handle *)0x10e66d;
      fdb_set(*(fdb_kvs_handle **)(auStack_3220 + lVar32 * 8 + 0x20),*(fdb_doc **)pbVar33);
      lVar32 = lVar32 + 1;
    } while (pfVar9 != (fdb_kvs_handle *)lVar32);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 0xf);
  pfStack_3258 = (fdb_kvs_handle *)0x10e691;
  fdb_commit(pfStack_3238,'\x01');
  uVar19 = 0xf;
  do {
    pfStack_3258 = (fdb_kvs_handle *)0x10e6b3;
    sprintf((char *)&fStack_3190.kv_info_offset,"key%d",uVar19 & 0xffffffff);
    puVar3 = &fStack_3190.config.compaction_minimum_filesize;
    pfStack_3258 = (fdb_kvs_handle *)0x10e6cf;
    sprintf((char *)puVar3,"meta%d",uVar19 & 0xffffffff);
    pfStack_3258 = (fdb_kvs_handle *)0x10e6eb;
    sprintf(acStack_2ef0,"body%d",uVar19 & 0xffffffff);
    pfVar17 = (fdb_kvs_handle *)(&fStack_3190.kvs_config.create_if_missing + uVar19 * 8);
    pfStack_3258 = (fdb_kvs_handle *)0x10e6fe;
    sVar8 = strlen((char *)&fStack_3190.kv_info_offset);
    pfStack_3258 = (fdb_kvs_handle *)0x10e709;
    pfVar16 = (fdb_kvs_handle *)strlen((char *)puVar3);
    pfStack_3258 = (fdb_kvs_handle *)0x10e714;
    sVar12 = strlen(acStack_2ef0);
    pfStack_3258 = (fdb_kvs_handle *)0x10e739;
    fdb_doc_create((fdb_doc **)pfVar17,&fStack_3190.kv_info_offset,sVar8,
                   &fStack_3190.config.compaction_minimum_filesize,(size_t)pfVar16,acStack_2ef0,
                   sVar12);
    lVar32 = 0;
    do {
      pfStack_3258 = (fdb_kvs_handle *)0x10e749;
      fdb_set(*(fdb_kvs_handle **)(auStack_3220 + lVar32 * 8 + 0x20),
              *(fdb_doc **)&pfVar17->kvs_config);
      lVar32 = lVar32 + 1;
    } while (pfVar9 != (fdb_kvs_handle *)lVar32);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 0x14);
  lVar32 = 0;
  pfStack_3258 = (fdb_kvs_handle *)0x10e76d;
  fdb_commit(pfStack_3238,'\0');
  __s = logCallbackFunc;
  pcVar27 = "compact_upto_test";
  do {
    pfStack_3258 = (fdb_kvs_handle *)0x10e78b;
    fVar5 = fdb_set_log_callback
                      (*(fdb_kvs_handle **)(auStack_3220 + lVar32 * 8 + 0x20),logCallbackFunc,
                       "compact_upto_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010eacf;
    lVar32 = lVar32 + 1;
  } while (pfVar9 != (fdb_kvs_handle *)lVar32);
  pfStack_3258 = (fdb_kvs_handle *)0x10e7af;
  fVar5 = fdb_get_all_snap_markers(pfStack_3238,&pfStack_3240,(uint64_t *)&pcStack_3230);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    if ((char)iStack_3224 == '\0') {
      if (pcStack_3230 != (char *)0x4) {
        pfStack_3258 = (fdb_kvs_handle *)0x10e8c9;
        compact_upto_test();
      }
      if (pcStack_3230 != (char *)0x0) {
        lVar32 = 0x1400000000;
        pfVar16 = (fdb_kvs_handle *)0x0;
        pfVar17 = (fdb_kvs_handle *)0xfffffffb00000000;
        pcVar27 = (char *)0x0;
        do {
          if (*(long *)((long)&pfStack_3240->num_kvs_markers + (long)pfVar16) != 1) {
            pfStack_3258 = (fdb_kvs_handle *)0x10eab6;
            compact_upto_test();
          }
          if (*(long *)(*(long *)((long)&pfStack_3240->kvs_markers + (long)pfVar16) + 8) !=
              lVar32 >> 0x20) {
            pfStack_3258 = (fdb_kvs_handle *)0x10eac3;
            compact_upto_test();
          }
          pcVar27 = pcVar27 + 1;
          lVar32 = lVar32 + -0x500000000;
          pfVar16 = (fdb_kvs_handle *)((long)pfVar16 + 0x18);
        } while (pcVar27 < pcStack_3230);
      }
      __s = (code *)auStack_31c0;
      pfStack_3258 = (fdb_kvs_handle *)0x10e8f3;
      sprintf((char *)__s,"compact_test_compact%d",1);
      pfStack_3258 = (fdb_kvs_handle *)0x10e909;
      fVar5 = fdb_compact_upto(pfStack_3238,(char *)__s,pfStack_3240[1].marker);
      if (fVar5 == FDB_RESULT_SUCCESS) {
        pfStack_3258 = (fdb_kvs_handle *)0x10e92d;
        fVar5 = fdb_snapshot_open((fdb_kvs_handle *)auStack_3220._32_8_,
                                  (fdb_kvs_handle **)(auStack_3220 + 0x18),
                                  (pfStack_3240[1].kvs_markers)->seqnum);
        if (fVar5 != FDB_RESULT_SUCCESS) {
          pfStack_3258 = (fdb_kvs_handle *)0x10e936;
          compact_upto_test();
          goto LAB_0010e936;
        }
LAB_0010e996:
        __s = (code *)auStack_31c0;
        pfStack_3258 = (fdb_kvs_handle *)0x10e9a0;
        fdb_kvs_close((fdb_kvs_handle *)auStack_3220._24_8_);
        pfStack_3258 = (fdb_kvs_handle *)0x10e9af;
        fVar5 = fdb_free_snap_markers(pfStack_3240,(uint64_t)pcStack_3230);
        if (fVar5 == FDB_RESULT_SUCCESS) {
          pfStack_3258 = (fdb_kvs_handle *)0x10e9c1;
          fdb_close(pfStack_3238);
          lVar32 = 0;
          do {
            pfStack_3258 = (fdb_kvs_handle *)0x10e9d0;
            fdb_doc_free(*(fdb_doc **)(&fStack_3190.kvs_config.create_if_missing + lVar32 * 8));
            lVar32 = lVar32 + 1;
          } while (lVar32 != 0x14);
          pfStack_3258 = (fdb_kvs_handle *)0x10e9de;
          fdb_shutdown();
          pfStack_3258 = (fdb_kvs_handle *)0x10e9e3;
          memleak_end();
          pcVar27 = "single kv mode:";
          if ((char)iStack_3224 != '\0') {
            pcVar27 = "multiple kv mode:";
          }
          pfStack_3258 = (fdb_kvs_handle *)0x10ea13;
          sprintf(acStack_2ef0,"compact upto marker in file test %s",pcVar27);
          pcVar27 = "%s PASSED\n";
          if (compact_upto_test(bool)::__test_pass != '\0') {
            pcVar27 = "%s FAILED\n";
          }
          pfStack_3258 = (fdb_kvs_handle *)0x10ea40;
          fprintf(_stderr,pcVar27,acStack_2ef0);
          return;
        }
        goto LAB_0010ead9;
      }
      goto LAB_0010eade;
    }
    if (pcStack_3230 != (char *)0x8) {
      pfStack_3258 = (fdb_kvs_handle *)0x10e7d7;
      compact_upto_test();
    }
    auStack_3220._8_8_ = ZEXT48(uVar24 + 1);
    pfVar16 = (fdb_kvs_handle *)auStack_3220;
    pvVar21 = (void *)0x0;
    do {
      pcVar27 = (char *)((long)pvVar21 * 3);
      if ((fdb_custom_cmp_variable)pfStack_3240[(long)pvVar21].num_kvs_markers !=
          (fdb_custom_cmp_variable)auStack_3220._8_8_) {
        pfStack_3258 = (fdb_kvs_handle *)0x10e8b4;
        compact_upto_test();
      }
      __s = (code *)((long)pvVar21 * -5 + 0x14);
      lVar32 = 8;
      pfVar17 = (fdb_kvs_handle *)0x0;
      auStack_3220._16_8_ = pvVar21;
      do {
        if (*(code **)(lVar32 + (long)&(pfStack_3240[(long)pvVar21].kvs_markers)->kv_store_name) !=
            __s) {
          pfStack_3258 = (fdb_kvs_handle *)0x10e88a;
          compact_upto_test();
        }
        pfStack_3258 = (fdb_kvs_handle *)0x10e83d;
        sprintf((char *)pfVar16,"kv%d",(ulong)pfVar17 & 0xffffffff);
        psVar4 = *(short **)((long)&pfStack_3240[(long)pvVar21].kvs_markers[-1].seqnum + lVar32);
        if ((char)psVar4[1] != auStack_3220[2] || *psVar4 != auStack_3220._0_2_) {
          pfStack_3258 = (fdb_kvs_handle *)0x10eacf;
          compact_upto_test();
          goto LAB_0010eacf;
        }
        pfVar17 = (fdb_kvs_handle *)&(pfVar17->kvs_config).field_0x1;
        lVar32 = lVar32 + 0x10;
      } while (pfVar9 != pfVar17);
      pvVar21 = (void *)(auStack_3220._16_8_ + 1);
    } while ((fdb_kvs_handle *)pvVar21 != pfVar9);
LAB_0010e936:
    __s = (code *)auStack_31c0;
    pfStack_3258 = (fdb_kvs_handle *)0x10e954;
    sprintf((char *)__s,"compact_test_compact%d",1);
    pfStack_3258 = (fdb_kvs_handle *)0x10e96a;
    fVar5 = fdb_compact_upto(pfStack_3238,(char *)__s,pfStack_3240[1].marker);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010eae3;
    pfStack_3258 = (fdb_kvs_handle *)0x10e98e;
    fVar5 = fdb_snapshot_open((fdb_kvs_handle *)auStack_3220._40_8_,
                              (fdb_kvs_handle **)(auStack_3220 + 0x18),
                              pfStack_3240[1].kvs_markers[1].seqnum);
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_0010e996;
  }
  else {
LAB_0010ead4:
    pfStack_3258 = (fdb_kvs_handle *)0x10ead9;
    compact_upto_test();
LAB_0010ead9:
    pfStack_3258 = (fdb_kvs_handle *)0x10eade;
    compact_upto_test();
LAB_0010eade:
    pfStack_3258 = (fdb_kvs_handle *)0x10eae3;
    compact_upto_test();
LAB_0010eae3:
    pfStack_3258 = (fdb_kvs_handle *)0x10eae8;
    compact_upto_test();
  }
  pfStack_3258 = (fdb_kvs_handle *)auto_recover_compact_ok_test;
  compact_upto_test();
  pfStack_3750 = (fdb_kvs_handle *)0x10eb0a;
  pcStack_3280 = __s;
  pfStack_3278 = pfVar16;
  pfStack_3270 = pfVar17;
  pcStack_3268 = pcVar27;
  lStack_3260 = lVar32;
  pfStack_3258 = pfVar9;
  gettimeofday((timeval *)(auStack_36f8 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_3750 = (fdb_kvs_handle *)0x10eb0f;
  memleak_start();
  pfStack_3750 = (fdb_kvs_handle *)0x10eb1b;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_3750 = (fdb_kvs_handle *)0x10eb2b;
  fdb_get_default_config();
  pbVar18 = (btree *)auStack_36f8;
  pfStack_3750 = (fdb_kvs_handle *)0x10eb38;
  fdb_get_default_kvs_config();
  auStack_3688[0x110] = '\0';
  auStack_3688[0x111] = '\0';
  auStack_3688[0x112] = '\0';
  auStack_3688[0x113] = '\x01';
  auStack_3688[0x114] = '\0';
  auStack_3688[0x115] = '\0';
  auStack_3688[0x116] = '\0';
  auStack_3688[0x117] = '\0';
  auStack_3688[0x118] = '\0';
  auStack_3688[0x119] = '\x04';
  auStack_3688[0x11a] = '\0';
  auStack_3688[0x11b] = '\0';
  auStack_3688[0x11c] = '\0';
  auStack_3688[0x11d] = '\0';
  auStack_3688[0x11e] = '\0';
  auStack_3688[0x11f] = '\0';
  auStack_3688._300_4_ = 1;
  auStack_3688[0x137] = 0;
  pbVar10 = (btree *)&pfStack_3730;
  pfStack_3750 = (fdb_kvs_handle *)0x10eb6a;
  fdb_open((fdb_file_handle **)pbVar10,"./compact_test1",(fdb_config *)(auStack_3688 + 0x108));
  ppfVar22 = &pfStack_3738;
  pfStack_3750 = (fdb_kvs_handle *)0x10eb7d;
  fdb_kvs_open_default(pfStack_3730,ppfVar22,(fdb_kvs_config *)pbVar18);
  pfStack_3750 = (fdb_kvs_handle *)0x10eb93;
  fVar5 = fdb_set_log_callback(pfStack_3738,logCallbackFunc,"auto_recover_compact_ok_test");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_3750 = (fdb_kvs_handle *)0x10ebb7;
    fdb_open((fdb_file_handle **)auStack_3720,"./compact_test1",(fdb_config *)(auStack_3688 + 0x108)
            );
    ppfVar22 = &pfStack_3728;
    pfStack_3750 = (fdb_kvs_handle *)0x10ebcc;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_3720._0_8_,ppfVar22,(fdb_kvs_config *)auStack_36f8);
    pfStack_3750 = (fdb_kvs_handle *)0x10ebe2;
    fVar5 = fdb_set_log_callback(pfStack_3728,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010efd1;
    lVar32 = 0;
    uVar19 = 0;
    do {
      pfStack_3750 = (fdb_kvs_handle *)0x10ec0a;
      sprintf(acStack_3388,"key%d",uVar19 & 0xffffffff);
      pfStack_3750 = (fdb_kvs_handle *)0x10ec22;
      sprintf(auStack_3688 + 0x200,"meta%d",uVar19 & 0xffffffff);
      pfStack_3750 = (fdb_kvs_handle *)0x10ec3a;
      sprintf(auStack_3688,"body%d",uVar19 & 0xffffffff);
      pfStack_3750 = (fdb_kvs_handle *)0x10ec4a;
      sVar8 = strlen(acStack_3388);
      pfStack_3750 = (fdb_kvs_handle *)0x10ec5d;
      sVar12 = strlen(auStack_3688 + 0x200);
      pfStack_3750 = (fdb_kvs_handle *)0x10ec6d;
      sVar13 = strlen(auStack_3688);
      pfStack_3750 = (fdb_kvs_handle *)0x10ec92;
      fdb_doc_create((fdb_doc **)(auStack_3720 + lVar32 + 8),acStack_3388,sVar8,auStack_3688 + 0x200
                     ,sVar12,auStack_3688,sVar13);
      pfStack_3750 = (fdb_kvs_handle *)0x10eca1;
      fdb_set(pfStack_3738,*(fdb_doc **)(auStack_3720 + uVar19 * 8 + 8));
      uVar19 = uVar19 + 1;
      lVar32 = lVar32 + 8;
    } while (uVar19 == 1);
    pfStack_3750 = (fdb_kvs_handle *)0x10ece2;
    fdb_doc_create((fdb_doc **)&pfStack_3740,*(void **)(auStack_3720._16_8_ + 0x20),
                   *(size_t *)auStack_3720._16_8_,*(void **)(auStack_3720._16_8_ + 0x38),
                   *(size_t *)(auStack_3720._16_8_ + 8),(void *)0x0,0);
    *(bool *)&pfStack_3740->file = true;
    pfStack_3750 = (fdb_kvs_handle *)0x10ecf3;
    fdb_set(pfStack_3738,(fdb_doc *)pfStack_3740);
    pfStack_3750 = (fdb_kvs_handle *)0x10ecfb;
    fdb_doc_free((fdb_doc *)pfStack_3740);
    pfStack_3750 = (fdb_kvs_handle *)0x10ed0a;
    fdb_commit(pfStack_3730,'\x01');
    pfStack_3750 = (fdb_kvs_handle *)0x10ed1b;
    fdb_compact(pfStack_3730,"./compact_test2");
    pfStack_3750 = (fdb_kvs_handle *)0x10ed27;
    system("cp  compact_test1 compact_test11 > errorlog.txt");
    pfStack_3750 = (fdb_kvs_handle *)0x10ed45;
    sprintf(acStack_3388,"key%d",2);
    pbVar10 = (btree *)(auStack_3688 + 0x200);
    pfStack_3750 = (fdb_kvs_handle *)0x10ed63;
    sprintf((char *)pbVar10,"meta%d",2);
    pfVar16 = (fdb_kvs_handle *)auStack_3688;
    pfStack_3750 = (fdb_kvs_handle *)0x10ed81;
    sprintf((char *)pfVar16,"body%d",2);
    pfStack_3750 = (fdb_kvs_handle *)0x10ed89;
    pfVar17 = (fdb_kvs_handle *)strlen(acStack_3388);
    pfStack_3750 = (fdb_kvs_handle *)0x10ed94;
    pfVar9 = (fdb_kvs_handle *)strlen((char *)pbVar10);
    pfStack_3750 = (fdb_kvs_handle *)0x10ed9f;
    sVar8 = strlen((char *)pfVar16);
    pfStack_3750 = (fdb_kvs_handle *)0x10edba;
    fdb_doc_create((fdb_doc **)(auStack_3720 + 0x18),acStack_3388,(size_t)pfVar17,pbVar10,
                   (size_t)pfVar9,pfVar16,sVar8);
    pfStack_3750 = (fdb_kvs_handle *)0x10edc7;
    fdb_set(pfStack_3738,(fdb_doc *)auStack_3720._24_8_);
    pfStack_3750 = (fdb_kvs_handle *)0x10edd6;
    fdb_commit(pfStack_3730,'\x01');
    pfStack_3750 = (fdb_kvs_handle *)0x10ede0;
    fdb_kvs_close(pfStack_3738);
    ppfVar22 = &pfStack_3728;
    pfStack_3750 = (fdb_kvs_handle *)0x10eded;
    fdb_kvs_close(pfStack_3728);
    pfStack_3750 = (fdb_kvs_handle *)0x10edf7;
    fdb_close(pfStack_3730);
    pbVar18 = (btree *)auStack_3720;
    pfStack_3750 = (fdb_kvs_handle *)0x10ee04;
    fdb_close((fdb_file_handle *)auStack_3720._0_8_);
    pfStack_3750 = (fdb_kvs_handle *)0x10ee10;
    system("mv  compact_test11 compact_test1 > errorlog.txt");
    pfStack_3750 = (fdb_kvs_handle *)0x10ee27;
    fdb_open((fdb_file_handle **)pbVar18,"./compact_test1",(fdb_config *)(auStack_3688 + 0x108));
    pfStack_3750 = (fdb_kvs_handle *)0x10ee37;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_3720._0_8_,ppfVar22,(fdb_kvs_config *)auStack_36f8);
    pfStack_3750 = (fdb_kvs_handle *)0x10ee4d;
    fVar5 = fdb_set_log_callback(pfStack_3728,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfVar16 = (fdb_kvs_handle *)0x0;
      ppfVar22 = &pfStack_3740;
      while( true ) {
        pfStack_3750 = (fdb_kvs_handle *)0x10ee81;
        fdb_doc_create((fdb_doc **)ppfVar22,
                       (void *)(*(size_t **)(auStack_3720 + (long)pfVar16 * 8 + 8))[4],
                       **(size_t **)(auStack_3720 + (long)pfVar16 * 8 + 8),(void *)0x0,0,(void *)0x0
                       ,0);
        pfStack_3750 = (fdb_kvs_handle *)0x10ee90;
        fVar5 = fdb_get(pfStack_3728,(fdb_doc *)pfStack_3740);
        pfVar11 = pfStack_3740;
        if (pfVar16 != (fdb_kvs_handle *)0x1) break;
        pfVar11 = pfVar17;
        if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010efc7;
LAB_0010eef0:
        pfStack_3750 = (fdb_kvs_handle *)0x10eefa;
        fdb_doc_free((fdb_doc *)pfStack_3740);
        pfVar16 = (fdb_kvs_handle *)&(pfVar16->kvs_config).field_0x1;
        pfVar17 = pfVar11;
        if (pfVar16 == (fdb_kvs_handle *)0x3) {
          pfStack_3750 = (fdb_kvs_handle *)0x10ef19;
          fdb_get_file_info((fdb_file_handle *)auStack_3720._0_8_,&fStack_36d0);
          pfStack_3750 = (fdb_kvs_handle *)0x10ef28;
          iVar6 = strcmp("./compact_test2",fStack_36d0.filename);
          if (iVar6 != 0) {
            pfStack_3750 = (fdb_kvs_handle *)0x10ef36;
            auto_recover_compact_ok_test();
          }
          pfStack_3750 = (fdb_kvs_handle *)0x10ef40;
          fdb_kvs_close(pfStack_3728);
          pfStack_3750 = (fdb_kvs_handle *)0x10ef4a;
          fdb_close((fdb_file_handle *)auStack_3720._0_8_);
          lVar32 = 0;
          do {
            pfStack_3750 = (fdb_kvs_handle *)0x10ef56;
            fdb_doc_free(*(fdb_doc **)(auStack_3720 + lVar32 * 8 + 8));
            lVar32 = lVar32 + 1;
          } while (lVar32 != 3);
          pfStack_3750 = (fdb_kvs_handle *)0x10ef64;
          fdb_shutdown();
          pfStack_3750 = (fdb_kvs_handle *)0x10ef69;
          memleak_end();
          pcVar27 = "%s PASSED\n";
          if (auto_recover_compact_ok_test()::__test_pass != '\0') {
            pcVar27 = "%s FAILED\n";
          }
          pfStack_3750 = (fdb_kvs_handle *)0x10ef9a;
          fprintf(_stderr,pcVar27,"auto recovery after compaction test");
          return;
        }
      }
      if (fVar5 == FDB_RESULT_SUCCESS) {
        pbVar18 = pfStack_3740->staletree;
        pfVar9 = *(fdb_kvs_handle **)(auStack_3720 + (long)pfVar16 * 8 + 8);
        pbVar10 = pfVar9->staletree;
        pfStack_3750 = (fdb_kvs_handle *)0x10eec9;
        iVar6 = bcmp(pbVar18,pbVar10,(size_t)(pfStack_3740->kvs_config).custom_cmp);
        if (iVar6 == 0) {
          pbVar18 = (pfVar11->field_6).seqtree;
          pbVar10 = (pfVar9->field_6).seqtree;
          pfStack_3750 = (fdb_kvs_handle *)0x10eee8;
          iVar6 = bcmp(pbVar18,pbVar10,(size_t)(pfVar11->kvs_config).custom_cmp_param);
          if (iVar6 == 0) goto LAB_0010eef0;
          pfStack_3750 = (fdb_kvs_handle *)0x10efb7;
          auto_recover_compact_ok_test();
          pfVar17 = pfVar11;
          goto LAB_0010efb7;
        }
      }
      else {
LAB_0010efb7:
        pfVar11 = pfVar17;
        pfStack_3750 = (fdb_kvs_handle *)0x10efbc;
        auto_recover_compact_ok_test();
      }
      pfStack_3750 = (fdb_kvs_handle *)0x10efc7;
      auto_recover_compact_ok_test();
      pfVar17 = pfVar11;
LAB_0010efc7:
      pfStack_3750 = (fdb_kvs_handle *)0x10efcc;
      auto_recover_compact_ok_test();
      goto LAB_0010efcc;
    }
  }
  else {
LAB_0010efcc:
    pfStack_3750 = (fdb_kvs_handle *)0x10efd1;
    auto_recover_compact_ok_test();
LAB_0010efd1:
    pfStack_3750 = (fdb_kvs_handle *)0x10efd6;
    auto_recover_compact_ok_test();
  }
  pfStack_3750 = (fdb_kvs_handle *)unlink_after_compaction_test;
  auto_recover_compact_ok_test();
  pfStack_3cb8 = (fdb_kvs_handle *)0x10effb;
  ppfStack_3778 = ppfVar22;
  pfStack_3770 = pfVar16;
  pfStack_3768 = pfVar17;
  pbStack_3760 = pbVar18;
  pbStack_3758 = pbVar10;
  pfStack_3750 = pfVar9;
  gettimeofday(&tStack_3c28,(__timezone_ptr_t)0x0);
  pfStack_3cb8 = (fdb_kvs_handle *)0x10f000;
  memleak_start();
  pfStack_3cb8 = (fdb_kvs_handle *)0x10f00c;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_3cb8 = (fdb_kvs_handle *)0x10f01c;
  fdb_get_default_config();
  config = &fStack_3c18;
  pfStack_3cb8 = (fdb_kvs_handle *)0x10f02c;
  fdb_get_default_kvs_config();
  fStack_3870.buffercache_size = 0x1000000;
  fStack_3870.wal_threshold = 0x400;
  fStack_3870.flags = 1;
  fStack_3870.compaction_threshold = '\0';
  ppfVar37 = &pfStack_3c90;
  pfStack_3cb8 = (fdb_kvs_handle *)0x10f05e;
  fdb_open((fdb_file_handle **)ppfVar37,"./compact_test1",&fStack_3870);
  ppfVar22 = &pfStack_3c98;
  pfStack_3cb8 = (fdb_kvs_handle *)0x10f071;
  fdb_kvs_open_default((fdb_file_handle *)pfStack_3c90,ppfVar22,config);
  pfStack_3cb8 = (fdb_kvs_handle *)0x10f087;
  fVar5 = fdb_set_log_callback(pfStack_3c98,logCallbackFunc,"unlink_after_compaction_test");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfVar16 = (fdb_kvs_handle *)0x0;
    uVar19 = 0;
    do {
      pfStack_3cb8 = (fdb_kvs_handle *)0x10f0af;
      sprintf(auStack_3b00 + 0x100,"key%d",uVar19 & 0xffffffff);
      pfStack_3cb8 = (fdb_kvs_handle *)0x10f0c7;
      sprintf(auStack_3b00,"meta%d",uVar19 & 0xffffffff);
      pfStack_3cb8 = (fdb_kvs_handle *)0x10f0df;
      sprintf(acStack_3c00,"body%d",uVar19 & 0xffffffff);
      ppfVar37 = (fdb_doc **)((long)apfStack_3c80 + (long)pfVar16);
      pfStack_3cb8 = (fdb_kvs_handle *)0x10f0ef;
      pfVar17 = (fdb_kvs_handle *)strlen(auStack_3b00 + 0x100);
      pfVar9 = (fdb_kvs_handle *)auStack_3b00;
      pfStack_3cb8 = (fdb_kvs_handle *)0x10f102;
      config = (fdb_kvs_config *)strlen((char *)pfVar9);
      pfStack_3cb8 = (fdb_kvs_handle *)0x10f112;
      sVar8 = strlen(acStack_3c00);
      pfStack_3cb8 = (fdb_kvs_handle *)0x10f137;
      fdb_doc_create(ppfVar37,auStack_3b00 + 0x100,(size_t)pfVar17,pfVar9,(size_t)config,
                     acStack_3c00,sVar8);
      pfStack_3cb8 = (fdb_kvs_handle *)0x10f146;
      fdb_set(pfStack_3c98,apfStack_3c80[uVar19]);
      uVar19 = uVar19 + 1;
      pfVar16 = (fdb_kvs_handle *)((long)pfVar16 + 8);
    } while (uVar19 != 10);
    pfStack_3cb8 = (fdb_kvs_handle *)0x10f166;
    fdb_commit((fdb_file_handle *)pfStack_3c90,'\x01');
    pfStack_3cb8 = (fdb_kvs_handle *)0x10f17a;
    fVar5 = fdb_snapshot_open(pfStack_3c98,&pfStack_3c88,10);
    ppfVar22 = (fdb_kvs_handle **)0xa;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010f2df;
    pfStack_3cb8 = (fdb_kvs_handle *)0x10f193;
    fVar5 = fdb_compact((fdb_file_handle *)pfStack_3c90,"./compact_test2");
    if (fVar5 == FDB_RESULT_SUCCESS) {
      config = (fdb_kvs_config *)0x0;
      do {
        pfStack_3cb8 = (fdb_kvs_handle *)0x10f1c7;
        fdb_doc_create((fdb_doc **)&pfStack_3ca0,apfStack_3c80[(long)config]->key,
                       apfStack_3c80[(long)config]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_3cb8 = (fdb_kvs_handle *)0x10f1d6;
        fVar5 = fdb_get(pfStack_3c98,(fdb_doc *)pfStack_3ca0);
        if (fVar5 != FDB_RESULT_SUCCESS) {
          pfStack_3cb8 = (fdb_kvs_handle *)0x10f2d5;
          unlink_after_compaction_test();
          goto LAB_0010f2d5;
        }
        pfStack_3cb8 = (fdb_kvs_handle *)0x10f1e8;
        fdb_doc_free((fdb_doc *)pfStack_3ca0);
        config = (fdb_kvs_config *)&config->field_0x1;
      } while (config != (fdb_kvs_config *)0xa);
      pfStack_3cb8 = (fdb_kvs_handle *)0x10f205;
      iVar6 = stat("./compact_test1",(stat *)(auStack_3b00 + 0x200));
      if (iVar6 == 0) {
        pfStack_3cb8 = (fdb_kvs_handle *)0x10f20e;
        unlink_after_compaction_test();
      }
      config = (fdb_kvs_config *)0x0;
      while( true ) {
        pfStack_3cb8 = (fdb_kvs_handle *)0x10f23a;
        fdb_doc_create((fdb_doc **)&pfStack_3ca0,apfStack_3c80[(long)config]->key,
                       apfStack_3c80[(long)config]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_3cb8 = (fdb_kvs_handle *)0x10f249;
        fVar5 = fdb_get(pfStack_3c88,(fdb_doc *)pfStack_3ca0);
        if (fVar5 != FDB_RESULT_SUCCESS) break;
        pfStack_3cb8 = (fdb_kvs_handle *)0x10f25b;
        fdb_doc_free((fdb_doc *)pfStack_3ca0);
        config = (fdb_kvs_config *)&config->field_0x1;
        if (config == (fdb_kvs_config *)0xa) {
          pfStack_3cb8 = (fdb_kvs_handle *)0x10f26e;
          fdb_close((fdb_file_handle *)pfStack_3c90);
          pfStack_3cb8 = (fdb_kvs_handle *)0x10f273;
          fdb_shutdown();
          lVar32 = 0;
          do {
            pfStack_3cb8 = (fdb_kvs_handle *)0x10f27f;
            fdb_doc_free(apfStack_3c80[lVar32]);
            lVar32 = lVar32 + 1;
          } while (lVar32 != 10);
          pfStack_3cb8 = (fdb_kvs_handle *)0x10f28d;
          memleak_end();
          pcVar27 = "%s PASSED\n";
          if (unlink_after_compaction_test()::__test_pass != '\0') {
            pcVar27 = "%s FAILED\n";
          }
          pfStack_3cb8 = (fdb_kvs_handle *)0x10f2be;
          fprintf(_stderr,pcVar27,"unlink after compaction test");
          return;
        }
      }
LAB_0010f2d5:
      ppfVar22 = &pfStack_3ca0;
      pfStack_3cb8 = (fdb_kvs_handle *)0x10f2da;
      unlink_after_compaction_test();
      goto LAB_0010f2da;
    }
  }
  else {
LAB_0010f2da:
    pfStack_3cb8 = (fdb_kvs_handle *)0x10f2df;
    unlink_after_compaction_test();
LAB_0010f2df:
    pfStack_3cb8 = (fdb_kvs_handle *)0x10f2e4;
    unlink_after_compaction_test();
  }
  pfStack_3cb8 = (fdb_kvs_handle *)db_compact_overwrite;
  unlink_after_compaction_test();
  pfStack_4450 = (fdb_kvs_handle *)0x10f309;
  ppfStack_3ce0 = ppfVar22;
  pfStack_3cd8 = pfVar16;
  pfStack_3cd0 = pfVar17;
  pfStack_3cc8 = config;
  ppfStack_3cc0 = ppfVar37;
  pfStack_3cb8 = pfVar9;
  gettimeofday(&tStack_43c8,(__timezone_ptr_t)0x0);
  pfStack_4450 = (fdb_kvs_handle *)0x10f30e;
  memleak_start();
  pfStack_4450 = (fdb_kvs_handle *)0x10f31a;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_4450 = (fdb_kvs_handle *)0x10f32a;
  fdb_get_default_config();
  info = (fdb_kvs_info *)auStack_4410;
  pfStack_4450 = (fdb_kvs_handle *)0x10f337;
  fdb_get_default_kvs_config();
  fStack_41c0.buffercache_size = 0x1000000;
  fStack_41c0.wal_threshold = 0x400;
  fStack_41c0.flags = 1;
  fStack_41c0.compaction_threshold = '\0';
  _Var38._M_i = (__int_type_conflict)(auStack_4428 + 0x10);
  pfStack_4450 = (fdb_kvs_handle *)0x10f369;
  fdb_open((fdb_file_handle **)_Var38._M_i,"./compact_test1",&fStack_41c0);
  ppfVar22 = (fdb_kvs_handle **)auStack_4428;
  pfStack_4450 = (fdb_kvs_handle *)0x10f37e;
  fdb_kvs_open((fdb_file_handle *)auStack_4428._16_8_,ppfVar22,(char *)0x0,(fdb_kvs_config *)info);
  pfStack_4450 = (fdb_kvs_handle *)0x10f394;
  pfVar11 = (fdb_kvs_handle *)auStack_4428._0_8_;
  fVar5 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_4428._0_8_,logCallbackFunc,"db_destroy_test");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfVar16 = (fdb_kvs_handle *)0x0;
    uVar19 = 0;
    do {
      pfStack_4450 = (fdb_kvs_handle *)0x10f3bc;
      sprintf(auStack_40c8 + 0x100,"key%d",uVar19 & 0xffffffff);
      pfStack_4450 = (fdb_kvs_handle *)0x10f3d4;
      sprintf(auStack_40c8,"meta%d",uVar19 & 0xffffffff);
      pfStack_4450 = (fdb_kvs_handle *)0x10f3ec;
      sprintf(acStack_43b8,"body%d",uVar19 & 0xffffffff);
      _Var38._M_i = (long)apfStack_42b8 + (long)pfVar16;
      pfStack_4450 = (fdb_kvs_handle *)0x10f3ff;
      pfVar17 = (fdb_kvs_handle *)strlen(auStack_40c8 + 0x100);
      pfVar9 = (fdb_kvs_handle *)auStack_40c8;
      pfStack_4450 = (fdb_kvs_handle *)0x10f412;
      info = (fdb_kvs_info *)strlen((char *)pfVar9);
      pfStack_4450 = (fdb_kvs_handle *)0x10f422;
      sVar8 = strlen(acStack_43b8);
      pfStack_4450 = (fdb_kvs_handle *)0x10f447;
      fdb_doc_create((fdb_doc **)_Var38._M_i,auStack_40c8 + 0x100,(size_t)pfVar17,pfVar9,
                     (size_t)info,acStack_43b8,sVar8);
      pfStack_4450 = (fdb_kvs_handle *)0x10f459;
      fdb_set((fdb_kvs_handle *)auStack_4428._0_8_,apfStack_42b8[uVar19]);
      uVar19 = uVar19 + 1;
      pfVar16 = (fdb_kvs_handle *)((long)pfVar16 + 8);
    } while (uVar19 != 0x1e);
    pfStack_4450 = (fdb_kvs_handle *)0x10f476;
    fdb_commit((fdb_file_handle *)auStack_4428._16_8_,'\0');
    pfStack_4450 = (fdb_kvs_handle *)0x10f492;
    fdb_open((fdb_file_handle **)(auStack_4428 + 8),"./compact_test1.1",&fStack_41c0);
    ppfVar22 = (fdb_kvs_handle **)(auStack_4438 + 8);
    pfStack_4450 = (fdb_kvs_handle *)0x10f4a9;
    fdb_kvs_open((fdb_file_handle *)auStack_4428._8_8_,ppfVar22,(char *)0x0,
                 (fdb_kvs_config *)auStack_4410);
    pfStack_4450 = (fdb_kvs_handle *)0x10f4bf;
    pfVar11 = (fdb_kvs_handle *)auStack_4438._8_8_;
    fVar5 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_4438._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010f903;
    pfVar16 = (fdb_kvs_handle *)0x0;
    uVar19 = 0;
    do {
      pfStack_4450 = (fdb_kvs_handle *)0x10f4e7;
      sprintf(auStack_40c8 + 0x100,"k2ey%d",uVar19 & 0xffffffff);
      pfStack_4450 = (fdb_kvs_handle *)0x10f4ff;
      sprintf(auStack_40c8,"m2eta%d",uVar19 & 0xffffffff);
      pfStack_4450 = (fdb_kvs_handle *)0x10f517;
      sprintf(acStack_43b8,"b2ody%d",uVar19 & 0xffffffff);
      _Var38._M_i = (__int_type_conflict)(auStack_40c8 + (long)pfVar16 + 0x200);
      pfStack_4450 = (fdb_kvs_handle *)0x10f52a;
      pfVar17 = (fdb_kvs_handle *)strlen(auStack_40c8 + 0x100);
      pfVar9 = (fdb_kvs_handle *)auStack_40c8;
      pfStack_4450 = (fdb_kvs_handle *)0x10f53d;
      info = (fdb_kvs_info *)strlen((char *)pfVar9);
      pfStack_4450 = (fdb_kvs_handle *)0x10f54d;
      sVar8 = strlen(acStack_43b8);
      pfStack_4450 = (fdb_kvs_handle *)0x10f572;
      fdb_doc_create((fdb_doc **)_Var38._M_i,auStack_40c8 + 0x100,(size_t)pfVar17,pfVar9,
                     (size_t)info,acStack_43b8,sVar8);
      pfStack_4450 = (fdb_kvs_handle *)0x10f584;
      fdb_set((fdb_kvs_handle *)auStack_4438._8_8_,(fdb_doc *)auStack_3dd8[uVar19 - 0x1e]);
      uVar19 = uVar19 + 1;
      pfVar16 = (fdb_kvs_handle *)((long)pfVar16 + 8);
    } while (uVar19 != 0x3c);
    pfStack_4450 = (fdb_kvs_handle *)0x10f5a1;
    fdb_commit((fdb_file_handle *)auStack_4428._8_8_,'\0');
    pfStack_4450 = (fdb_kvs_handle *)0x10f5b0;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_4438._8_8_,(fdb_kvs_info *)(auStack_4410 + 0x18));
    ppfVar22 = apfStack_43f0;
    if (apfStack_43f0[0] != (fdb_kvs_handle *)0x3c) {
      pfStack_4450 = (fdb_kvs_handle *)0x10f5c3;
      db_compact_overwrite();
    }
    pfStack_4450 = (fdb_kvs_handle *)0x10f5cd;
    fdb_kvs_close((fdb_kvs_handle *)auStack_4438._8_8_);
    pfStack_4450 = (fdb_kvs_handle *)0x10f5d7;
    fdb_close((fdb_file_handle *)auStack_4428._8_8_);
    pfStack_4450 = (fdb_kvs_handle *)0x10f5e3;
    pfVar11 = (fdb_kvs_handle *)auStack_4428._16_8_;
    fVar5 = fdb_compact((fdb_file_handle *)auStack_4428._16_8_,(char *)0x0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010f908;
    info = (fdb_kvs_info *)auStack_4428;
    pfStack_4450 = (fdb_kvs_handle *)0x10f5f8;
    fdb_kvs_close((fdb_kvs_handle *)auStack_4428._0_8_);
    _Var38._M_i = (__int_type_conflict)(auStack_4428 + 0x10);
    pfStack_4450 = (fdb_kvs_handle *)0x10f605;
    fdb_close((fdb_file_handle *)auStack_4428._16_8_);
    pfStack_4450 = (fdb_kvs_handle *)0x10f61c;
    fdb_open((fdb_file_handle **)_Var38._M_i,"./compact_test1",&fStack_41c0);
    pfStack_4450 = (fdb_kvs_handle *)0x10f62e;
    fdb_kvs_open((fdb_file_handle *)auStack_4428._16_8_,(fdb_kvs_handle **)info,(char *)0x0,
                 (fdb_kvs_config *)auStack_4410);
    pfStack_4450 = (fdb_kvs_handle *)0x10f644;
    pfVar11 = (fdb_kvs_handle *)auStack_4428._0_8_;
    fVar5 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_4428._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010f90d;
    pfVar16 = (fdb_kvs_handle *)0x0;
    info = (fdb_kvs_info *)auStack_4438;
    do {
      pfStack_4450 = (fdb_kvs_handle *)0x10f67b;
      fdb_doc_create((fdb_doc **)info,(void *)(*(size_t **)((long)apfStack_42b8 + (long)pfVar16))[4]
                     ,**(size_t **)((long)apfStack_42b8 + (long)pfVar16),(void *)0x0,0,(void *)0x0,0
                    );
      pfStack_4450 = (fdb_kvs_handle *)0x10f68a;
      pfVar11 = (fdb_kvs_handle *)auStack_4428._0_8_;
      fVar5 = fdb_get((fdb_kvs_handle *)auStack_4428._0_8_,(fdb_doc *)auStack_4438._0_8_);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        pfStack_4450 = (fdb_kvs_handle *)0x10f8f9;
        db_compact_overwrite();
        goto LAB_0010f8f9;
      }
      _Var38._M_i = (long)apfStack_42b8 + (long)pfVar16;
      pfStack_4450 = (fdb_kvs_handle *)0x10f6b6;
      iVar6 = bcmp(*(btree **)(auStack_4438._0_8_ + 0x38),(*(fdb_doc **)_Var38._M_i)->meta,
                   (size_t)((fdb_kvs_config *)auStack_4438._0_8_)->custom_cmp);
      if (iVar6 != 0) {
        pfStack_4450 = (fdb_kvs_handle *)0x10f6ff;
        db_compact_overwrite();
      }
      pfStack_4450 = (fdb_kvs_handle *)0x10f6d3;
      iVar6 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_4438._0_8_ + 0x40))->
                   seqtree,(*(fdb_doc **)_Var38._M_i)->body,
                   (size_t)((fdb_kvs_config *)auStack_4438._0_8_)->custom_cmp_param);
      if (iVar6 != 0) {
        pfStack_4450 = (fdb_kvs_handle *)0x10f70c;
        db_compact_overwrite();
      }
      pfStack_4450 = (fdb_kvs_handle *)0x10f6e1;
      fdb_doc_free((fdb_doc *)auStack_4438._0_8_);
      pfVar16 = (fdb_kvs_handle *)&(pfVar16->kvs_config).custom_cmp;
    } while (pfVar16 != (fdb_kvs_handle *)0xf0);
    pfStack_4450 = (fdb_kvs_handle *)0x10f72a;
    fdb_open((fdb_file_handle **)(auStack_4428 + 8),"./compact_test1.1",&fStack_41c0);
    info = (fdb_kvs_info *)(auStack_4438 + 8);
    pfStack_4450 = (fdb_kvs_handle *)0x10f741;
    fdb_kvs_open((fdb_file_handle *)auStack_4428._8_8_,(fdb_kvs_handle **)info,(char *)0x0,
                 (fdb_kvs_config *)auStack_4410);
    pfStack_4450 = (fdb_kvs_handle *)0x10f757;
    pfVar11 = (fdb_kvs_handle *)auStack_4438._8_8_;
    fVar5 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_4438._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar5 == FDB_RESULT_SUCCESS) {
      info = (fdb_kvs_info *)(auStack_4410 + 0x18);
      pfStack_4450 = (fdb_kvs_handle *)0x10f771;
      fdb_get_kvs_info((fdb_kvs_handle *)auStack_4438._8_8_,info);
      if (apfStack_43f0[0] != (fdb_kvs_handle *)0x3c) {
        pfStack_4450 = (fdb_kvs_handle *)0x10f780;
        db_compact_overwrite();
      }
      _Var38._M_i = 0;
      ppfVar22 = (fdb_kvs_handle **)auStack_4438;
      while( true ) {
        pfStack_4450 = (fdb_kvs_handle *)0x10f7af;
        fdb_doc_create((fdb_doc **)ppfVar22,
                       (void *)(*(size_t **)(auStack_40c8 + 0x200 + _Var38._M_i))[4],
                       **(size_t **)(auStack_40c8 + 0x200 + _Var38._M_i),(void *)0x0,0,(void *)0x0,0
                      );
        pfStack_4450 = (fdb_kvs_handle *)0x10f7be;
        pfVar11 = (fdb_kvs_handle *)auStack_4438._8_8_;
        fVar5 = fdb_get((fdb_kvs_handle *)auStack_4438._8_8_,(fdb_doc *)auStack_4438._0_8_);
        if (fVar5 != FDB_RESULT_SUCCESS) break;
        info = (fdb_kvs_info *)(auStack_40c8 + 0x200 + _Var38._M_i);
        pfStack_4450 = (fdb_kvs_handle *)0x10f7ea;
        iVar6 = bcmp(*(btree **)(auStack_4438._0_8_ + 0x38),*(void **)(info->name + 0x38),
                     (size_t)((fdb_kvs_config *)auStack_4438._0_8_)->custom_cmp);
        if (iVar6 != 0) {
          pfStack_4450 = (fdb_kvs_handle *)0x10f833;
          db_compact_overwrite();
        }
        pfStack_4450 = (fdb_kvs_handle *)0x10f807;
        iVar6 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_4438._0_8_ + 0x40))
                     ->seqtree,*(void **)(info->name + 0x40),
                     (size_t)((fdb_kvs_config *)auStack_4438._0_8_)->custom_cmp_param);
        if (iVar6 != 0) {
          pfStack_4450 = (fdb_kvs_handle *)0x10f840;
          db_compact_overwrite();
        }
        pfStack_4450 = (fdb_kvs_handle *)0x10f815;
        fdb_doc_free((fdb_doc *)auStack_4438._0_8_);
        _Var38._M_i = _Var38._M_i + 8;
        if ((fdb_doc **)_Var38._M_i == (fdb_doc **)0x1e0) {
          lVar32 = 0;
          do {
            pfStack_4450 = (fdb_kvs_handle *)0x10f851;
            fdb_doc_free(apfStack_42b8[lVar32]);
            pfStack_4450 = (fdb_kvs_handle *)0x10f85e;
            fdb_doc_free((fdb_doc *)auStack_3dd8[lVar32 + -0x1e]);
            lVar32 = lVar32 + 1;
          } while (lVar32 != 0x1e);
          lVar32 = 0;
          do {
            pfStack_4450 = (fdb_kvs_handle *)0x10f876;
            fdb_doc_free((fdb_doc *)auStack_3dd8[lVar32]);
            lVar32 = lVar32 + 1;
          } while (lVar32 != 0x1e);
          pfStack_4450 = (fdb_kvs_handle *)0x10f889;
          fdb_kvs_close((fdb_kvs_handle *)auStack_4428._0_8_);
          pfStack_4450 = (fdb_kvs_handle *)0x10f893;
          fdb_close((fdb_file_handle *)auStack_4428._16_8_);
          pfStack_4450 = (fdb_kvs_handle *)0x10f89d;
          fdb_kvs_close((fdb_kvs_handle *)auStack_4438._8_8_);
          pfStack_4450 = (fdb_kvs_handle *)0x10f8a7;
          fdb_close((fdb_file_handle *)auStack_4428._8_8_);
          pfStack_4450 = (fdb_kvs_handle *)0x10f8ac;
          fdb_shutdown();
          pfStack_4450 = (fdb_kvs_handle *)0x10f8b1;
          memleak_end();
          pcVar27 = "%s PASSED\n";
          if (db_compact_overwrite()::__test_pass != '\0') {
            pcVar27 = "%s FAILED\n";
          }
          pfStack_4450 = (fdb_kvs_handle *)0x10f8e2;
          fprintf(_stderr,pcVar27,"compact overwrite");
          return;
        }
      }
LAB_0010f8f9:
      pfStack_4450 = (fdb_kvs_handle *)0x10f8fe;
      db_compact_overwrite();
      goto LAB_0010f8fe;
    }
  }
  else {
LAB_0010f8fe:
    pfStack_4450 = (fdb_kvs_handle *)0x10f903;
    db_compact_overwrite();
LAB_0010f903:
    pfStack_4450 = (fdb_kvs_handle *)0x10f908;
    db_compact_overwrite();
LAB_0010f908:
    pfStack_4450 = (fdb_kvs_handle *)0x10f90d;
    db_compact_overwrite();
LAB_0010f90d:
    pfStack_4450 = (fdb_kvs_handle *)0x10f912;
    db_compact_overwrite();
  }
  pfStack_4450 = (fdb_kvs_handle *)db_compact_during_doc_delete;
  db_compact_overwrite();
  pfStack_4c28 = (fdb_kvs_handle *)0x10f937;
  ppfStack_4478 = ppfVar22;
  pfStack_4470 = pfVar16;
  pfStack_4468 = pfVar17;
  pfStack_4460 = info;
  ppfStack_4458 = (fdb_doc **)_Var38._M_i;
  pfStack_4450 = pfVar9;
  gettimeofday(&tStack_4ba8,(__timezone_ptr_t)0x0);
  pfStack_4c28 = (fdb_kvs_handle *)0x10f93c;
  memleak_start();
  pfStack_4c28 = (fdb_kvs_handle *)0x10f946;
  fdb_get_default_kvs_config();
  pfVar25 = (fdb_kvs_handle *)auStack_4b98;
  pfStack_4c28 = (fdb_kvs_handle *)0x10f956;
  fdb_get_default_config();
  auStack_4b98._8_8_ = (list *)0x0;
  auStack_4b98._16_8_ = (list *)0x400;
  auStack_4b98[0x2f] = '\0';
  if (pfVar11 == (fdb_kvs_handle *)0x0) {
    pfStack_4c28 = (fdb_kvs_handle *)0x10f980;
    system("rm -rf  compact_test* > errorlog.txt");
    ptr_fhandle = (fdb_kvs_handle *)&pfStack_4c10;
    pfStack_4c28 = (fdb_kvs_handle *)0x10f999;
    fVar5 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test1",(fdb_config *)auStack_4b98);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_4c28 = (fdb_kvs_handle *)0x10f9b5;
      ptr_fhandle = pfStack_4c10;
      fVar5 = fdb_kvs_open_default((fdb_file_handle *)pfStack_4c10,&pfStack_4c08,&fStack_4bf0);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010fc6b;
      lVar32 = 0;
      uVar19 = 0;
      do {
        pfStack_4c28 = (fdb_kvs_handle *)0x10f9dd;
        sprintf(acStack_48a0,"key%d",uVar19 & 0xffffffff);
        pfStack_4c28 = (fdb_kvs_handle *)0x10f9f5;
        sprintf(auStack_4b98 + 0x1f8,"meta%d",uVar19 & 0xffffffff);
        pfStack_4c28 = (fdb_kvs_handle *)0x10fa0d;
        sprintf(auStack_4b98 + 0xf8,"body%d",uVar19 & 0xffffffff);
        pfStack_4c28 = (fdb_kvs_handle *)0x10fa20;
        pfVar17 = (fdb_kvs_handle *)strlen(acStack_48a0);
        pfVar9 = (fdb_kvs_handle *)(auStack_4b98 + 0x1f8);
        pfStack_4c28 = (fdb_kvs_handle *)0x10fa33;
        sVar8 = strlen((char *)pfVar9);
        pfStack_4c28 = (fdb_kvs_handle *)0x10fa43;
        sVar12 = strlen(auStack_4b98 + 0xf8);
        pfStack_4c28 = (fdb_kvs_handle *)0x10fa68;
        fdb_doc_create((fdb_doc **)((long)apfStack_47a0 + lVar32),acStack_48a0,(size_t)pfVar17,
                       pfVar9,sVar8,auStack_4b98 + 0xf8,sVar12);
        pfStack_4c28 = (fdb_kvs_handle *)0x10fa7a;
        fdb_set(pfStack_4c08,apfStack_47a0[uVar19]);
        uVar19 = uVar19 + 1;
        lVar32 = lVar32 + 8;
      } while (uVar19 != 100);
      pfStack_4c28 = (fdb_kvs_handle *)0x10fa97;
      fdb_commit((fdb_file_handle *)pfStack_4c10,'\0');
      pfStack_4c28 = (fdb_kvs_handle *)0x10faa6;
      fdb_get_kvs_info(pfStack_4c08,(fdb_kvs_info *)auStack_4bd8);
      pfVar11 = (fdb_kvs_handle *)(auStack_4bd8 + 0x10);
      if ((filemgr *)auStack_4bd8._16_8_ != (filemgr *)0x64) {
        pfStack_4c28 = (fdb_kvs_handle *)0x10fab9;
        db_compact_during_doc_delete();
      }
      lVar32 = 0;
      _Var38._M_i = (__int_type_conflict)&pfStack_4c00;
      do {
        pfStack_4c28 = (fdb_kvs_handle *)0x10fada;
        fdb_del(pfStack_4c08,apfStack_47a0[lVar32]);
        if (lVar32 == 0x32) {
          pfStack_4c28 = (fdb_kvs_handle *)0x10faf2;
          pthread_create((pthread_t *)_Var38._M_i,(pthread_attr_t *)0x0,db_compact_during_doc_delete
                         ,pfStack_4c10);
        }
        lVar32 = lVar32 + 1;
      } while (lVar32 != 100);
      pfStack_4c28 = (fdb_kvs_handle *)0x10fb0a;
      pthread_join((pthread_t)pfStack_4c00,&pvStack_4bf8);
      pfStack_4c28 = (fdb_kvs_handle *)0x10fb19;
      fdb_commit((fdb_file_handle *)pfStack_4c10,'\x01');
      pfStack_4c28 = (fdb_kvs_handle *)0x10fb2b;
      fdb_get_kvs_info(pfStack_4c08,(fdb_kvs_info *)auStack_4bd8);
      if ((filemgr *)auStack_4bd8._16_8_ != (filemgr *)0x0) {
        pfStack_4c28 = (fdb_kvs_handle *)0x10fb3a;
        db_compact_during_doc_delete();
      }
      pfStack_4c28 = (fdb_kvs_handle *)0x10fb44;
      fdb_kvs_close(pfStack_4c08);
      pfVar25 = (fdb_kvs_handle *)&pfStack_4c10;
      pfStack_4c28 = (fdb_kvs_handle *)0x10fb51;
      fdb_close((fdb_file_handle *)pfStack_4c10);
      pfStack_4c28 = (fdb_kvs_handle *)0x10fb68;
      ptr_fhandle = pfVar25;
      fVar5 = fdb_open((fdb_file_handle **)pfVar25,"./compact_test1",(fdb_config *)auStack_4b98);
      pfVar16 = (fdb_kvs_handle *)0x64;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010fc70;
      pfStack_4c28 = (fdb_kvs_handle *)0x10fb84;
      ptr_fhandle = pfStack_4c10;
      fVar5 = fdb_kvs_open_default((fdb_file_handle *)pfStack_4c10,&pfStack_4c08,&fStack_4bf0);
      if (fVar5 == FDB_RESULT_SUCCESS) {
        pfStack_4c28 = (fdb_kvs_handle *)0x10fb9e;
        fdb_get_kvs_info(pfStack_4c08,(fdb_kvs_info *)auStack_4bd8);
        if ((filemgr *)auStack_4bd8._16_8_ != (filemgr *)0x0) {
          pfStack_4c28 = (fdb_kvs_handle *)0x10fbad;
          db_compact_during_doc_delete();
        }
        lVar32 = 0;
        do {
          pfStack_4c28 = (fdb_kvs_handle *)0x10fbbc;
          fdb_doc_free(apfStack_47a0[lVar32]);
          lVar32 = lVar32 + 1;
        } while (lVar32 != 100);
        pfStack_4c28 = (fdb_kvs_handle *)0x10fbcf;
        fdb_kvs_close(pfStack_4c08);
        pfStack_4c28 = (fdb_kvs_handle *)0x10fbd9;
        fdb_close((fdb_file_handle *)pfStack_4c10);
        pfStack_4c28 = (fdb_kvs_handle *)0x10fbde;
        fdb_shutdown();
        pfStack_4c28 = (fdb_kvs_handle *)0x10fbe3;
        memleak_end();
        pcVar27 = "%s PASSED\n";
        if (db_compact_during_doc_delete(void*)::__test_pass != '\0') {
          pcVar27 = "%s FAILED\n";
        }
        pfStack_4c28 = (fdb_kvs_handle *)0x10fc14;
        fprintf(_stderr,pcVar27,"multi thread client shutdown");
        return;
      }
    }
    else {
      pfStack_4c28 = (fdb_kvs_handle *)0x10fc6b;
      db_compact_during_doc_delete();
LAB_0010fc6b:
      pfStack_4c28 = (fdb_kvs_handle *)0x10fc70;
      db_compact_during_doc_delete();
LAB_0010fc70:
      pfStack_4c28 = (fdb_kvs_handle *)0x10fc75;
      db_compact_during_doc_delete();
    }
    pfStack_4c28 = (fdb_kvs_handle *)0x10fc7a;
    db_compact_during_doc_delete();
LAB_0010fc7a:
    pfStack_4c28 = (fdb_kvs_handle *)0x10fc7f;
    db_compact_during_doc_delete();
  }
  else {
    ptr_fhandle = (fdb_kvs_handle *)&pfStack_4c10;
    pfStack_4c28 = (fdb_kvs_handle *)0x10fc41;
    fVar5 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test1",(fdb_config *)auStack_4b98);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010fc7a;
    pfStack_4c28 = (fdb_kvs_handle *)0x10fc51;
    ptr_fhandle = pfStack_4c10;
    fVar5 = fdb_compact((fdb_file_handle *)pfStack_4c10,(char *)0x0);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_4c28 = (fdb_kvs_handle *)0x10fc5f;
      fdb_close((fdb_file_handle *)pfStack_4c10);
      pfStack_4c28 = (fdb_kvs_handle *)0x10fc66;
      pthread_exit((void *)0x0);
    }
  }
  pfStack_4c28 = (fdb_kvs_handle *)compaction_daemon_test;
  db_compact_during_doc_delete();
  pcVar7 = (char *)0x0;
  pfStack_189e0 = (fdb_kvs_handle *)0x10fcab;
  pfStack_18998 = ptr_fhandle;
  pfStack_4c50 = pfVar11;
  pfStack_4c48 = pfVar16;
  pfStack_4c40 = pfVar17;
  pfStack_4c38 = pfVar25;
  ppfStack_4c30 = (fdb_doc **)_Var38._M_i;
  pfStack_4c28 = pfVar9;
  gettimeofday(&tStack_18830,(__timezone_ptr_t)0x0);
  pfStack_189e0 = (fdb_kvs_handle *)0x10fcb0;
  memleak_start();
  pfStack_189e0 = (fdb_kvs_handle *)0x10fcbc;
  system("rm -rf  compact_test* > errorlog.txt");
  pfVar11 = (fdb_kvs_handle *)auStack_18938;
  pfStack_189e0 = (fdb_kvs_handle *)0x10fccc;
  fdb_get_default_config();
  pfStack_189e0 = (fdb_kvs_handle *)0x10fcd6;
  fdb_get_default_kvs_config();
  auStack_18938._8_8_ = (kvs_ops_stat *)0x0;
  auStack_18938._16_8_ = (fdb_file_handle *)0x400;
  auStack_18938._36_4_ = 1;
  auStack_18938._46_2_ = 0x1e01;
  auStack_18938._56_8_ = (docio_handle *)0x1;
  auStack_18938._120_8_ = 0;
  pcVar27 = auStack_189c8;
  pfStack_189e0 = (fdb_kvs_handle *)0x10fd11;
  fVar5 = fdb_open((fdb_file_handle **)pcVar27,"compact_test",(fdb_config *)pfVar11);
  if (fVar5 == FDB_RESULT_INVALID_CONFIG) {
    auStack_18938._120_8_ = 4;
    pfStack_189e0 = (fdb_kvs_handle *)0x10fd3e;
    fdb_open((fdb_file_handle **)auStack_189c8,"compact_test",(fdb_config *)auStack_18938);
    pfVar11 = (fdb_kvs_handle *)(auStack_189c8 + 8);
    pfStack_189e0 = (fdb_kvs_handle *)0x10fd53;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_189c8._0_8_,(fdb_kvs_handle **)pfVar11,&fStack_18990);
    pfStack_189e0 = (fdb_kvs_handle *)0x10fd69;
    pcVar27 = (char *)auStack_189c8._8_8_;
    fVar5 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_189c8._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110810;
    pfStack_189e0 = (fdb_kvs_handle *)0x10fd7d;
    puts("Initialize..");
    pcVar7 = (char *)0x0;
    uVar19 = 0;
    do {
      pfStack_189e0 = (fdb_kvs_handle *)0x10fd9e;
      sprintf((char *)apfStack_187d8,"key%04d",uVar19 & 0xffffffff);
      pfStack_189e0 = (fdb_kvs_handle *)0x10fdba;
      sprintf(acStack_186d8,"meta%04d",uVar19 & 0xffffffff);
      pfStack_189e0 = (fdb_kvs_handle *)0x10fdd6;
      sprintf(acStack_185d8,"body%04d",uVar19 & 0xffffffff);
      pfVar9 = (fdb_kvs_handle *)(&afStack_184d8[0].kvs_config.create_if_missing + (long)pcVar7);
      pfStack_189e0 = (fdb_kvs_handle *)0x10fde9;
      sVar8 = strlen((char *)apfStack_187d8);
      _Var38._M_i = sVar8 + 1;
      pfStack_189e0 = (fdb_kvs_handle *)0x10fdf5;
      sVar8 = strlen(acStack_186d8);
      pfVar17 = (fdb_kvs_handle *)(sVar8 + 1);
      pfStack_189e0 = (fdb_kvs_handle *)0x10fe01;
      sVar8 = strlen(acStack_185d8);
      pfStack_189e0 = (fdb_kvs_handle *)0x10fe29;
      fdb_doc_create((fdb_doc **)pfVar9,apfStack_187d8,_Var38._M_i,acStack_186d8,(size_t)pfVar17,
                     acStack_185d8,sVar8 + 1);
      pfStack_189e0 = (fdb_kvs_handle *)0x10fe3b;
      fdb_set((fdb_kvs_handle *)auStack_189c8._8_8_,
              *(fdb_doc **)(&afStack_184d8[0].kvs_config.create_if_missing + uVar19 * 8));
      uVar19 = uVar19 + 1;
      pcVar7 = (char *)((long)pcVar7 + 8);
    } while (uVar19 != 10000);
    pfVar11 = (fdb_kvs_handle *)auStack_189c8;
    pfStack_189e0 = (fdb_kvs_handle *)0x10fe5e;
    fdb_commit((fdb_file_handle *)auStack_189c8._0_8_,'\0');
    pfStack_189e0 = (fdb_kvs_handle *)0x10fe66;
    fdb_close((fdb_file_handle *)auStack_189c8._0_8_);
    pfStack_189e0 = (fdb_kvs_handle *)0x10fe7d;
    pcVar27 = (char *)pfVar11;
    fVar5 = fdb_open((fdb_file_handle **)pfVar11,"compact_test",(fdb_config *)auStack_18938);
    pfVar16 = (fdb_kvs_handle *)0x2710;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110815;
    pfStack_189e0 = (fdb_kvs_handle *)0x10fe99;
    pcVar27 = (char *)auStack_189c8._0_8_;
    fVar5 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_189c8._0_8_,(fdb_kvs_handle **)(auStack_189c8 + 8)
                       ,&fStack_18990);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011081a;
    pfStack_189e0 = (fdb_kvs_handle *)0x10feb9;
    pcVar27 = (char *)auStack_189c8._8_8_;
    fVar5 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_189c8._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011081f;
    pfVar11 = (fdb_kvs_handle *)&_Stack_18820;
    pfStack_189e0 = (fdb_kvs_handle *)0x10fed6;
    fdb_get_file_info((fdb_file_handle *)auStack_189c8._0_8_,(fdb_file_info *)pfVar11);
    pfStack_189e0 = (fdb_kvs_handle *)0x10fee5;
    iVar6 = strcmp((char *)_Stack_18820._M_i,"compact_test");
    if (iVar6 != 0) {
      pfStack_189e0 = (fdb_kvs_handle *)0x10fef6;
      compaction_daemon_test();
    }
    pcVar7 = "key%04d";
    _Var38._M_i = (__int_type_conflict)apfStack_187d8;
    pfVar17 = (fdb_kvs_handle *)0x0;
    pfVar25 = pfVar9;
    do {
      pfStack_189e0 = (fdb_kvs_handle *)0x10ff18;
      sprintf((char *)_Var38._M_i,"key%04d",(ulong)pfVar17 & 0xffffffff);
      pfStack_189e0 = (fdb_kvs_handle *)0x10ff20;
      sVar8 = strlen((char *)_Var38._M_i);
      pfStack_189e0 = (fdb_kvs_handle *)0x10ff41;
      fdb_doc_create((fdb_doc **)&pfStack_189b0,(void *)_Var38._M_i,sVar8 + 1,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_189e0 = (fdb_kvs_handle *)0x10ff50;
      fVar5 = fdb_get((fdb_kvs_handle *)auStack_189c8._8_8_,(fdb_doc *)pfStack_189b0);
      pfVar9 = pfStack_189b0;
      if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_001107e6:
        pfStack_189e0 = (fdb_kvs_handle *)0x1107eb;
        compaction_daemon_test();
        goto LAB_001107eb;
      }
      pfVar11 = (fdb_kvs_handle *)(pfStack_189b0->field_6).seqtree;
      pfVar16 = *(fdb_kvs_handle **)
                 (*(long *)(&afStack_184d8[0].kvs_config.create_if_missing + (long)pfVar17 * 8) +
                 0x40);
      pfStack_189e0 = (fdb_kvs_handle *)0x10ff7c;
      iVar6 = bcmp(pfVar11,pfVar16,(size_t)(pfStack_189b0->kvs_config).custom_cmp_param);
      pfVar25 = pfVar9;
      if (iVar6 != 0) {
        pfStack_189e0 = (fdb_kvs_handle *)0x1107e6;
        compaction_daemon_test();
        goto LAB_001107e6;
      }
      pfStack_189e0 = (fdb_kvs_handle *)0x10ff8c;
      fdb_doc_free((fdb_doc *)pfVar9);
      pfVar17 = (fdb_kvs_handle *)&(pfVar17->kvs_config).field_0x1;
    } while (pfVar17 != (fdb_kvs_handle *)0x2710);
    pfStack_189e0 = (fdb_kvs_handle *)0x10ffb0;
    pcVar27 = (char *)auStack_189c8._8_8_;
    fVar5 = fdb_snapshot_open((fdb_kvs_handle *)auStack_189c8._8_8_,
                              (fdb_kvs_handle **)&pfStack_18970,10000);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110824;
    pfStack_189e0 = (fdb_kvs_handle *)0x10ffc2;
    fdb_kvs_close((fdb_kvs_handle *)pfStack_18970);
    pfVar11 = (fdb_kvs_handle *)auStack_189c8;
    pfStack_189e0 = (fdb_kvs_handle *)0x10ffcf;
    fdb_close((fdb_file_handle *)auStack_189c8._0_8_);
    pfStack_189e0 = (fdb_kvs_handle *)0x10ffdb;
    system("rm -rf  compact_test.meta > errorlog.txt");
    pfStack_189e0 = (fdb_kvs_handle *)0x10fff2;
    pcVar27 = (char *)pfVar11;
    fVar5 = fdb_open((fdb_file_handle **)pfVar11,"compact_test",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110829;
    pfStack_189e0 = (fdb_kvs_handle *)0x11000e;
    pcVar27 = (char *)auStack_189c8._0_8_;
    fVar5 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_189c8._0_8_,(fdb_kvs_handle **)(auStack_189c8 + 8)
                       ,&fStack_18990);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011082e;
    pfStack_189e0 = (fdb_kvs_handle *)0x11002e;
    pcVar27 = (char *)auStack_189c8._8_8_;
    fVar5 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_189c8._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110833;
    pcVar7 = "key%04d";
    _Var38._M_i = (__int_type_conflict)apfStack_187d8;
    pfVar17 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_189e0 = (fdb_kvs_handle *)0x110058;
      sprintf((char *)_Var38._M_i,"key%04d",(ulong)pfVar17 & 0xffffffff);
      pfStack_189e0 = (fdb_kvs_handle *)0x110060;
      sVar8 = strlen((char *)_Var38._M_i);
      pfStack_189e0 = (fdb_kvs_handle *)0x110081;
      fdb_doc_create((fdb_doc **)&pfStack_189b0,(void *)_Var38._M_i,sVar8 + 1,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_189e0 = (fdb_kvs_handle *)0x110090;
      fVar5 = fdb_get((fdb_kvs_handle *)auStack_189c8._8_8_,(fdb_doc *)pfStack_189b0);
      pfVar25 = pfStack_189b0;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001107f6;
      pfVar11 = (fdb_kvs_handle *)(pfStack_189b0->field_6).seqtree;
      pfVar16 = *(fdb_kvs_handle **)
                 (*(long *)(&afStack_184d8[0].kvs_config.create_if_missing + (long)pfVar17 * 8) +
                 0x40);
      pfStack_189e0 = (fdb_kvs_handle *)0x1100bc;
      iVar6 = bcmp(pfVar11,pfVar16,(size_t)(pfStack_189b0->kvs_config).custom_cmp_param);
      if (iVar6 != 0) goto LAB_001107eb;
      pfStack_189e0 = (fdb_kvs_handle *)0x1100cc;
      fdb_doc_free((fdb_doc *)pfVar25);
      pfVar17 = (fdb_kvs_handle *)&(pfVar17->kvs_config).field_0x1;
      pfVar9 = pfVar25;
    } while (pfVar17 != (fdb_kvs_handle *)0x2710);
    pfVar11 = (fdb_kvs_handle *)auStack_189c8;
    pfStack_189e0 = (fdb_kvs_handle *)0x1100e9;
    fdb_close((fdb_file_handle *)auStack_189c8._0_8_);
    pfStack_189e0 = (fdb_kvs_handle *)0x1100f5;
    system("mv  compact_test.0 compact_test.23 > errorlog.txt");
    pfStack_189e0 = (fdb_kvs_handle *)0x11010c;
    pcVar27 = (char *)pfVar11;
    fVar5 = fdb_open((fdb_file_handle **)pfVar11,"compact_test",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110838;
    pfStack_189e0 = (fdb_kvs_handle *)0x110128;
    pcVar27 = (char *)auStack_189c8._0_8_;
    fVar5 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_189c8._0_8_,(fdb_kvs_handle **)(auStack_189c8 + 8)
                       ,&fStack_18990);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011083d;
    pfStack_189e0 = (fdb_kvs_handle *)0x110148;
    pcVar27 = (char *)auStack_189c8._8_8_;
    fVar5 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_189c8._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110842;
    pcVar7 = "key%04d";
    _Var38._M_i = (__int_type_conflict)apfStack_187d8;
    pfVar17 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_189e0 = (fdb_kvs_handle *)0x110172;
      sprintf((char *)_Var38._M_i,"key%04d",(ulong)pfVar17 & 0xffffffff);
      pfStack_189e0 = (fdb_kvs_handle *)0x11017a;
      sVar8 = strlen((char *)_Var38._M_i);
      pfStack_189e0 = (fdb_kvs_handle *)0x11019b;
      fdb_doc_create((fdb_doc **)&pfStack_189b0,(void *)_Var38._M_i,sVar8 + 1,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_189e0 = (fdb_kvs_handle *)0x1101aa;
      pcVar27 = (char *)auStack_189c8._8_8_;
      fVar5 = fdb_get((fdb_kvs_handle *)auStack_189c8._8_8_,(fdb_doc *)pfStack_189b0);
      pfVar25 = pfStack_189b0;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110806;
      pfVar11 = (fdb_kvs_handle *)(pfStack_189b0->field_6).seqtree;
      pfVar16 = *(fdb_kvs_handle **)
                 (*(long *)(&afStack_184d8[0].kvs_config.create_if_missing + (long)pfVar17 * 8) +
                 0x40);
      pfStack_189e0 = (fdb_kvs_handle *)0x1101d6;
      iVar6 = bcmp(pfVar11,pfVar16,(size_t)(pfStack_189b0->kvs_config).custom_cmp_param);
      if (iVar6 != 0) goto LAB_001107fb;
      pfStack_189e0 = (fdb_kvs_handle *)0x1101e6;
      fdb_doc_free((fdb_doc *)pfVar25);
      pfVar17 = (fdb_kvs_handle *)&(pfVar17->kvs_config).field_0x1;
      pfVar9 = pfVar25;
    } while (pfVar17 != (fdb_kvs_handle *)0x2710);
    pfStack_189e0 = (fdb_kvs_handle *)0x110200;
    fdb_close((fdb_file_handle *)auStack_189c8._0_8_);
    pcVar27 = (char *)&pfStack_189a0;
    pfStack_189e0 = (fdb_kvs_handle *)0x110219;
    fVar5 = fdb_open((fdb_file_handle **)pcVar27,"compact_test_less",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110847;
    pfStack_189e0 = (fdb_kvs_handle *)0x110238;
    pcVar27 = (char *)pfStack_189a0;
    fVar5 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_189a0,(fdb_kvs_handle **)&pfStack_18958,
                       &fStack_18990);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011084c;
    auStack_18938._46_2_ = auStack_18938._46_2_ & 0xff;
    pcVar27 = (char *)&pfStack_189a8;
    pfStack_189e0 = (fdb_kvs_handle *)0x11025d;
    fVar5 = fdb_open((fdb_file_handle **)pcVar27,"compact_test_non",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110851;
    pfStack_189e0 = (fdb_kvs_handle *)0x110279;
    pcVar27 = (char *)pfStack_189a8;
    fVar5 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_189a8,(fdb_kvs_handle **)&aStack_18960.seqtree,
                       &fStack_18990);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110856;
    auStack_18938._46_2_ = auStack_18938._46_2_ & 0xff00;
    pcVar27 = (char *)&pfStack_189b8;
    pfStack_189e0 = (fdb_kvs_handle *)0x11029e;
    fVar5 = fdb_open((fdb_file_handle **)pcVar27,"compact_test_manual",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011085b;
    pfStack_189e0 = (fdb_kvs_handle *)0x1102ba;
    pcVar27 = (char *)pfStack_189b8;
    fVar5 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_189b8,(fdb_kvs_handle **)&aStack_18968.seqtree,
                       &fStack_18990);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110860;
    auStack_18938._46_2_ = 0x1e01;
    pcVar27 = auStack_189c8;
    pfStack_189e0 = (fdb_kvs_handle *)0x1102e1;
    fVar5 = fdb_open((fdb_file_handle **)pcVar27,"compact_test",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110865;
    pfStack_189e0 = (fdb_kvs_handle *)0x1102fd;
    pcVar27 = (char *)auStack_189c8._0_8_;
    fVar5 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_189c8._0_8_,(fdb_kvs_handle **)(auStack_189c8 + 8)
                       ,&fStack_18990);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011086a;
    pfStack_189e0 = (fdb_kvs_handle *)0x11031d;
    pcVar27 = (char *)auStack_189c8._8_8_;
    fVar5 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_189c8._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011086f;
    pcVar7 = (char *)0x0;
    pfStack_189e0 = (fdb_kvs_handle *)0x11033a;
    printf("wait for %d seconds..\n");
    pfStack_189e0 = (fdb_kvs_handle *)0x11034c;
    gettimeofday((timeval *)(auStack_18938 + 0xf8),(__timezone_ptr_t)0x0);
    tVar40.tv_usec = _Stack_18838._M_i;
    tVar40.tv_sec = auStack_18938._248_8_;
    do {
      pfVar25 = (fdb_kvs_handle *)0xfffffffffffec780;
      pfVar17 = (fdb_kvs_handle *)0x0;
      iVar6 = 0;
      aStack_18978 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar7;
      do {
        pfStack_189e0 = (fdb_kvs_handle *)0x110388;
        fdb_set((fdb_kvs_handle *)auStack_189c8._8_8_,*(fdb_doc **)(acStack_4c58 + (long)pfVar25));
        pfStack_189e0 = (fdb_kvs_handle *)0x110394;
        fdb_commit((fdb_file_handle *)auStack_189c8._0_8_,'\0');
        uVar24 = (int)((ulong)pfVar17 / 100) * 100 + iVar6;
        pfVar16 = (fdb_kvs_handle *)(ulong)uVar24;
        if (uVar24 == 0) {
          pfStack_189e0 = (fdb_kvs_handle *)0x1103ae;
          fdb_set((fdb_kvs_handle *)pfStack_18958,*(fdb_doc **)(acStack_4c58 + (long)pfVar25));
          pfStack_189e0 = (fdb_kvs_handle *)0x1103ba;
          fdb_commit((fdb_file_handle *)pfStack_189a0,'\0');
        }
        pfStack_189e0 = (fdb_kvs_handle *)0x1103cc;
        fdb_set((fdb_kvs_handle *)aStack_18960.seqtree,*(fdb_doc **)(acStack_4c58 + (long)pfVar25));
        pfStack_189e0 = (fdb_kvs_handle *)0x1103d8;
        fdb_commit((fdb_file_handle *)pfStack_189a8,'\0');
        pfStack_189e0 = (fdb_kvs_handle *)0x1103ea;
        fdb_set((fdb_kvs_handle *)aStack_18968.seqtree,*(fdb_doc **)(acStack_4c58 + (long)pfVar25));
        pfStack_189e0 = (fdb_kvs_handle *)0x1103f6;
        fdb_commit((fdb_file_handle *)pfStack_189b8,'\0');
        pfStack_189e0 = (fdb_kvs_handle *)0x110405;
        gettimeofday((timeval *)&tStack_18948,(__timezone_ptr_t)0x0);
        pfStack_189e0 = (fdb_kvs_handle *)0x110420;
        tVar39 = _utime_gap(tVar40,tStack_18948);
        if (pfStack_18998 <= (fdb_kvs_handle *)tVar39.tv_sec) {
          pcVar7 = (char *)(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
          break;
        }
        iVar6 = iVar6 + -1;
        pfVar17 = (fdb_kvs_handle *)(ulong)((int)pfVar17 + 1);
        pfVar25 = (fdb_kvs_handle *)&(pfVar25->kvs_config).custom_cmp;
        pcVar7 = (char *)aStack_18978;
      } while (pfVar25 != (fdb_kvs_handle *)0x0);
    } while ((int)pcVar7 == 0);
    pfStack_189e0 = (fdb_kvs_handle *)0x110459;
    pcVar27 = (char *)auStack_189c8._0_8_;
    fVar5 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_189c8._0_8_,0x3c);
    pfVar11 = (fdb_kvs_handle *)auStack_18938._248_8_;
    _Var38._M_i = _Stack_18838._M_i;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110874;
    pfStack_189e0 = (fdb_kvs_handle *)0x110470;
    pcVar27 = (char *)auStack_189c8._0_8_;
    fVar5 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_189c8._0_8_,1);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110879;
    pfStack_189e0 = (fdb_kvs_handle *)0x110484;
    pcVar27 = (char *)pfStack_189a8;
    fVar5 = fdb_compact((fdb_file_handle *)pfStack_189a8,(char *)0x0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011087e;
    pfStack_189e0 = (fdb_kvs_handle *)0x11049d;
    pcVar27 = (char *)pfStack_189b8;
    fVar5 = fdb_compact((fdb_file_handle *)pfStack_189b8,"compact_test_manual_compacted");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110883;
    auStack_18938._46_2_ = auStack_18938._46_2_ & 0xff00;
    pcVar27 = (char *)&pfStack_18950;
    pfStack_189e0 = (fdb_kvs_handle *)0x1104c5;
    fVar5 = fdb_open((fdb_file_handle **)pcVar27,"compact_test_manual_compacted",
                     (fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110888;
    pfStack_189e0 = (fdb_kvs_handle *)0x1104e1;
    pcVar27 = (char *)pfStack_189b8;
    fVar5 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_189b8,'\x01',0x1e);
    if (fVar5 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011088d;
    pfStack_189e0 = (fdb_kvs_handle *)0x1104f7;
    fVar5 = fdb_close((fdb_file_handle *)pfStack_18950);
    pcVar27 = (char *)pfStack_18950;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110892;
    pfStack_189e0 = (fdb_kvs_handle *)0x110513;
    pcVar27 = (char *)pfStack_189b8;
    fVar5 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_189b8,'\x01',10);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110897;
    pfStack_189e0 = (fdb_kvs_handle *)0x11052f;
    pcVar27 = (char *)pfStack_189b8;
    fVar5 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_189b8,'\x01',0x1e);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011089c;
    pfStack_189e0 = (fdb_kvs_handle *)0x110541;
    pcVar27 = (char *)pfStack_189b8;
    fVar5 = fdb_close((fdb_file_handle *)pfStack_189b8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001108a1;
    auStack_18938[0x2e] = 1;
    pcVar27 = (char *)&pfStack_189b8;
    pfStack_189e0 = (fdb_kvs_handle *)0x110566;
    fVar5 = fdb_open((fdb_file_handle **)pcVar27,"compact_test_manual_compacted",
                     (fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001108a6;
    pfStack_189e0 = (fdb_kvs_handle *)0x11057c;
    pcVar27 = (char *)pfStack_189a8;
    fVar5 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_189a8,'\0',0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001108ab;
    pfStack_189e0 = (fdb_kvs_handle *)0x11058e;
    pcVar27 = (char *)pfStack_189a8;
    fVar5 = fdb_close((fdb_file_handle *)pfStack_189a8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001108b0;
    auStack_18938._46_2_ = auStack_18938._46_2_ & 0xff00;
    pcVar27 = (char *)&pfStack_189a8;
    pfStack_189e0 = (fdb_kvs_handle *)0x1105b3;
    fVar5 = fdb_open((fdb_file_handle **)pcVar27,"compact_test_non",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001108b5;
    pcVar7 = "compact_test_non.manual";
    pfStack_189e0 = (fdb_kvs_handle *)0x1105cf;
    fdb_compact((fdb_file_handle *)pfStack_189a8,"compact_test_non.manual");
    pfVar11 = (fdb_kvs_handle *)auStack_189c8;
    pfStack_189e0 = (fdb_kvs_handle *)0x1105dc;
    fdb_close((fdb_file_handle *)auStack_189c8._0_8_);
    pfStack_189e0 = (fdb_kvs_handle *)0x1105e6;
    fdb_close((fdb_file_handle *)pfStack_189a0);
    pfStack_189e0 = (fdb_kvs_handle *)0x1105f0;
    fdb_close((fdb_file_handle *)pfStack_189b8);
    auStack_18938[0x2e] = 1;
    pfStack_189e0 = (fdb_kvs_handle *)0x110607;
    pcVar27 = (char *)pfVar11;
    fVar5 = fdb_open((fdb_file_handle **)pfVar11,"compact_test_non.manual",
                     (fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108ba;
    pcVar27 = "compact_test_non.manual";
    pfStack_189e0 = (fdb_kvs_handle *)0x110624;
    fVar5 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108bf;
    auStack_18938._46_2_ = auStack_18938._46_2_ & 0xff00;
    pcVar27 = auStack_189c8;
    pfStack_189e0 = (fdb_kvs_handle *)0x11064a;
    fVar5 = fdb_open((fdb_file_handle **)pcVar27,"compact_test_manual_compacted",
                     (fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108c4;
    pcVar27 = "compact_test_manual_compacted";
    pfStack_189e0 = (fdb_kvs_handle *)0x110667;
    fVar5 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108c9;
    auStack_18938[0x2e] = 1;
    pcVar27 = "compact_test_manual_compacted";
    pfStack_189e0 = (fdb_kvs_handle *)0x110688;
    fVar5 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001108ce;
    auStack_18938._46_2_ = auStack_18938._46_2_ & 0xff00;
    pcVar27 = "compact_test_non.manual";
    pfStack_189e0 = (fdb_kvs_handle *)0x1106a8;
    fVar5 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_FILE_IS_BUSY) goto LAB_001108d3;
    pfStack_189e0 = (fdb_kvs_handle *)0x1106bb;
    fdb_close((fdb_file_handle *)pfStack_189a8);
    pfStack_189e0 = (fdb_kvs_handle *)0x1106c0;
    fVar5 = fdb_shutdown();
    pcVar27 = (char *)pfStack_189a8;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001108d8;
    pcVar27 = "compact_test_non.manual";
    pfStack_189e0 = (fdb_kvs_handle *)0x1106dc;
    fVar5 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001108dd;
    auStack_18938._36_4_ = 2;
    pcVar27 = auStack_189c8;
    pfStack_189e0 = (fdb_kvs_handle *)0x110704;
    fVar5 = fdb_open((fdb_file_handle **)pcVar27,"./compact_test_manual_compacted",
                     (fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108e2;
    pcVar27 = auStack_189c8;
    pfStack_189e0 = (fdb_kvs_handle *)0x110726;
    fVar5 = fdb_open((fdb_file_handle **)pcVar27,"./compact_test_manual_compacted.meta",
                     (fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108e7;
    pcVar27 = auStack_189c8;
    pfStack_189e0 = (fdb_kvs_handle *)0x110748;
    fVar5 = fdb_open((fdb_file_handle **)pcVar27,"compact_test_non",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108ec;
    pcVar27 = auStack_189c8;
    pfStack_189e0 = (fdb_kvs_handle *)0x11076a;
    fVar5 = fdb_open((fdb_file_handle **)pcVar27,"compact_test_non.manual",
                     (fdb_config *)auStack_18938);
    if (fVar5 == FDB_RESULT_NO_SUCH_FILE) {
      lVar32 = 0;
      do {
        pfStack_189e0 = (fdb_kvs_handle *)0x110782;
        fdb_doc_free(*(fdb_doc **)(&afStack_184d8[0].kvs_config.create_if_missing + lVar32 * 8));
        lVar32 = lVar32 + 1;
      } while (lVar32 != 10000);
      pfStack_189e0 = (fdb_kvs_handle *)0x110793;
      fdb_shutdown();
      pfStack_189e0 = (fdb_kvs_handle *)0x110798;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (compaction_daemon_test(unsigned_long)::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      pfStack_189e0 = (fdb_kvs_handle *)0x1107c9;
      fprintf(_stderr,pcVar27,"compaction daemon test");
      return;
    }
  }
  else {
LAB_0011080b:
    pfStack_189e0 = (fdb_kvs_handle *)0x110810;
    compaction_daemon_test();
LAB_00110810:
    pfStack_189e0 = (fdb_kvs_handle *)0x110815;
    compaction_daemon_test();
LAB_00110815:
    pfStack_189e0 = (fdb_kvs_handle *)0x11081a;
    compaction_daemon_test();
LAB_0011081a:
    pfStack_189e0 = (fdb_kvs_handle *)0x11081f;
    compaction_daemon_test();
LAB_0011081f:
    pfStack_189e0 = (fdb_kvs_handle *)0x110824;
    compaction_daemon_test();
LAB_00110824:
    pfStack_189e0 = (fdb_kvs_handle *)0x110829;
    compaction_daemon_test();
LAB_00110829:
    pfStack_189e0 = (fdb_kvs_handle *)0x11082e;
    compaction_daemon_test();
LAB_0011082e:
    pfStack_189e0 = (fdb_kvs_handle *)0x110833;
    compaction_daemon_test();
    pfVar25 = pfVar9;
LAB_00110833:
    pfStack_189e0 = (fdb_kvs_handle *)0x110838;
    compaction_daemon_test();
LAB_00110838:
    pfStack_189e0 = (fdb_kvs_handle *)0x11083d;
    compaction_daemon_test();
LAB_0011083d:
    pfStack_189e0 = (fdb_kvs_handle *)0x110842;
    compaction_daemon_test();
LAB_00110842:
    pfStack_189e0 = (fdb_kvs_handle *)0x110847;
    compaction_daemon_test();
LAB_00110847:
    pfStack_189e0 = (fdb_kvs_handle *)0x11084c;
    compaction_daemon_test();
LAB_0011084c:
    pfStack_189e0 = (fdb_kvs_handle *)0x110851;
    compaction_daemon_test();
LAB_00110851:
    pfStack_189e0 = (fdb_kvs_handle *)0x110856;
    compaction_daemon_test();
LAB_00110856:
    pfStack_189e0 = (fdb_kvs_handle *)0x11085b;
    compaction_daemon_test();
LAB_0011085b:
    pfStack_189e0 = (fdb_kvs_handle *)0x110860;
    compaction_daemon_test();
LAB_00110860:
    pfStack_189e0 = (fdb_kvs_handle *)0x110865;
    compaction_daemon_test();
LAB_00110865:
    pfStack_189e0 = (fdb_kvs_handle *)0x11086a;
    compaction_daemon_test();
LAB_0011086a:
    pfStack_189e0 = (fdb_kvs_handle *)0x11086f;
    compaction_daemon_test();
LAB_0011086f:
    pfStack_189e0 = (fdb_kvs_handle *)0x110874;
    compaction_daemon_test();
LAB_00110874:
    pfStack_189e0 = (fdb_kvs_handle *)0x110879;
    compaction_daemon_test();
LAB_00110879:
    pfStack_189e0 = (fdb_kvs_handle *)0x11087e;
    compaction_daemon_test();
LAB_0011087e:
    pfStack_189e0 = (fdb_kvs_handle *)0x110883;
    compaction_daemon_test();
LAB_00110883:
    pfStack_189e0 = (fdb_kvs_handle *)0x110888;
    compaction_daemon_test();
LAB_00110888:
    pfStack_189e0 = (fdb_kvs_handle *)0x11088d;
    compaction_daemon_test();
LAB_0011088d:
    pfStack_189e0 = (fdb_kvs_handle *)0x110892;
    compaction_daemon_test();
LAB_00110892:
    pfStack_189e0 = (fdb_kvs_handle *)0x110897;
    compaction_daemon_test();
LAB_00110897:
    pfStack_189e0 = (fdb_kvs_handle *)0x11089c;
    compaction_daemon_test();
LAB_0011089c:
    pfStack_189e0 = (fdb_kvs_handle *)0x1108a1;
    compaction_daemon_test();
LAB_001108a1:
    pfStack_189e0 = (fdb_kvs_handle *)0x1108a6;
    compaction_daemon_test();
LAB_001108a6:
    pfStack_189e0 = (fdb_kvs_handle *)0x1108ab;
    compaction_daemon_test();
LAB_001108ab:
    pfStack_189e0 = (fdb_kvs_handle *)0x1108b0;
    compaction_daemon_test();
LAB_001108b0:
    pfStack_189e0 = (fdb_kvs_handle *)0x1108b5;
    compaction_daemon_test();
LAB_001108b5:
    pfStack_189e0 = (fdb_kvs_handle *)0x1108ba;
    compaction_daemon_test();
LAB_001108ba:
    pfStack_189e0 = (fdb_kvs_handle *)0x1108bf;
    compaction_daemon_test();
LAB_001108bf:
    pfStack_189e0 = (fdb_kvs_handle *)0x1108c4;
    compaction_daemon_test();
LAB_001108c4:
    pfStack_189e0 = (fdb_kvs_handle *)0x1108c9;
    compaction_daemon_test();
LAB_001108c9:
    pfStack_189e0 = (fdb_kvs_handle *)0x1108ce;
    compaction_daemon_test();
LAB_001108ce:
    pfStack_189e0 = (fdb_kvs_handle *)0x1108d3;
    compaction_daemon_test();
LAB_001108d3:
    pfStack_189e0 = (fdb_kvs_handle *)0x1108d8;
    compaction_daemon_test();
LAB_001108d8:
    pfStack_189e0 = (fdb_kvs_handle *)0x1108dd;
    compaction_daemon_test();
LAB_001108dd:
    pfStack_189e0 = (fdb_kvs_handle *)0x1108e2;
    compaction_daemon_test();
LAB_001108e2:
    pfStack_189e0 = (fdb_kvs_handle *)0x1108e7;
    compaction_daemon_test();
LAB_001108e7:
    pfStack_189e0 = (fdb_kvs_handle *)0x1108ec;
    compaction_daemon_test();
LAB_001108ec:
    pfStack_189e0 = (fdb_kvs_handle *)0x1108f1;
    compaction_daemon_test();
  }
  pfStack_189e0 = (fdb_kvs_handle *)auto_compaction_with_concurrent_insert_test;
  compaction_daemon_test();
  pfStack_18b78 = (fdb_kvs_handle *)0x110916;
  aStack_18a08 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar7;
  pfStack_18a00 = pfVar16;
  pfStack_189f8 = pfVar17;
  pfStack_189f0 = pfVar11;
  ppfStack_189e8 = (fdb_doc **)_Var38._M_i;
  pfStack_189e0 = pfVar25;
  gettimeofday(&tStack_18b28,(__timezone_ptr_t)0x0);
  pfStack_18b78 = (fdb_kvs_handle *)0x11091b;
  memleak_start();
  pfStack_18b78 = (fdb_kvs_handle *)0x110927;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_18b78 = (fdb_kvs_handle *)0x110934;
  fdb_get_default_config();
  uStack_18ad2 = 1;
  uStack_18ac8._0_2_ = 1;
  uStack_18ac8._2_2_ = 0;
  uStack_18ac8._4_4_ = 0;
  pfStack_18b78 = (fdb_kvs_handle *)0x110955;
  fVar5 = fdb_open(&pfStack_18b68,"compact_test",(fdb_config *)(auStack_18b18 + 0x18));
  pfVar34 = (fdb_config *)(auStack_18b18 + 0x18);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfVar34 = (fdb_config *)auStack_18b18;
    pfStack_18b78 = (fdb_kvs_handle *)0x11096a;
    fdb_get_default_kvs_config();
    pfStack_18b78 = (fdb_kvs_handle *)0x11097c;
    fVar5 = fdb_kvs_open_default(pfStack_18b68,&pfStack_18b60,(fdb_kvs_config *)pfVar34);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110aad;
    pfStack_18b78 = (fdb_kvs_handle *)0x110993;
    gettimeofday(&tStack_18b38,(__timezone_ptr_t)0x0);
    pfStack_18b78 = (fdb_kvs_handle *)0x1109a3;
    printf("wait for %d seconds..\n",(ulong)pcVar27 & 0xffffffff);
    tVar39.tv_usec = tStack_18b38.tv_usec;
    tVar39.tv_sec = tStack_18b38.tv_sec;
    pfVar17 = (fdb_kvs_handle *)((long)&atStack_18b58[1].tv_sec + 1);
    pfVar25 = (fdb_kvs_handle *)0x0;
    do {
      iVar6 = (int)pfVar25;
      pfStack_18b78 = (fdb_kvs_handle *)0x1109c4;
      sprintf((char *)pfVar17,"%d",pfVar25);
      pfVar16 = pfStack_18b60;
      pfStack_18b78 = (fdb_kvs_handle *)0x1109d1;
      sVar8 = strlen((char *)pfVar17);
      pfStack_18b78 = (fdb_kvs_handle *)0x1109ec;
      fVar5 = fdb_set_kv(pfVar16,pfVar17,sVar8,"value",5);
      pfVar34 = (fdb_config *)tStack_18b38.tv_sec;
      _Var38._M_i = tStack_18b38.tv_usec;
      if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_00110aa3:
        pfStack_18b78 = (fdb_kvs_handle *)0x110aa8;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110aa8;
      }
      pfStack_18b78 = (fdb_kvs_handle *)0x110a00;
      fVar5 = fdb_commit(pfStack_18b68,'\0');
      if (fVar5 != FDB_RESULT_SUCCESS) {
        pfStack_18b78 = (fdb_kvs_handle *)0x110aa3;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110aa3;
      }
      pfStack_18b78 = (fdb_kvs_handle *)0x110a14;
      gettimeofday((timeval *)atStack_18b58,(__timezone_ptr_t)0x0);
      pfStack_18b78 = (fdb_kvs_handle *)0x110a29;
      tVar40 = _utime_gap(tVar39,atStack_18b58[0]);
    } while (((fdb_kvs_handle *)tVar40.tv_sec < pcVar27) &&
            (pfVar25 = (fdb_kvs_handle *)(ulong)(iVar6 + 1), iVar6 != 99999));
    pfStack_18b78 = (fdb_kvs_handle *)0x110a49;
    fVar5 = fdb_close(pfStack_18b68);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110ab2;
    pfStack_18b78 = (fdb_kvs_handle *)0x110a52;
    fVar5 = fdb_shutdown();
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_18b78 = (fdb_kvs_handle *)0x110a5b;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (auto_compaction_with_concurrent_insert_test(unsigned_long)::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      pfStack_18b78 = (fdb_kvs_handle *)0x110a8c;
      fprintf(_stderr,pcVar27,"auto compaction with concurrent insert test");
      return;
    }
  }
  else {
LAB_00110aa8:
    pfStack_18b78 = (fdb_kvs_handle *)0x110aad;
    auto_compaction_with_concurrent_insert_test();
LAB_00110aad:
    pfStack_18b78 = (fdb_kvs_handle *)0x110ab2;
    auto_compaction_with_concurrent_insert_test();
LAB_00110ab2:
    pfStack_18b78 = (fdb_kvs_handle *)0x110ab7;
    auto_compaction_with_concurrent_insert_test();
  }
  pfStack_18b78 = (fdb_kvs_handle *)auto_compaction_with_custom_cmp_function;
  auto_compaction_with_concurrent_insert_test();
  pfStack_18ba0 = (fdb_kvs_handle *)pcVar27;
  pfStack_18b98 = pfVar16;
  pfStack_18b90 = pfVar17;
  pfStack_18b88 = pfVar34;
  ppfStack_18b80 = (fdb_doc **)_Var38._M_i;
  pfStack_18b78 = pfVar25;
  gettimeofday(&tStack_18ea8,(__timezone_ptr_t)0x0);
  memleak_start();
  auStack_18f18._32_8_ = (btree *)0x0;
  auStack_18f18._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_18c98.wal_threshold = 0x1000;
  fStack_18c98.compaction_mode = '\x01';
  fStack_18c98.compaction_threshold = '\n';
  fStack_18c98.compactor_sleep_duration = 1;
  info_00 = (fdb_file_info *)0x14e0c5;
  pfVar9 = (fdb_kvs_handle *)&pfStack_18f38;
  kvs_config_00 = (fdb_file_info *)0x1;
  fVar5 = fdb_open_custom_cmp((fdb_file_handle **)pfVar9,"compact_test",&fStack_18c98,1,
                              (char **)(auStack_18f18 + 0x20),
                              (fdb_custom_cmp_variable *)(auStack_18f18 + 0x18),(void **)0x0);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    fdb_get_default_kvs_config();
    auStack_18f18._16_8_ = afStack_18e98[0].doc_count;
    auStack_18f18._0_8_ = afStack_18e98[0].filename;
    auStack_18f18._8_8_ = afStack_18e98[0].new_filename;
    info_00 = (fdb_file_info *)auStack_18f30;
    pfVar9 = pfStack_18f38;
    fVar5 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_18f38,(fdb_kvs_handle **)info_00,
                       (fdb_kvs_config *)auStack_18f18);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110eb4;
    info_00 = (fdb_file_info *)auStack_18f20;
    kvs_config_00 = (fdb_file_info *)auStack_18f18;
    pfVar9 = pfStack_18f38;
    fVar5 = fdb_kvs_open((fdb_file_handle *)pfStack_18f38,(fdb_kvs_handle **)info_00,"db",
                         (fdb_kvs_config *)kvs_config_00);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110eb9;
    uVar19 = 0;
    do {
      sprintf((char *)afStack_18e98,"key%06d",uVar19);
      sprintf((char *)afStack_18d98,"body%06d",uVar19);
      pfVar9 = (fdb_kvs_handle *)auStack_18f30._0_8_;
      sVar8 = strlen((char *)afStack_18e98);
      sVar12 = strlen((char *)afStack_18d98);
      kvs_config_00 = afStack_18d98;
      info_00 = afStack_18e98;
      fVar5 = fdb_set_kv(pfVar9,afStack_18e98,sVar8,afStack_18d98,sVar12);
      handle = auStack_18f20;
      if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_00110e9b:
        auto_compaction_with_custom_cmp_function();
        goto LAB_00110ea0;
      }
      sVar8 = strlen((char *)afStack_18e98);
      sVar12 = strlen((char *)afStack_18d98);
      kvs_config_00 = afStack_18d98;
      info_00 = afStack_18e98;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)handle,afStack_18e98,sVar8,afStack_18d98,sVar12);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        auto_compaction_with_custom_cmp_function();
        pfVar9 = (fdb_kvs_handle *)handle;
        goto LAB_00110e9b;
      }
      uVar24 = (int)uVar19 + 1;
      uVar19 = (ulong)uVar24;
    } while (uVar24 != 10000);
    kvs_config_00 = (fdb_file_info *)auStack_18f18;
    auStack_18f18._8_8_ = _compact_test_keycmp;
    info_00 = (fdb_file_info *)(auStack_18f30 + 8);
    pfVar9 = pfStack_18f38;
    fVar5 = fdb_kvs_open((fdb_file_handle *)pfStack_18f38,(fdb_kvs_handle **)info_00,"db_custom",
                         (fdb_kvs_config *)kvs_config_00);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110ebe;
    info_00 = afStack_18e98;
    sprintf((char *)info_00,"key%06d",0);
    kvs_config_00 = afStack_18d98;
    sprintf((char *)kvs_config_00,"body%06d",0);
    sVar8 = strlen((char *)info_00);
    sVar12 = strlen((char *)kvs_config_00);
    fVar5 = fdb_set_kv((fdb_kvs_handle *)auStack_18f30._8_8_,info_00,sVar8,kvs_config_00,sVar12);
    pfVar9 = (fdb_kvs_handle *)auStack_18f30._8_8_;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110ec3;
    info_00 = (fdb_file_info *)0x0;
    pfVar9 = pfStack_18f38;
    fVar5 = fdb_commit((fdb_file_handle *)pfStack_18f38,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110ec8;
    uVar19 = 0;
    uVar35 = 0;
    do {
      sprintf((char *)afStack_18e98,"key%06d",uVar35);
      sprintf((char *)afStack_18d98,"body%06d",uVar35);
      pfVar9 = (fdb_kvs_handle *)auStack_18f30._0_8_;
      sVar8 = strlen((char *)afStack_18e98);
      sVar12 = strlen((char *)afStack_18d98);
      kvs_config_00 = afStack_18d98;
      info_00 = afStack_18e98;
      fVar5 = fdb_set_kv(pfVar9,afStack_18e98,sVar8,afStack_18d98,sVar12);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110ea5;
      info_00 = (fdb_file_info *)(auStack_18f18 + 0x28);
      pfVar9 = pfStack_18f38;
      fVar5 = fdb_get_file_info((fdb_file_handle *)pfStack_18f38,info_00);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110ea0;
      if (uVar19 < uStack_18ec8) {
        uVar19 = uStack_18ec8;
      }
      uVar24 = (int)uVar35 + 1;
      uVar35 = (ulong)uVar24;
    } while (uVar24 != 10000);
    info_00 = (fdb_file_info *)0x0;
    pfVar9 = pfStack_18f38;
    fVar5 = fdb_commit((fdb_file_handle *)pfStack_18f38,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110ecd;
    info_00 = (fdb_file_info *)(auStack_18f18 + 0x28);
    pfVar9 = pfStack_18f38;
    fVar5 = fdb_get_file_info((fdb_file_handle *)pfStack_18f38,info_00);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110ed2;
    if (uVar19 < uStack_18ec8) {
      uVar19 = uStack_18ec8;
    }
    printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar19);
    do {
      sleep(1);
      info_00 = (fdb_file_info *)(auStack_18f18 + 0x28);
      pfVar9 = pfStack_18f38;
      fVar5 = fdb_get_file_info((fdb_file_handle *)pfStack_18f38,
                                (fdb_file_info *)(auStack_18f18 + 0x28));
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110eaa;
    } while (uVar19 <= uStack_18ec8);
    fVar5 = fdb_close((fdb_file_handle *)pfStack_18f38);
    pfVar9 = pfStack_18f38;
    if (fVar5 == FDB_RESULT_SUCCESS) {
      fVar5 = fdb_shutdown();
      pfVar9 = pfStack_18f38;
      if (fVar5 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar27 = "%s PASSED\n";
        if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
          pcVar27 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar27,"auto compaction with custom comparison function");
        return;
      }
      goto LAB_00110edc;
    }
  }
  else {
LAB_00110eaf:
    auto_compaction_with_custom_cmp_function();
LAB_00110eb4:
    auto_compaction_with_custom_cmp_function();
LAB_00110eb9:
    auto_compaction_with_custom_cmp_function();
LAB_00110ebe:
    auto_compaction_with_custom_cmp_function();
LAB_00110ec3:
    auto_compaction_with_custom_cmp_function();
LAB_00110ec8:
    auto_compaction_with_custom_cmp_function();
LAB_00110ecd:
    auto_compaction_with_custom_cmp_function();
LAB_00110ed2:
    auto_compaction_with_custom_cmp_function();
  }
  auto_compaction_with_custom_cmp_function();
LAB_00110edc:
  auto_compaction_with_custom_cmp_function();
  if (info_00 != kvs_config_00) {
    if (info_00 < kvs_config_00) {
      kvs_config_00 = info_00;
    }
    memcmp(pfVar9,__s2,(size_t)kvs_config_00);
    return;
  }
  memcmp(pfVar9,__s2,(size_t)info_00);
  return;
}

Assistant:

void compaction_callback_test(bool multi_kv)
{
    TEST_INIT();
    memleak_start();

    int i, r;
    int n = 1000;
    char keybuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status s;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    struct cb_args cb_args;

    memset(&cb_args, 0x0, sizeof(struct cb_args));
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_cb = compaction_cb;
    fconfig.compaction_cb_ctx = &cb_args;
    fconfig.compaction_cb_mask = FDB_CS_BEGIN |
                                 FDB_CS_MOVE_DOC |
                                 FDB_CS_FLUSH_WAL |
                                 FDB_CS_END;
    fconfig.multi_kv_instances = multi_kv;

    // remove all previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    if (multi_kv) {
        fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    } else {
        fdb_kvs_open_default(dbfile, &db, &kvs_config);
    }
    cb_args.handle = db;

    // write docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%04d", i);
        sprintf(bodybuf, "body%04d", i);
        s = fdb_set_kv(db, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_compact(dbfile, "./compact_test2");
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    TEST_CHK(cb_args.n_moved_docs == n);
    TEST_CHK(cb_args.begin);
    TEST_CHK(cb_args.end);
    TEST_CHK(cb_args.wal_flush);
    fdb_close(dbfile);

    // open db without move doc
    memset(&cb_args, 0x0, sizeof(struct cb_args));
    fconfig.compaction_cb_mask = FDB_CS_BEGIN |
                                 FDB_CS_FLUSH_WAL |
                                 FDB_CS_END;
    fdb_open(&dbfile, "./compact_test2", &fconfig);

    if (multi_kv) {
        fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    } else {
        fdb_kvs_open_default(dbfile, &db, &kvs_config);
    }
    cb_args.handle = db;
    s = fdb_compact(dbfile, "./compact_test3");
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(cb_args.n_moved_docs == 0);
    TEST_CHK(cb_args.begin);
    TEST_CHK(cb_args.end);
    TEST_CHK(cb_args.wal_flush);
    fdb_close(dbfile);

    // open db without wal_flush
    memset(&cb_args, 0x0, sizeof(struct cb_args));
    fconfig.compaction_cb_mask = FDB_CS_BEGIN |
                                 FDB_CS_MOVE_DOC |
                                 FDB_CS_END;
    fdb_open(&dbfile, "./compact_test3", &fconfig);
    if (multi_kv) {
        fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    } else {
        fdb_kvs_open_default(dbfile, &db, &kvs_config);
    }
    cb_args.handle = db;
    s = fdb_compact(dbfile, "./compact_test4");
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(cb_args.n_moved_docs == n);
    TEST_CHK(cb_args.begin);
    TEST_CHK(cb_args.end);
    TEST_CHK(!cb_args.wal_flush);
    fdb_close(dbfile);

    // open db without begin/end
    memset(&cb_args, 0x0, sizeof(struct cb_args));
    fconfig.compaction_cb_mask = FDB_CS_MOVE_DOC |
                                 FDB_CS_FLUSH_WAL;
    fdb_open(&dbfile, "./compact_test4", &fconfig);
    if (multi_kv) {
        fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    } else {
        fdb_kvs_open_default(dbfile, &db, &kvs_config);
    }
    cb_args.handle = db;
    s = fdb_compact(dbfile, "./compact_test5");
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(cb_args.n_moved_docs == n);
    TEST_CHK(!cb_args.begin);
    TEST_CHK(!cb_args.end);
    TEST_CHK(cb_args.wal_flush);
    fdb_close(dbfile);

    // open db with batch move
    memset(&cb_args, 0x0, sizeof(struct cb_args));
    fconfig.compaction_cb_mask = FDB_CS_BATCH_MOVE;
    fdb_open(&dbfile, "./compact_test5", &fconfig);
    if (multi_kv) {
        fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    } else {
        fdb_kvs_open_default(dbfile, &db, &kvs_config);
    }
    cb_args.handle = db;
    s = fdb_compact(dbfile, "./compact_test6");
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(cb_args.n_moved_docs == 0);
    TEST_CHK(cb_args.n_batch_move && cb_args.n_batch_move <= n);
    TEST_CHK(!cb_args.begin);
    TEST_CHK(!cb_args.end);
    TEST_CHK(!cb_args.wal_flush);
    fdb_close(dbfile);

    fdb_shutdown();

    memleak_end();
    if (multi_kv) {
        TEST_RESULT("compaction callback function multi kv mode test");
    } else {
        TEST_RESULT("compaction callback function single kv mode test");
    }
}